

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::VolPathIntegrator::Li
          (VolPathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  undefined1 *puVar1;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar2;
  float **ppfVar3;
  Vector3f *pVVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  ulong uVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  Tuple2<pbrt::Point2,_float> TVar12;
  pointer pLVar13;
  uintptr_t uVar14;
  size_t sVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  short sVar57;
  undefined8 uVar58;
  LightSampleContext LVar59;
  LightSampleContext LVar60;
  LightSampleContext LVar61;
  LightSampleContext LVar62;
  undefined1 auVar63 [24];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  Vector3f wiRender;
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  DiffuseBxDF *this_00;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this_01;
  Interval<float> IVar77;
  Interval<float> IVar78;
  Interval<float> IVar79;
  Interval<float> IVar80;
  optional<pbrt::MediumInteraction> *poVar81;
  VolPathIntegrator *pVVar82;
  undefined8 *puVar83;
  int i;
  undefined4 extraout_var;
  ulong uVar85;
  BxDFFlags BVar84;
  ulong uVar86;
  BSSRDFAdapter *bxdf;
  byte bVar87;
  ulong uVar88;
  uint uVar89;
  long lVar90;
  float fVar91;
  BSSRDFProbeSegment *pBVar92;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar93;
  ImageInfiniteLight *this_02;
  ExhaustiveLightSampler *pEVar94;
  HaltonSampler *pHVar95;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar96;
  uint uVar97;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar98;
  size_t *psVar99;
  uintptr_t iptr;
  DenselySampledSpectrum *this_03;
  DebugMLTSampler *pDVar100;
  uint64_t oldstate;
  pointer pLVar101;
  long in_FS_OFFSET;
  bool bVar102;
  char cVar103;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  int iVar104;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar112 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar125 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  float z;
  Float FVar129;
  Interval<float> i_00;
  Interval<float> i_01;
  Interval<float> i_02;
  Interval<float> i_03;
  Interval<float> i_04;
  Interval<float> i_05;
  Interval<float> IVar130;
  Interval<float> IVar131;
  Interval<float> i_06;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined8 uVar195;
  undefined1 auVar196 [56];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 extraout_var_00 [12];
  undefined1 auVar159 [64];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 auVar194 [64];
  float y;
  float fVar197;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar238 [56];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  float x;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar239;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined4 uVar240;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [64];
  float fVar248;
  float fVar249;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar250;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar259;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 in_ZMM4 [64];
  float fVar263;
  undefined1 in_ZMM5 [64];
  float fVar264;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  Float t0;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar275 [12];
  undefined1 auVar276 [12];
  undefined1 auVar277 [12];
  undefined1 in_ZMM13 [64];
  undefined1 in_XMM14 [16];
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f woRender_01;
  SampledSpectrum SVar278;
  bool specularBounce;
  bool anyNonSpecularBounces;
  bool terminated;
  bool scattered;
  int depth;
  SampledSpectrum pdfUni;
  SampledSpectrum beta;
  BSSRDFHandle bssrdf;
  LightSampleContext prevIntrContext;
  SampledSpectrum rrBeta;
  SampledSpectrum pdfNEE;
  BSDFSample bs;
  BSDFSample bs_1;
  SampledSpectrum Le;
  float nextCrossingT [3];
  RNG rng;
  BSSRDFProbeSegment probeSeg;
  BSDF bsdf;
  int step [3];
  float deltaT [3];
  optional<pbrt::ShapeIntersection> si;
  optional<pbrt::MediumInteraction> prevMediumIntr;
  bool local_b1c;
  bool local_b1b;
  char local_b1a;
  bool local_b19;
  undefined1 local_b18 [16];
  float local_b00;
  int local_afc;
  undefined1 local_af8 [8];
  undefined8 uStack_af0;
  undefined1 local_ae8 [16];
  VolPathIntegrator *local_ad0;
  undefined1 local_ac8 [16];
  ulong local_ab0;
  SampledSpectrum local_aa8;
  undefined1 local_a98 [16];
  SampledSpectrum local_a88;
  undefined1 local_a78 [16];
  undefined1 local_a60 [12];
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  undefined1 local_a48 [4];
  float fStack_a44;
  Interval<float> IStack_a40;
  Interval<float> IStack_a38;
  SampledSpectrum *pSStack_a30;
  undefined8 uStack_a28;
  float fStack_a20;
  float fStack_a1c;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  TStack_a18;
  float fStack_a10;
  float fStack_a0c;
  undefined8 local_a08;
  Tuple2<pbrt::Point2,_float> *local_a00;
  undefined8 local_9f8;
  undefined8 local_9f0;
  optional<pbrt::SurfaceInteraction> *local_9e8;
  bool *local_9e0;
  bool *local_9d8;
  bool *local_9d0;
  undefined1 local_9c8 [8];
  Interval<float> IStack_9c0;
  Interval<float> aIStack_9b8 [14];
  undefined8 uStack_948;
  undefined4 uStack_940;
  undefined8 uStack_93c;
  undefined8 auStack_930 [7];
  undefined8 auStack_8f8 [6];
  ulong local_8c8;
  float local_8bc;
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [8];
  float fStack_880;
  float fStack_87c;
  SampledSpectrum local_878;
  BSDFSample local_868;
  BSDFSample local_838;
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  Tuple2<pbrt::Point2,_float> *local_7e0;
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [4];
  float afStack_7c4 [3];
  undefined1 local_7b8 [8];
  float fStack_7b0;
  float fStack_7ac;
  Point3fi local_7a8;
  SampledSpectrum *pSStack_790;
  undefined1 auStack_788 [32];
  undefined1 auStack_768 [32];
  undefined1 local_748 [16];
  ScratchBuffer *local_738;
  SampledWavelengths *local_730;
  undefined1 local_728 [32];
  float fStack_708;
  Tuple3<pbrt::Vector3,_float> TStack_704;
  SampledSpectrum *pSStack_6f8;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  Tuple3<pbrt::Vector3,_float> TStack_6e0;
  Tuple3<pbrt::Vector3,_float> TStack_6d4;
  BSSRDFProbeSegment local_6c8;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  undefined8 *local_698;
  bool *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  PrimitiveHandle *local_678;
  Tuple2<pbrt::Point2,_float> local_670;
  undefined1 local_668 [8];
  Tuple2<pbrt::Point2,_float> local_660;
  Tuple2<pbrt::Point2,_float> local_658;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_650;
  undefined1 local_648 [16];
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  BSDF local_618;
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [16];
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_598 [16];
  Interval<float> IStack_588;
  Float FStack_580;
  undefined1 auStack_57c [32];
  undefined4 uStack_55c;
  undefined1 local_558 [16];
  undefined8 *local_548;
  uchar *local_540;
  undefined1 local_538 [96];
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_428;
  ulong local_328;
  anon_struct_8_0_00000001_for___align local_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 uStack_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined1 auStack_2c8 [48];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_280;
  float afStack_278 [2];
  float afStack_270 [2];
  undefined8 uStack_268;
  undefined8 uStack_260;
  long local_258;
  undefined8 uStack_250;
  undefined8 local_248 [5];
  char local_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  optional<pbrt::MediumInteraction> local_168;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar113 [64];
  undefined1 auVar117 [64];
  undefined1 auVar121 [64];
  undefined1 auVar124 [64];
  undefined1 auVar126 [64];
  undefined1 auVar107 [16];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_17 [56];
  undefined1 extraout_var_18 [56];
  undefined1 extraout_var_19 [56];
  undefined1 extraout_var_20 [56];
  undefined1 extraout_var_21 [56];
  undefined1 extraout_var_22 [56];
  undefined1 extraout_var_23 [56];
  undefined1 extraout_var_24 [56];
  undefined1 extraout_var_25 [56];
  undefined1 extraout_var_26 [56];
  undefined1 extraout_var_27 [56];
  undefined1 extraout_var_28 [56];
  undefined1 extraout_var_29 [56];
  undefined1 extraout_var_30 [56];
  undefined1 extraout_var_31 [56];
  undefined1 extraout_var_32 [56];
  undefined1 extraout_var_33 [56];
  undefined1 extraout_var_34 [56];
  
  local_738 = scratchBuffer;
  stack0xfffffffffffff5a8 = (float  [4])ZEXT816(0);
  local_a88.values.values[0] = 1.0;
  local_a88.values.values[1] = 1.0;
  local_a88.values.values[2] = 1.0;
  local_a88.values.values[3] = 1.0;
  local_aa8.values.values[2] = 1.0;
  local_aa8.values.values[0] = 1.0;
  local_aa8.values.values[1] = 1.0;
  local_aa8.values.values[3] = 1.0;
  local_5a8 = 1.0;
  fStack_5a4 = 1.0;
  fStack_5a0 = 1.0;
  fStack_59c = 1.0;
  local_878.values.values[2] = 1.0;
  local_878.values.values[0] = 1.0;
  local_878.values.values[1] = 1.0;
  local_878.values.values[3] = 1.0;
  local_b1c = false;
  local_b1b = false;
  local_220 = '\0';
  local_168.set = false;
  local_afc = 0;
  local_680 = &local_298;
  local_698 = &uStack_948;
  local_688 = local_248;
  local_540 = local_428.__data + 0xd0;
  local_548 = auStack_8f8;
  local_678 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_690 = &ray->hasDifferentials;
  local_6a0 = &uStack_93c;
  local_6a8 = auStack_930;
  local_5d8 = SUB6416(ZEXT464(0x3f800000),0);
  local_7e0 = (Tuple2<pbrt::Point2,_float> *)sampler;
  local_730 = lambda;
  local_ad0 = this;
  do {
    pVVar82 = local_ad0;
    *(long *)(in_FS_OFFSET + -0x380) = *(long *)(in_FS_OFFSET + -0x380) + 1;
    if (((local_678->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      auVar105 = ZEXT816(0);
      auVar106 = auVar105 << 0x40;
      in_ZmmResult = ZEXT1664(auVar106);
      local_428._192_64_ = in_ZmmResult;
      local_428._128_4_ = auVar106._0_4_;
      local_428._128_4_ = 0;
      local_428._132_4_ = auVar106._4_4_;
      local_428._132_4_ = 0;
      local_428._136_4_ = auVar105._0_4_;
      local_428._136_4_ = 0.0;
      local_428._140_4_ = auVar105._4_4_;
      local_428._140_4_ = 0;
      local_428._144_48_ = (undefined1  [48])0x0;
      local_428._64_8_ = auVar106._0_8_;
      local_428._64_8_ = 0;
      local_428._72_8_ = 0;
      local_428._80_48_ = (undefined1  [48])0x0;
      local_428._0_64_ = in_ZmmResult;
      local_328 = 0;
    }
    else {
      in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
      in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_428.__align,local_678,&ray->super_Ray,
                 INFINITY);
    }
    local_b19 = false;
    local_b1a = '\0';
    if (((ray->super_Ray).medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         .bits & 0xffffffffffff) != 0) {
      local_ae8 = ZEXT416((uint)((byte)local_328 & 1) * local_428._248_4_ +
                          (uint)!(bool)((byte)local_328 & 1) * 0x7f800000);
      TVar12 = *(Tuple2<pbrt::Point2,_float> *)sampler;
      local_9c8._0_4_ = TVar12.x;
      local_9c8._4_4_ = TVar12.y;
      in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
      in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
      FVar129 = detail::DispatchSplit<8>::operator()
                          ((DispatchSplit<8> *)local_a48,local_9c8,(ulong)TVar12 >> 0x30);
      local_b18._0_4_ = FVar129;
      TVar12 = *(Tuple2<pbrt::Point2,_float> *)sampler;
      local_9c8._0_4_ = TVar12.x;
      local_9c8._4_4_ = TVar12.y;
      FVar129 = detail::DispatchSplit<8>::operator()
                          ((DispatchSplit<8> *)local_a48,local_9c8,(ulong)TVar12 >> 0x30);
      uVar85 = (CONCAT44(extraout_var,local_b18._0_4_) ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
      uVar88 = (uVar85 >> 0x2f ^ uVar85) * -0x395b586ca42e166b;
      uVar85 = uVar88 >> 0x2f ^ uVar88;
      uVar88 = (CONCAT44((int)(uVar88 >> 0x20),FVar129) ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
      uVar88 = (uVar88 >> 0x2f ^ uVar88) * -0x395b586ca42e166b;
      local_728._8_8_ = uVar85 * 2 + 1;
      local_728._0_8_ =
           ((uVar88 >> 0x2f ^ uVar88) + 1) * 0x5851f42d4c957f2d + uVar85 * -0x4f5c17a566d501a4 + 1;
      local_ab0 = (ray->super_Ray).medium.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits;
      this_03 = (DenselySampledSpectrum *)(local_ab0 & 0xffffffffffff);
      sVar57 = (short)(local_ab0 >> 0x30);
      fStack_a20 = SUB84(pVVar82,0);
      fStack_a1c = (float)((ulong)pVVar82 >> 0x20);
      fStack_a10 = SUB84(lambda,0);
      fStack_a0c = (float)((ulong)lambda >> 0x20);
      local_a00 = (Tuple2<pbrt::Point2,_float> *)sampler;
      local_9f8 = ray;
      if (local_ab0 < 0x3000000000000) {
        if (sVar57 == 2) {
          _local_a48 = (Interval<float>)&local_a88;
          IStack_a40 = (Interval<float>)&local_b1a;
          IStack_a38 = (Interval<float>)&local_aa8;
          pSStack_a30 = &local_878;
          uStack_a28 = (uintptr_t)&local_afc;
          TStack_a18.bits = (long)local_a60 + 8;
          local_a08 = (RNG *)local_728;
          local_9f0 = &local_168;
          local_9e8 = (optional<pbrt::SurfaceInteraction> *)&local_318;
          local_9e0 = &local_b19;
          local_9d8 = &local_b1c;
          local_9d0 = &local_b1b;
          fVar197 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar105 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
          auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar105,auVar105);
          auVar106 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          auVar105 = vfmadd213ss_fma(auVar106,auVar106,auVar105);
          if (auVar105._0_4_ < 0.0) {
            fVar197 = sqrtf(auVar105._0_4_);
          }
          else {
            auVar105 = vsqrtss_avx(auVar105,auVar105);
            fVar197 = auVar105._0_4_;
          }
          local_b18._0_4_ = fVar197;
          fVar197 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar105 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
          auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar105,auVar105);
          auVar106 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          auVar105 = vfmadd213ss_fma(auVar106,auVar106,auVar105);
          if (auVar105._0_4_ < 0.0) {
            fVar197 = sqrtf(auVar105._0_4_);
          }
          else {
            auVar105 = vsqrtss_avx(auVar105,auVar105);
            fVar197 = auVar105._0_4_;
          }
          local_af8._0_4_ = fVar197;
          local_ac8._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          local_a78._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          local_888._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          fVar197 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          auVar132._4_4_ = fVar197;
          auVar132._0_4_ = fVar197;
          auVar132._8_4_ = fVar197;
          auVar132._12_4_ = fVar197;
          fVar197 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar198._4_4_ = fVar197;
          auVar198._0_4_ = fVar197;
          auVar198._8_4_ = fVar197;
          auVar198._12_4_ = fVar197;
          auVar105 = vmovlhps_avx(auVar132,auVar198);
          fVar197 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          auVar199._4_4_ = fVar197;
          auVar199._0_4_ = fVar197;
          auVar199._8_4_ = fVar197;
          auVar199._12_4_ = fVar197;
          local_7a8.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = auVar105._0_4_;
          local_7a8.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = auVar105._4_4_;
          local_7a8.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = auVar105._8_4_;
          local_7a8.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = auVar105._12_4_;
          local_7a8.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
               (Interval<float>)vmovlps_avx(auVar199);
          Transform::operator()((Point3fi *)local_9c8,(Transform *)(this_03 + 3),&local_7a8);
          local_a98._0_4_ = (float)local_b18._0_4_ * (float)local_ae8._0_4_;
          auVar133._0_4_ = (float)local_888._0_4_ / (float)local_af8._0_4_;
          auVar133._4_12_ = SUB6012((undefined1  [60])0x0,0);
          fVar197 = (float)local_a78._0_4_ / (float)local_af8._0_4_;
          auVar106 = ZEXT416((uint)((float)local_ac8._0_4_ / (float)local_af8._0_4_));
          auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * (float)this_03[3].lambda_max)),
                                     auVar106,ZEXT416((uint)this_03[3].lambda_min));
          local_748 = vfmadd231ss_fma(auVar105,auVar133,
                                      ZEXT416(*(uint *)&this_03[3].values.alloc.memoryResource));
          auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 *
                                                   *(float *)((long)&this_03[3].values.ptr + 4))),
                                     auVar106,ZEXT416(*(uint *)&this_03[3].values.ptr));
          local_8a8 = vfmadd231ss_fma(auVar105,auVar133,ZEXT416((uint)this_03[3].values.nAlloc));
          auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 *
                                                   *(float *)((long)&this_03[3].values.nStored + 4))
                                            ),auVar106,ZEXT416((uint)this_03[3].values.nStored));
          local_7d8 = vfmadd231ss_fma(auVar105,auVar133,ZEXT416((uint)this_03[4].lambda_min));
          auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_8a8._0_4_ * local_8a8._0_4_)),local_748,
                                     local_748);
          auVar105 = vfmadd231ss_fma(auVar105,local_7d8,local_7d8);
          if (0.0 < auVar105._0_4_) {
            auVar251._8_4_ = 0x7fffffff;
            auVar251._0_8_ = 0x7fffffff7fffffff;
            auVar251._12_4_ = 0x7fffffff;
            auVar106 = vandps_avx(local_748,auVar251);
            auVar242 = vandps_avx(local_8a8,auVar251);
            auVar107 = vandps_avx(local_7d8,auVar251);
            auVar106 = vfmadd231ss_fma(ZEXT416((uint)(auVar242._0_4_ * 0.0)),ZEXT816(0) << 0x40,
                                       auVar106);
            auVar106 = vfmadd231ss_fma(auVar106,ZEXT816(0) << 0x40,auVar107);
            fVar197 = auVar106._0_4_ / auVar105._0_4_;
            local_b18._0_4_ = fVar197;
            fVar197 = local_748._0_4_ * fVar197;
            i_00.high = fVar197;
            i_00.low = fVar197;
            auVar146._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_9c8,i_00);
            auVar146._8_56_ = extraout_var_05;
            uVar195 = vmovlps_avx(auVar146._0_16_);
            local_9c8._0_4_ = (undefined4)uVar195;
            local_9c8._4_4_ = (undefined4)((ulong)uVar195 >> 0x20);
            i_01.high = (float)local_b18._0_4_ * (float)local_8a8._0_4_;
            i_01.low = (float)local_b18._0_4_ * (float)local_8a8._0_4_;
            auVar147._0_8_ = Interval<float>::operator+<float>(&IStack_9c0,i_01);
            auVar147._8_56_ = extraout_var_06;
            uVar195 = vmovlps_avx(auVar147._0_16_);
            IStack_9c0.low = (float)uVar195;
            IStack_9c0.high = (float)((ulong)uVar195 >> 0x20);
            i_02.high = (float)local_b18._0_4_ * (float)local_7d8._0_4_;
            i_02.low = (float)local_b18._0_4_ * (float)local_7d8._0_4_;
            auVar148._0_8_ = Interval<float>::operator+<float>(aIStack_9b8,i_02);
            auVar148._8_56_ = extraout_var_07;
            uVar195 = vmovlps_avx(auVar148._0_16_);
            aIStack_9b8[0].low = (float)uVar195;
            aIStack_9b8[0].high = (float)((ulong)uVar195 >> 0x20);
            local_a98._0_4_ = (float)local_a98._0_4_ - (float)local_b18._0_4_;
          }
          in_ZMM5 = ZEXT1664(local_748);
          fVar197 = ((float)local_9c8._0_4_ + (float)local_9c8._4_4_) * 0.5;
          local_a78._0_4_ = fVar197;
          local_b00 = (IStack_9c0.low + IStack_9c0.high) * 0.5;
          fVar250 = (aIStack_9b8[0].low + aIStack_9b8[0].high) * 0.5;
          local_8b8._0_4_ = fVar250;
          auVar105 = ZEXT816(0) << 0x40;
          bVar102 = false;
          uVar97 = 0;
          do {
            fVar239 = local_748._0_4_;
            if ((uVar97 != 0) && (fVar239 = local_8a8._0_4_, uVar97 != 1)) {
              fVar239 = local_7d8._0_4_;
            }
            pvVar98 = &this_03->values;
            if ((uVar97 != 0) &&
               (pvVar98 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                          ((long)&(this_03->values).alloc.memoryResource + 4), uVar97 != 1)) {
              pvVar98 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        &(this_03->values).ptr;
            }
            fVar249 = fVar197;
            if ((uVar97 != 0) && (fVar249 = local_b00, uVar97 != 1)) {
              fVar249 = fVar250;
            }
            psVar99 = (size_t *)((long)&(this_03->values).ptr + 4);
            if ((uVar97 != 0) && (psVar99 = &(this_03->values).nAlloc, uVar97 != 1)) {
              psVar99 = (size_t *)((long)&(this_03->values).nAlloc + 4);
            }
            fVar259 = fVar197;
            if ((uVar97 != 0) && (fVar259 = local_b00, uVar97 != 1)) {
              fVar259 = fVar250;
            }
            in_ZMM4 = ZEXT464(0x3f800000);
            auVar242 = ZEXT416((uint)((1.0 / fVar239) * (*(float *)psVar99 - fVar259)));
            auVar107 = ZEXT416((uint)((1.0 / fVar239) *
                                     (*(float *)&(pvVar98->alloc).memoryResource - fVar249)));
            auVar106 = vminss_avx(auVar242,auVar107);
            auVar105 = vmaxss_avx(auVar106,auVar105);
            auVar106 = vmaxss_avx(auVar107,auVar242);
            auVar106 = vminss_avx(ZEXT416((uint)(auVar106._0_4_ * 1.0000004)),
                                  ZEXT416((uint)local_a98._0_4_));
            auVar238 = ZEXT856(auVar106._8_8_);
            local_a98._0_4_ = auVar106._0_4_;
            if (auVar106._0_4_ < auVar105._0_4_) break;
            bVar102 = 1 < uVar97;
            uVar97 = uVar97 + 1;
          } while (uVar97 != 3);
          if (bVar102) {
            local_b18._0_4_ = auVar105._0_4_;
            uVar195 = 0;
            local_ae8 = ZEXT416((uint)this_03[2].values.nStored);
            SVar278 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&(this_03->values).nStored,lambda);
            auVar218._0_8_ = SVar278.values.values._8_8_;
            auVar218._8_56_ = auVar238;
            uStack_af0 = uVar195;
            local_af8 = (undefined1  [8])SVar278.values.values._0_8_;
            local_ac8 = auVar218._0_16_;
            auVar196 = (undefined1  [56])0x0;
            local_648 = ZEXT416((uint)this_03[2].values.nStored);
            SVar278 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&this_03[1].values.nStored,lambda);
            auVar219._0_8_ = SVar278.values.values._8_8_;
            auVar219._8_56_ = auVar238;
            auVar149._0_8_ = SVar278.values.values._0_8_;
            auVar149._8_56_ = auVar196;
            auVar105 = vunpcklpd_avx(_local_af8,local_ac8);
            local_1b8 = (float)local_ae8._0_4_ * auVar105._0_4_;
            fStack_1b4 = (float)local_ae8._0_4_ * auVar105._4_4_;
            fStack_1b0 = (float)local_ae8._0_4_ * auVar105._8_4_;
            fStack_1ac = (float)local_ae8._0_4_ * auVar105._12_4_;
            auVar105 = vmovlhps_avx(auVar149._0_16_,auVar219._0_16_);
            local_1c8 = (float)local_648._0_4_ * auVar105._0_4_;
            fStack_1c4 = (float)local_648._0_4_ * auVar105._4_4_;
            fStack_1c0 = (float)local_648._0_4_ * auVar105._8_4_;
            fStack_1bc = (float)local_648._0_4_ * auVar105._12_4_;
            local_1f8 = local_1c8 + local_1b8;
            fStack_1f4 = fStack_1c4 + fStack_1b4;
            fStack_1f0 = fStack_1c0 + fStack_1b0;
            fStack_1ec = fStack_1bc + fStack_1ac;
            fVar197 = *(float *)&(this_03->values).alloc.memoryResource;
            fVar250 = *(float *)((long)&(this_03->values).alloc.memoryResource + 4);
            fVar249 = *(float *)((long)&(this_03->values).ptr + 4) - fVar197;
            fVar259 = *(float *)&(this_03->values).nAlloc - fVar250;
            fVar239 = *(float *)&(this_03->values).ptr;
            fVar263 = *(float *)((long)&(this_03->values).nAlloc + 4) - fVar239;
            local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.x = (float)local_748._0_4_ / fVar249;
            fVar248 = (float)local_8a8._0_4_ / fVar259;
            local_a60._0_4_ = (float)local_7d8._0_4_ / fVar263;
            local_7c8 = (undefined1  [4])fVar248;
            fVar197 = ((float)local_a78._0_4_ - fVar197) / fVar249 +
                      (float)local_b18._0_4_ * local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.x;
            fVar250 = (local_b00 - fVar250) / fVar259 + (float)local_b18._0_4_ * fVar248;
            fVar239 = ((float)local_8b8._0_4_ - fVar239) / fVar263 +
                      (float)local_b18._0_4_ * (float)local_a60._0_4_;
            pvVar98 = &this_03[10].values;
            fVar249 = 1.0 / (float)*(int *)&this_03[10].values.alloc.memoryResource;
            pvVar2 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                     ((long)&this_03[10].values.alloc.memoryResource + 4);
            fVar259 = 1.0 / (float)*(int *)((long)&this_03[10].values.alloc.memoryResource + 4);
            in_ZMM4 = ZEXT1664(ZEXT416((uint)fVar259));
            ppfVar3 = &this_03[10].values.ptr;
            fVar263 = 1.0 / (float)*(int *)&this_03[10].values.ptr;
            in_ZMM5 = ZEXT1664(ZEXT416((uint)fVar263));
            lVar90 = 0;
            IVar130 = (Interval<float>)local_728._0_8_;
            do {
              iVar104 = (int)lVar90;
              pBVar92 = &local_6c8;
              if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                pBVar92 = (BSSRDFProbeSegment *)local_7c8;
              }
              fVar248 = (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
              if ((fVar248 == 0.0) && (!NAN(fVar248))) {
                pBVar92 = &local_6c8;
                if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                  pBVar92 = (BSSRDFProbeSegment *)local_7c8;
                }
                local_728._0_8_ = IVar130;
                (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
                IVar130 = (Interval<float>)local_728._0_8_;
              }
              fVar248 = aIStack_9b8[8].high;
              local_728._4_4_ = IVar130.high;
              fVar91 = fVar197;
              if ((iVar104 != 0) && (fVar91 = fVar250, iVar104 != 1)) {
                fVar91 = fVar239;
              }
              pvVar93 = pvVar98;
              if ((iVar104 != 0) && (pvVar93 = pvVar2, iVar104 != 1)) {
                pvVar93 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
              }
              pvVar96 = pvVar98;
              if ((iVar104 != 0) && (pvVar96 = pvVar2, iVar104 != 1)) {
                pvVar96 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
              }
              auVar267._0_4_ = (float)(*(int *)&(pvVar96->alloc).memoryResource + -1);
              auVar267._4_12_ = in_ZMM10._4_12_;
              auVar106 = ZEXT416((uint)(fVar91 * (float)*(int *)&(pvVar93->alloc).memoryResource));
              auVar105 = vminss_avx(auVar267,auVar106);
              uVar195 = vcmpss_avx512f(auVar106,ZEXT816(0) << 0x40,1);
              auVar112._16_48_ = in_ZmmResult._16_48_;
              auVar112._0_16_ = auVar105;
              fVar91 = (float)((uint)!(bool)((byte)uVar195 & 1) * auVar105._0_4_);
              in_ZmmResult._4_60_ = auVar112._4_60_;
              in_ZmmResult._0_4_ = (int)fVar91;
              fVar91 = (float)(int)fVar91;
              local_868.f.values.values[lVar90] = fVar91;
              pBVar92 = &local_6c8;
              if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                pBVar92 = (BSSRDFProbeSegment *)local_7c8;
              }
              if (0.0 <= (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x) {
                pvVar93 = pvVar98;
                if ((iVar104 != 0) && (pvVar93 = pvVar2, iVar104 != 1)) {
                  pvVar93 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
                }
                fVar264 = fVar197;
                if ((iVar104 != 0) && (fVar264 = fVar250, iVar104 != 1)) {
                  fVar264 = fVar239;
                }
                pBVar92 = &local_6c8;
                if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                  pBVar92 = (BSSRDFProbeSegment *)local_7c8;
                }
                (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90] =
                     (float)local_b18._0_4_ +
                     ((float)((int)fVar91 + 1) / (float)*(int *)&(pvVar93->alloc).memoryResource -
                     fVar264) / (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
                fVar91 = fVar249;
                if ((iVar104 != 0) && (fVar91 = fVar259, iVar104 != 1)) {
                  fVar91 = fVar263;
                }
                pBVar92 = &local_6c8;
                if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                  pBVar92 = (BSSRDFProbeSegment *)local_7c8;
                }
                *(float *)(local_538 + lVar90 * 4) =
                     fVar91 / (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
                *(undefined4 *)(local_598 + lVar90 * 4) = 1;
                pvVar93 = pvVar98;
                if ((iVar104 != 0) && (pvVar93 = pvVar2, iVar104 != 1)) {
                  pvVar93 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
                }
                FVar129 = *(Float *)&(pvVar93->alloc).memoryResource;
              }
              else {
                pvVar93 = pvVar98;
                if ((iVar104 != 0) && (pvVar93 = pvVar2, iVar104 != 1)) {
                  pvVar93 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
                }
                fVar264 = fVar197;
                if ((iVar104 != 0) && (fVar264 = fVar250, iVar104 != 1)) {
                  fVar264 = fVar239;
                }
                pBVar92 = &local_6c8;
                if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                  pBVar92 = (BSSRDFProbeSegment *)local_7c8;
                }
                (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90] =
                     (float)local_b18._0_4_ +
                     ((float)(int)fVar91 / (float)*(int *)&(pvVar93->alloc).memoryResource - fVar264
                     ) / (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
                auVar105 = ZEXT416((uint)fVar249);
                if ((iVar104 != 0) && (auVar105 = ZEXT416((uint)fVar259), iVar104 != 1)) {
                  auVar105 = ZEXT416((uint)fVar263);
                }
                pBVar92 = &local_6c8;
                if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                  pBVar92 = (BSSRDFProbeSegment *)local_7c8;
                }
                auVar17._8_4_ = 0x80000000;
                auVar17._0_8_ = 0x8000000080000000;
                auVar17._12_4_ = 0x80000000;
                in_ZmmResult._0_16_ = vxorps_avx512vl(auVar105,auVar17);
                in_ZmmResult._16_48_ = auVar112._16_48_;
                *(float *)(local_538 + lVar90 * 4) =
                     in_ZmmResult._0_4_ / (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
                *(undefined4 *)(local_598 + lVar90 * 4) = 0xffffffff;
                FVar129 = -NAN;
              }
              (&local_618.eta)[lVar90] = FVar129;
              lVar90 = lVar90 + 1;
            } while (lVar90 != 3);
            uVar97 = (uint)local_728._4_4_ >> 0xd ^ (uint)((ulong)IVar130 >> 0x1b);
            local_728._0_8_ = (long)IVar130 * 0x5851f42d4c957f2d + local_728._8_8_;
            bVar87 = IVar130.high._3_1_ >> 3;
            auVar105 = vcvtusi2ss_avx512f(in_ZMM10._0_16_,uVar97 >> bVar87 | uVar97 << 0x20 - bVar87
                                         );
            auVar105 = vminss_avx(ZEXT416((uint)(auVar105._0_4_ * 2.3283064e-10)),
                                  ZEXT416(0x3f7fffff));
            local_ae8._0_4_ = auVar105._0_4_;
            puVar1 = (undefined1 *)((long)&this_03[2].values.nStored + 4);
            aIStack_9b8[8].high = (float)((uint)((ulong)puVar1 >> 0x20) | 0x10000);
            fVar250 = aIStack_9b8[8].high;
            aIStack_9b8[8].high = fVar248;
            fVar197 = (float)local_b18._0_4_;
            do {
              lVar90 = (long)*(int *)(&DAT_005e6660 +
                                     (ulong)((uint)(local_7a8.super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high < local_7a8.
                                                            super_Point3<pbrt::Interval<float>_>.
                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) |
                                            (uint)(local_7a8.super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low < local_7a8.
                                                           super_Point3<pbrt::Interval<float>_>.
                                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high) * 4 +
                                            (uint)(local_7a8.super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low < local_7a8.
                                                           super_Point3<pbrt::Interval<float>_>.
                                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 2) * 4);
              local_ac8._0_4_ =
                   (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90];
              auVar73._4_4_ = fStack_1f4;
              auVar73._0_4_ = local_1f8;
              auVar73._8_4_ = fStack_1f0;
              auVar73._12_4_ = fStack_1ec;
              uVar240 = *(undefined4 *)
                         (this_03[9].values.nAlloc +
                         (((long)(int)local_868.f.values.values[2] *
                           (long)*(int *)((long)&this_03[10].values.alloc.memoryResource + 4) +
                          (long)(int)local_868.f.values.values[1]) *
                          (long)*(int *)&this_03[10].values.alloc.memoryResource +
                         (long)(int)local_868.f.values.values[0]) * 4);
              auVar18._4_4_ = uVar240;
              auVar18._0_4_ = uVar240;
              auVar18._8_4_ = uVar240;
              auVar18._12_4_ = uVar240;
              in_ZmmResult._0_16_ = vmulps_avx512vl(auVar73,auVar18);
              local_648 = in_ZmmResult._0_16_;
              if (in_ZmmResult._0_4_ <= 0.0) {
LAB_0041435f:
                fVar239 = (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90];
                if (((float)local_a98._0_4_ < fVar239) ||
                   (fVar249 = (float)((int)local_868.f.values.values[lVar90] +
                                     *(int *)(local_598 + lVar90 * 4)),
                   local_868.f.values.values[lVar90] = fVar249, fVar249 == (&local_618.eta)[lVar90])
                   ) goto LAB_00414391;
                (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90] =
                     fVar239 + *(float *)(local_538 + lVar90 * 4);
                bVar102 = true;
                fVar197 = (float)local_ac8._0_4_;
              }
              else {
                auVar19._8_4_ = 0x80000000;
                auVar19._0_8_ = 0x8000000080000000;
                auVar19._12_4_ = 0x80000000;
                in_ZmmResult._0_16_ = vxorps_avx512vl(in_ZmmResult._0_16_,auVar19);
                _local_af8 = in_ZmmResult._0_16_;
                do {
                  local_b18._0_4_ = fVar197;
                  fVar197 = expf(((float)local_ac8._0_4_ - fVar197) * (float)local_af8._0_4_);
                  fVar197 = 1.0 - fVar197;
                  if (fVar197 <= (float)local_ae8._0_4_) {
                    auVar105 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                          ZEXT416((uint)(((float)local_ae8._0_4_ - fVar197) /
                                                        (1.0 - fVar197))));
                    local_ae8._0_4_ = auVar105._0_4_;
                    cVar103 = '\b';
LAB_00414072:
                    fVar197 = (float)local_b18._0_4_;
                  }
                  else {
                    fVar197 = logf(1.0 - (float)local_ae8._0_4_);
                    fVar197 = (float)local_b18._0_4_ - fVar197 / (float)local_648._0_4_;
                    in_ZMM4 = ZEXT464((uint)fVar197);
                    if ((float)local_a98._0_4_ <= fVar197) {
                      auStack_930[0]._0_1_ = false;
                      auStack_930[1]._4_4_ = fStack_5a4;
                      auStack_930[1]._0_4_ = local_5a8;
                      auStack_930[2]._4_4_ = fStack_59c;
                      auStack_930[2]._0_4_ = fStack_5a0;
                      Li::anon_class_128_16_8a10e554::operator()
                                ((anon_class_128_16_8a10e554 *)local_a48,(MediumSample *)local_9c8);
                      if ((bool)(undefined1)auStack_930[0] == true) {
                        auStack_930[0]._0_1_ = false;
                      }
                      cVar103 = '\x01';
                      goto LAB_00414072;
                    }
                    auVar105 = vinsertps_avx(ZEXT416((uint)(fVar197 * (float)local_748._0_4_ +
                                                           (float)local_a78._0_4_)),
                                             ZEXT416((uint)(fVar197 * (float)local_8a8._0_4_ +
                                                           local_b00)),0x10);
                    local_838.f.values.values[2] =
                         fVar197 * (float)local_7d8._0_4_ + (float)local_8b8._0_4_;
                    local_838.f.values.values._0_8_ = vmovlps_avx(auVar105);
                    local_808._0_4_ = fVar197;
                    fVar197 = fVar197 - (float)local_b18._0_4_;
                    local_68._0_4_ = fVar197 * (float)local_af8._0_4_;
                    local_68._4_4_ = fVar197 * (float)local_af8._4_4_;
                    local_68._8_4_ = fVar197 * (float)uStack_af0;
                    local_68._12_4_ = fVar197 * uStack_af0._4_4_;
                    auVar20._8_4_ = 0x3fb8aa3b;
                    auVar20._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar20._12_4_ = 0x3fb8aa3b;
                    auVar105 = vmulps_avx512vl(local_68,auVar20);
                    _local_7b8 = vroundps_avx(auVar105,9);
                    auVar105 = vsubps_avx(auVar105,_local_7b8);
                    auVar238 = ZEXT856(auVar105._8_8_);
                    auVar200._8_4_ = 0x3da1d5b6;
                    auVar200._0_8_ = 0x3da1d5b63da1d5b6;
                    auVar200._12_4_ = 0x3da1d5b6;
                    auVar21._8_4_ = 0x3e658299;
                    auVar21._0_8_ = 0x3e6582993e658299;
                    auVar21._12_4_ = 0x3e658299;
                    auVar106 = vfmadd213ps_avx512vl(auVar200,auVar105,auVar21);
                    auVar22._8_4_ = 0x3f3263b7;
                    auVar22._0_8_ = 0x3f3263b73f3263b7;
                    auVar22._12_4_ = 0x3f3263b7;
                    auVar106 = vfmadd213ps_avx512vl(auVar106,auVar105,auVar22);
                    auVar23._8_4_ = 0x3f7ff3bf;
                    auVar23._0_8_ = 0x3f7ff3bf3f7ff3bf;
                    auVar23._12_4_ = 0x3f7ff3bf;
                    _local_888 = vfmadd213ps_avx512vl(auVar106,auVar105,auVar23);
                    auVar196 = ZEXT856(local_888._8_8_);
                    SVar278 = UniformGridMediumProvider::Density
                                        (*(UniformGridMediumProvider **)this_03,
                                         (Point3f *)&local_838,lambda);
                    auVar220._0_8_ = SVar278.values.values._8_8_;
                    auVar220._8_56_ = auVar196;
                    auVar150._0_8_ = SVar278.values.values._0_8_;
                    auVar150._8_56_ = auVar238;
                    local_898 = auVar150._0_16_;
                    local_7f8 = auVar220._0_16_;
                    SVar278 = UniformGridMediumProvider::Le
                                        (*(UniformGridMediumProvider **)this_03,
                                         (Point3f *)&local_838,lambda);
                    auVar221._0_8_ = SVar278.values.values._8_8_;
                    auVar221._8_56_ = auVar196;
                    local_4b8 = auVar221._0_16_;
                    auVar151._0_8_ = SVar278.values.values._0_8_;
                    auVar151._8_56_ = auVar238;
                    local_4a8 = auVar151._0_16_;
                    auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_838.f.values.values[1] *
                                                             *(float *)((long)&this_03[6].values.
                                                                               alloc.memoryResource
                                                                       + 4))),
                                               ZEXT416((uint)local_838.f.values.values[0]),
                                               ZEXT416(*(uint *)&this_03[6].values.alloc.
                                                                 memoryResource));
                    auVar105 = vfmadd231ss_fma(auVar105,ZEXT416((uint)local_838.f.values.values[2]),
                                               ZEXT416(*(uint *)&this_03[6].values.ptr));
                    fVar239 = auVar105._0_4_ + *(float *)((long)&this_03[6].values.ptr + 4);
                    local_4c8 = ZEXT416((uint)fVar239);
                    auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_838.f.values.values[1] *
                                                             *(float *)((long)&this_03[6].values.
                                                                               nAlloc + 4))),
                                               ZEXT416((uint)local_838.f.values.values[0]),
                                               ZEXT416((uint)this_03[6].values.nAlloc));
                    auVar105 = vfmadd231ss_fma(auVar105,ZEXT416((uint)local_838.f.values.values[2]),
                                               ZEXT416((uint)this_03[6].values.nStored));
                    fVar249 = auVar105._0_4_ + *(float *)((long)&this_03[6].values.nStored + 4);
                    auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_838.f.values.values[1] *
                                                             (float)this_03[7].lambda_max)),
                                               ZEXT416((uint)local_838.f.values.values[0]),
                                               ZEXT416((uint)this_03[7].lambda_min));
                    auVar105 = vfmadd231ss_fma(auVar105,ZEXT416((uint)local_838.f.values.values[2]),
                                               ZEXT416(*(uint *)&this_03[7].values.alloc.
                                                                 memoryResource));
                    fVar259 = auVar105._0_4_ +
                              *(float *)((long)&this_03[7].values.alloc.memoryResource + 4);
                    auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_838.f.values.values[1] *
                                                             *(float *)((long)&this_03[7].values.ptr
                                                                       + 4))),
                                               ZEXT416((uint)local_838.f.values.values[0]),
                                               ZEXT416(*(uint *)&this_03[7].values.ptr));
                    auVar105 = vfmadd231ss_fma(auVar105,ZEXT416((uint)local_838.f.values.values[2]),
                                               ZEXT416((uint)this_03[7].values.nAlloc));
                    fVar263 = auVar105._0_4_ + *(float *)((long)&this_03[7].values.nAlloc + 4);
                    bVar102 = fVar263 == 1.0;
                    fVar197 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar105 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x
                                      );
                    auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar105,auVar105)
                    ;
                    auVar106 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z
                                      );
                    auVar105 = vfmadd213ss_fma(auVar106,auVar106,auVar105);
                    if (auVar105._0_4_ < 0.0) {
                      local_4c8 = ZEXT416((uint)fVar239);
                      local_5b8 = ZEXT416((uint)fVar249);
                      local_5c8 = ZEXT416((uint)fVar259);
                      local_8bc = fVar263;
                      fVar197 = sqrtf(auVar105._0_4_);
                      fVar263 = local_8bc;
                      auVar105 = local_5c8;
                      fVar249 = (float)local_5b8._0_4_;
                      auVar106 = local_4b8;
                    }
                    else {
                      auVar105 = vsqrtss_avx(auVar105,auVar105);
                      fVar197 = auVar105._0_4_;
                      auVar105 = ZEXT416((uint)fVar259);
                      auVar106 = local_4b8;
                    }
                    auVar241._0_4_ = (int)(float)local_7b8._0_4_;
                    auVar241._4_4_ = (int)(float)local_7b8._4_4_;
                    auVar241._8_4_ = (int)fStack_7b0;
                    auVar241._12_4_ = (int)fStack_7ac;
                    auVar24._8_4_ = 0xffffffe1;
                    auVar24._0_8_ = 0xffffffe1ffffffe1;
                    auVar24._12_4_ = 0xffffffe1;
                    uVar85 = vpcmpgtd_avx512vl(auVar241,auVar24);
                    uVar85 = uVar85 & 0xf;
                    auVar25._8_4_ = 0x1e;
                    auVar25._0_8_ = 0x1e0000001e;
                    auVar25._12_4_ = 0x1e;
                    uVar88 = vpcmpgtd_avx512vl(auVar241,auVar25);
                    uVar88 = uVar88 & 0xf;
                    auVar242 = vpslld_avx(auVar241,0x17);
                    auVar242 = vpaddd_avx(auVar242,_local_888);
                    auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    bVar16 = (bool)((byte)uVar88 & 1);
                    auVar108._0_4_ =
                         (uint)bVar16 * auVar107._0_4_ |
                         (uint)!bVar16 * (uint)((byte)uVar85 & 1) * auVar242._0_4_;
                    bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
                    auVar108._4_4_ =
                         (uint)bVar16 * auVar107._4_4_ |
                         (uint)!bVar16 * (uint)((byte)(uVar85 >> 1) & 1) * auVar242._4_4_;
                    bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
                    auVar108._8_4_ =
                         (uint)bVar16 * auVar107._8_4_ |
                         (uint)!bVar16 * (uint)((byte)(uVar85 >> 2) & 1) * auVar242._8_4_;
                    bVar16 = SUB81(uVar88 >> 3,0);
                    auVar108._12_4_ =
                         (uint)bVar16 * auVar107._12_4_ |
                         (uint)!bVar16 * (uint)(byte)(uVar85 >> 3) * auVar242._12_4_;
                    in_ZMM10 = ZEXT1664(auVar108);
                    auVar242 = vshufpd_avx(auVar108,auVar108,1);
                    in_ZMM13 = ZEXT1664(auVar242);
                    local_4b8 = vmovlhps_avx(local_898,local_7f8);
                    fVar239 = local_4c8._0_4_ / fVar263;
                    auVar114._4_12_ = local_4c8._4_12_;
                    auVar114._0_4_ = fVar239;
                    fVar259 = auVar105._0_4_ / fVar263;
                    auVar115._4_12_ = auVar105._4_12_;
                    auVar115._0_4_ = fVar259;
                    auVar114._16_48_ = in_ZmmResult._16_48_;
                    auVar113._4_60_ = auVar114._4_60_;
                    auVar113._0_4_ =
                         (uint)bVar102 * (int)local_4c8._0_4_ + (uint)!bVar102 * (int)fVar239;
                    iVar104 = (uint)bVar102 * (int)fVar249 +
                              (uint)!bVar102 * (int)(fVar249 / fVar263);
                    auVar115._16_48_ = in_ZmmResult._16_48_;
                    in_ZmmResult._4_60_ = auVar115._4_60_;
                    in_ZmmResult._0_4_ =
                         (uint)bVar102 * (int)auVar105._0_4_ + (uint)!bVar102 * (int)fVar259;
                    aIStack_9b8[1].low = (ray->super_Ray).time;
                    in_ZMM5 = ZEXT464((uint)aIStack_9b8[1].low);
                    auVar275._0_4_ = local_4b8._0_4_ * local_1b8;
                    auVar275._4_4_ = local_4b8._4_4_ * fStack_1b4;
                    auVar275._8_4_ = local_4b8._8_4_ * fStack_1b0;
                    local_4c8._12_4_ = local_4b8._12_4_ * fStack_1ac;
                    local_4c8._0_12_ = auVar275;
                    aIStack_9b8[0xb].low = local_4b8._0_4_ * local_1c8;
                    aIStack_9b8[0xb].high = local_4b8._4_4_ * fStack_1c4;
                    aIStack_9b8[0xc].low = local_4b8._8_4_ * fStack_1c0;
                    aIStack_9b8[0xc].high = local_4b8._12_4_ * fStack_1bc;
                    aIStack_9b8[2].high =
                         -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z / fVar197;
                    uVar86._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
                    uVar86._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar272._0_8_ = uVar86 ^ 0x8000000080000000;
                    auVar272._8_4_ = 0x80000000;
                    auVar272._12_4_ = 0x80000000;
                    auVar134._4_4_ = fVar197;
                    auVar134._0_4_ = fVar197;
                    auVar134._8_4_ = fVar197;
                    auVar134._12_4_ = fVar197;
                    auVar105 = vdivps_avx(auVar272,auVar134);
                    auVar252._4_4_ = iVar104;
                    auVar252._0_4_ = iVar104;
                    auVar252._8_4_ = iVar104;
                    auVar252._12_4_ = iVar104;
                    auVar260._4_4_ = in_ZmmResult._0_4_;
                    auVar260._0_4_ = in_ZmmResult._0_4_;
                    auVar260._8_4_ = in_ZmmResult._0_4_;
                    auVar260._12_4_ = in_ZmmResult._0_4_;
                    in_ZMM4 = ZEXT1664(auVar260);
                    aIStack_9b8[3].high =
                         (float)((uint)(auVar272._0_8_ >> 0x20) ^ uVar86._4_4_ ^ 0x80000000);
                    aIStack_9b8[3].low = 0.0;
                    aIStack_9b8[4].low = 0.0;
                    aIStack_9b8[4].high = 0.0;
                    aIStack_9b8[5].low = 0.0;
                    aIStack_9b8[0xd] = local_648._0_8_;
                    uStack_948._0_4_ = local_648._8_4_;
                    uStack_948._4_4_ = local_648._12_4_;
                    auStack_930[0]._0_1_ = true;
                    auVar107 = vshufps_avx(auVar113._0_16_,auVar252,0x40);
                    local_9c8._0_4_ = auVar107._0_4_;
                    local_9c8._4_4_ = auVar107._4_4_;
                    IStack_9c0.low = auVar107._8_4_;
                    IStack_9c0.high = auVar107._12_4_;
                    uVar195 = vmovlps_avx(auVar260);
                    aIStack_9b8[0].low = (float)uVar195;
                    aIStack_9b8[0].high = (float)((ulong)uVar195 >> 0x20);
                    uVar195 = vmovlps_avx(auVar105);
                    aIStack_9b8[1].high = (float)uVar195;
                    aIStack_9b8[2].low = (float)((ulong)uVar195 >> 0x20);
                    aIStack_9b8[6].low = 0.0;
                    aIStack_9b8[6].high = 0.0;
                    aIStack_9b8[7].low = (float)local_ab0;
                    aIStack_9b8[7].high = (float)(local_ab0 >> 0x20);
                    aIStack_9b8[8].low = SUB84(puVar1,0);
                    aIStack_9b8._76_8_ = auVar275._4_8_;
                    auVar105 = vmovlhps_avx(local_4a8,auVar106);
                    uStack_940 = auVar105._0_4_;
                    uStack_93c._0_4_ = auVar105._4_4_;
                    stack0xfffffffffffff6c8 = auVar105._8_8_;
                    auVar105 = vunpcklpd_avx(auVar108,auVar242);
                    auStack_930[1] = auVar105._0_8_;
                    auStack_930[2] = auVar105._8_8_;
                    aIStack_9b8[8].high = fVar250;
                    aIStack_9b8[9].low = auVar275._0_4_;
                    aIStack_9b8[10].high = local_4c8._12_4_;
                    local_4a8 = auVar108;
                    bVar102 = Li::anon_class_128_16_8a10e554::operator()
                                        ((anon_class_128_16_8a10e554 *)local_a48,
                                         (MediumSample *)local_9c8);
                    uVar195 = local_728._0_8_;
                    uVar240 = local_728._4_4_;
                    if ((bool)(undefined1)auStack_930[0] == true) {
                      auStack_930[0]._0_1_ = false;
                    }
                    cVar103 = !bVar102;
                    fVar197 = (float)local_b18._0_4_;
                    if (!(bool)cVar103) {
                      local_728._0_8_ = local_728._0_8_ * 0x5851f42d4c957f2d + local_728._8_8_;
                      uVar97 = (uint)uVar240 >> 0xd ^ (uint)((ulong)uVar195 >> 0x1b);
                      bVar87 = SUB81(uVar195,7) >> 3;
                      auVar105 = vcvtusi2ss_avx512f(in_XMM14,uVar97 >> bVar87 |
                                                             uVar97 << 0x20 - bVar87);
                      auVar105 = vminss_avx(ZEXT416((uint)(auVar105._0_4_ * 2.3283064e-10)),
                                            ZEXT416(0x3f7fffff));
                      local_ae8._0_4_ = auVar105._0_4_;
                      fVar197 = (float)local_808._0_4_;
                    }
                    local_88 = local_af8;
                    uStack_80 = uStack_af0;
                    lambda = local_730;
                  }
                } while (cVar103 == '\0');
                if (cVar103 == '\b') goto LAB_0041435f;
LAB_00414391:
                bVar102 = false;
              }
            } while (bVar102);
            goto LAB_004164f3;
          }
        }
        else {
          _local_a48 = (Interval<float>)&local_a88;
          IStack_a40 = (Interval<float>)&local_b1a;
          IStack_a38 = (Interval<float>)&local_aa8;
          pSStack_a30 = &local_878;
          uStack_a28 = (uintptr_t)&local_afc;
          TStack_a18.bits = (long)local_a60 + 8;
          local_a08 = (RNG *)local_728;
          local_9f0 = &local_168;
          local_9e8 = (optional<pbrt::SurfaceInteraction> *)&local_318;
          local_9e0 = &local_b19;
          local_9d8 = &local_b1c;
          local_9d0 = &local_b1b;
          fVar197 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar105 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
          auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar105,auVar105);
          auVar106 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          auVar105 = vfmadd213ss_fma(auVar106,auVar106,auVar105);
          if (auVar105._0_4_ < 0.0) {
            fVar197 = sqrtf(auVar105._0_4_);
          }
          else {
            auVar105 = vsqrtss_avx(auVar105,auVar105);
            fVar197 = auVar105._0_4_;
          }
          local_ab0 = CONCAT44(local_ab0._4_4_,fVar197);
          fVar197 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar105 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
          auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar105,auVar105);
          auVar238 = ZEXT856(auVar106._8_8_);
          auVar105 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          auVar105 = vfmadd213ss_fma(auVar105,auVar105,auVar106);
          if (auVar105._0_4_ < 0.0) {
            auVar238 = ZEXT856(auVar106._8_8_);
            auVar157._0_4_ = sqrtf(auVar105._0_4_);
            auVar157._4_60_ = extraout_var_01;
            local_898 = auVar157._0_16_;
          }
          else {
            local_898 = vsqrtss_avx(auVar105,auVar105);
          }
          uVar5 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar9 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          local_7f8._4_4_ = uVar9;
          local_7f8._0_4_ = uVar5;
          local_7f8._8_8_ = 0;
          local_b00 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          local_a78._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          local_888._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          local_7b8._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          uVar195 = 0;
          local_b18 = ZEXT416((uint)this_03[3].lambda_min);
          SVar278 = DenselySampledSpectrum::Sample(this_03,lambda);
          auVar225._0_8_ = SVar278.values.values._8_8_;
          auVar225._8_56_ = auVar238;
          uStack_af0 = uVar195;
          local_af8 = (undefined1  [8])SVar278.values.values._0_8_;
          local_ac8 = auVar225._0_16_;
          auVar196 = (undefined1  [56])0x0;
          local_a98 = ZEXT416((uint)this_03[3].lambda_min);
          SVar278 = DenselySampledSpectrum::Sample(this_03 + 1,lambda);
          auVar226._0_8_ = SVar278.values.values._8_8_;
          auVar226._8_56_ = auVar238;
          auVar158._0_8_ = SVar278.values.values._0_8_;
          auVar158._8_56_ = auVar196;
          auVar105 = vunpcklpd_avx(_local_af8,local_ac8);
          local_208 = (float)local_b18._0_4_ * auVar105._0_4_;
          fStack_204 = (float)local_b18._0_4_ * auVar105._4_4_;
          fStack_200 = (float)local_b18._0_4_ * auVar105._8_4_;
          fStack_1fc = (float)local_b18._0_4_ * auVar105._12_4_;
          auVar105 = vmovlhps_avx(auVar158._0_16_,auVar226._0_16_);
          local_218 = (float)local_a98._0_4_ * auVar105._0_4_;
          fStack_214 = (float)local_a98._0_4_ * auVar105._4_4_;
          fStack_210 = (float)local_a98._0_4_ * auVar105._8_4_;
          fStack_20c = (float)local_a98._0_4_ * auVar105._12_4_;
          local_4d8._0_4_ = local_218 + local_208;
          local_4d8._4_4_ = fStack_214 + fStack_204;
          fStack_4d0 = fStack_210 + fStack_200;
          fStack_4cc = fStack_20c + fStack_1fc;
          if (((float)local_4d8._0_4_ != 0.0) || (NAN((float)local_4d8._0_4_))) {
            local_b18 = ZEXT416((uint)((float)local_ab0 * (float)local_ae8._0_4_));
            uVar97 = (uint)local_728._4_4_ >> 0xd ^ (uint)((ulong)local_728._0_8_ >> 0x1b);
            bVar87 = SUB81(local_728._0_8_,7) >> 3;
            auVar105 = vcvtusi2ss_avx512f(in_ZMM4._0_16_,uVar97 >> bVar87 | uVar97 << 0x20 - bVar87)
            ;
            auVar105 = vminss_avx(ZEXT416((uint)(auVar105._0_4_ * 2.3283064e-10)),
                                  ZEXT416(0x3f7fffff));
            local_728._0_8_ = local_728._0_8_ * 0x5851f42d4c957f2d + local_728._8_8_;
            fVar197 = logf(1.0 - auVar105._0_4_);
            fVar197 = -fVar197 / (float)local_4d8._0_4_;
            fVar250 = local_b18._0_4_;
            if (fVar250 <= fVar197) {
              local_a8._0_4_ = (float)local_4d8._0_4_ * -fVar250;
              local_a8._4_4_ = (float)local_4d8._4_4_ * -fVar250;
              local_a8._8_4_ = fStack_4d0 * -fVar250;
              local_a8._12_4_ = fStack_4cc * -fVar250;
              auVar34._8_4_ = 0x3fb8aa3b;
              auVar34._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar34._12_4_ = 0x3fb8aa3b;
              auVar106 = vmulps_avx512vl(local_a8,auVar34);
              auVar105 = vroundps_avx(auVar106,9);
              auVar106 = vsubps_avx(auVar106,auVar105);
              auVar209._0_4_ = (int)auVar105._0_4_;
              auVar209._4_4_ = (int)auVar105._4_4_;
              auVar209._8_4_ = (int)auVar105._8_4_;
              auVar209._12_4_ = (int)auVar105._12_4_;
              auVar35._8_4_ = 0xffffffe1;
              auVar35._0_8_ = 0xffffffe1ffffffe1;
              auVar35._12_4_ = 0xffffffe1;
              uVar85 = vpcmpgtd_avx512vl(auVar209,auVar35);
              uVar85 = uVar85 & 0xf;
              auVar36._8_4_ = 0x1e;
              auVar36._0_8_ = 0x1e0000001e;
              auVar36._12_4_ = 0x1e;
              uVar88 = vpcmpgtd_avx512vl(auVar209,auVar36);
              uVar88 = uVar88 & 0xf;
              auVar245._8_4_ = 0x3da1d5b6;
              auVar245._0_8_ = 0x3da1d5b63da1d5b6;
              auVar245._12_4_ = 0x3da1d5b6;
              auVar37._8_4_ = 0x3e658299;
              auVar37._0_8_ = 0x3e6582993e658299;
              auVar37._12_4_ = 0x3e658299;
              auVar105 = vfmadd213ps_avx512vl(auVar245,auVar106,auVar37);
              auVar38._8_4_ = 0x3f3263b7;
              auVar38._0_8_ = 0x3f3263b73f3263b7;
              auVar38._12_4_ = 0x3f3263b7;
              auVar105 = vfmadd213ps_avx512vl(auVar105,auVar106,auVar38);
              auVar39._8_4_ = 0x3f7ff3bf;
              auVar39._0_8_ = 0x3f7ff3bf3f7ff3bf;
              auVar39._12_4_ = 0x3f7ff3bf;
              auVar105 = vfmadd213ps_avx512vl(auVar105,auVar106,auVar39);
              auVar106 = vpslld_avx(auVar209,0x17);
              auVar105 = vpaddd_avx(auVar106,auVar105);
              auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar102 = (bool)((byte)uVar88 & 1);
              auStack_930[1]._0_4_ =
                   (float)((uint)bVar102 * auVar106._0_4_ |
                          (uint)!bVar102 * (uint)((byte)uVar85 & 1) * auVar105._0_4_);
              bVar102 = (bool)((byte)(uVar88 >> 1) & 1);
              auStack_930[1]._4_4_ =
                   (float)((uint)bVar102 * auVar106._4_4_ |
                          (uint)!bVar102 * (uint)((byte)(uVar85 >> 1) & 1) * auVar105._4_4_);
              bVar102 = (bool)((byte)(uVar88 >> 2) & 1);
              local_b8._8_4_ =
                   (uint)bVar102 * auVar106._8_4_ |
                   (uint)!bVar102 * (uint)((byte)(uVar85 >> 2) & 1) * auVar105._8_4_;
              local_b8._0_4_ = (float)auStack_930[1];
              local_b8._4_4_ = auStack_930[1]._4_4_;
              bVar102 = SUB81(uVar88 >> 3,0);
              local_b8._12_4_ =
                   (uint)bVar102 * auVar106._12_4_ |
                   (uint)!bVar102 * (uint)(byte)(uVar85 >> 3) * auVar105._12_4_;
              in_ZmmResult._0_16_ = local_b8;
              auStack_930[0]._0_1_ = false;
              auStack_930[2] = local_b8._8_8_;
              Li::anon_class_128_16_8a10e554::operator()
                        ((anon_class_128_16_8a10e554 *)local_a48,(MediumSample *)local_9c8);
            }
            else {
              local_b18._0_8_ = CONCAT44(extraout_var_00._0_4_,fVar197) ^ 0x8000000000000000;
              local_b18._8_4_ = extraout_var_00._4_4_ ^ 0x80000000;
              local_b18._12_4_ = extraout_var_00._8_4_ ^ 0x80000000;
              local_98._0_4_ = (float)local_4d8._0_4_ * -fVar197;
              local_98._4_4_ = (float)local_4d8._4_4_ * -fVar197;
              local_98._8_4_ = fStack_4d0 * -fVar197;
              local_98._12_4_ = fStack_4cc * -fVar197;
              auVar28._8_4_ = 0x3fb8aa3b;
              auVar28._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar28._12_4_ = 0x3fb8aa3b;
              auVar105 = vmulps_avx512vl(local_98,auVar28);
              _local_af8 = vroundps_avx(auVar105,9);
              auVar105 = vsubps_avx(auVar105,_local_af8);
              auVar238 = ZEXT856(auVar105._8_8_);
              auVar204._8_4_ = 0x3da1d5b6;
              auVar204._0_8_ = 0x3da1d5b63da1d5b6;
              auVar204._12_4_ = 0x3da1d5b6;
              auVar29._8_4_ = 0x3e658299;
              auVar29._0_8_ = 0x3e6582993e658299;
              auVar29._12_4_ = 0x3e658299;
              auVar106 = vfmadd213ps_avx512vl(auVar204,auVar105,auVar29);
              auVar30._8_4_ = 0x3f3263b7;
              auVar30._0_8_ = 0x3f3263b73f3263b7;
              auVar30._12_4_ = 0x3f3263b7;
              auVar106 = vfmadd213ps_avx512vl(auVar106,auVar105,auVar30);
              auVar31._8_4_ = 0x3f7ff3bf;
              auVar31._0_8_ = 0x3f7ff3bf3f7ff3bf;
              auVar31._12_4_ = 0x3f7ff3bf;
              local_ae8 = vfmadd213ps_avx512vl(auVar106,auVar105,auVar31);
              auVar196 = ZEXT856(local_ae8._8_8_);
              SVar278 = DenselySampledSpectrum::Sample(this_03 + 2,lambda);
              auVar227._0_8_ = SVar278.values.values._8_8_;
              auVar227._8_56_ = auVar196;
              auVar159._0_8_ = SVar278.values.values._0_8_;
              auVar159._8_56_ = auVar238;
              auVar72._4_4_ = fStack_204;
              auVar72._0_4_ = local_208;
              auVar72._8_4_ = fStack_200;
              auVar72._12_4_ = fStack_1fc;
              auVar242 = vshufpd_avx(auVar72,auVar72,1);
              auVar255._4_4_ = local_898._0_4_;
              auVar255._0_4_ = local_898._0_4_;
              auVar255._8_4_ = local_898._0_4_;
              auVar255._12_4_ = local_898._0_4_;
              auVar105 = vdivps_avx(local_7f8,auVar255);
              auVar107 = vshufpd_avx(_local_4d8,_local_4d8,1);
              in_ZMM5 = ZEXT1664(auVar107);
              auVar265._0_4_ = (int)(float)local_af8._0_4_;
              auVar265._4_4_ = (int)(float)local_af8._4_4_;
              auVar265._8_4_ = (int)(float)uStack_af0;
              auVar265._12_4_ = (int)uStack_af0._4_4_;
              auVar32._8_4_ = 0xffffffe1;
              auVar32._0_8_ = 0xffffffe1ffffffe1;
              auVar32._12_4_ = 0xffffffe1;
              uVar85 = vpcmpgtd_avx512vl(auVar265,auVar32);
              uVar85 = uVar85 & 0xf;
              auVar33._8_4_ = 0x1e;
              auVar33._0_8_ = 0x1e0000001e;
              auVar33._12_4_ = 0x1e;
              uVar88 = vpcmpgtd_avx512vl(auVar265,auVar33);
              uVar88 = uVar88 & 0xf;
              auVar106 = vpslld_avx(auVar265,0x17);
              auVar106 = vpaddd_avx(auVar106,local_ae8);
              auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar102 = (bool)((byte)uVar88 & 1);
              auStack_930[1]._0_4_ =
                   (float)((uint)bVar102 * auVar111._0_4_ |
                          (uint)!bVar102 * (uint)((byte)uVar85 & 1) * auVar106._0_4_);
              bVar102 = (bool)((byte)(uVar88 >> 1) & 1);
              auStack_930[1]._4_4_ =
                   (float)((uint)bVar102 * auVar111._4_4_ |
                          (uint)!bVar102 * (uint)((byte)(uVar85 >> 1) & 1) * auVar106._4_4_);
              bVar102 = (bool)((byte)(uVar88 >> 2) & 1);
              local_c8._8_4_ =
                   (uint)bVar102 * auVar111._8_4_ |
                   (uint)!bVar102 * (uint)((byte)(uVar85 >> 2) & 1) * auVar106._8_4_;
              local_c8._0_4_ = (float)auStack_930[1];
              local_c8._4_4_ = auStack_930[1]._4_4_;
              bVar102 = SUB81(uVar88 >> 3,0);
              local_c8._12_4_ =
                   (uint)bVar102 * auVar111._12_4_ |
                   (uint)!bVar102 * (uint)(byte)(uVar85 >> 3) * auVar106._12_4_;
              in_ZmmResult._0_16_ = local_c8;
              in_ZMM10 = ZEXT1664(local_c8);
              auVar106 = vmovshdup_avx(auVar105);
              fVar197 = (float)local_b18._0_4_ * auVar105._0_4_ + (float)local_a78._0_4_;
              fVar250 = (float)local_b18._0_4_ * auVar106._0_4_ + (float)local_888._0_4_;
              fVar239 = (float)local_b18._0_4_ * (local_b00 / (float)local_898._0_4_) +
                        (float)local_7b8._0_4_;
              auVar256._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
              auVar256._8_4_ = auVar105._8_4_ ^ 0x80000000;
              auVar256._12_4_ = auVar105._12_4_ ^ 0x80000000;
              aIStack_9b8[2].high = -(local_b00 / (float)local_898._0_4_);
              in_ZMM4 = ZEXT1664(CONCAT412(0x80000000,
                                           CONCAT48(0x80000000,
                                                    CONCAT44(0x80000000,aIStack_9b8[2].high))));
              aIStack_9b8[1].low = (ray->super_Ray).time;
              aIStack_9b8[7] = (Interval<float>)&this_03[0x66666666666].values.ptr;
              aIStack_9b8[8].high = (float)((uint)((ulong)&this_03[3].lambda_max >> 0x20) | 0x10000)
              ;
              auVar266._4_4_ = fVar197;
              auVar266._0_4_ = fVar197;
              auVar266._8_4_ = fVar197;
              auVar266._12_4_ = fVar197;
              auVar269._4_4_ = fVar250;
              auVar269._0_4_ = fVar250;
              auVar269._8_4_ = fVar250;
              auVar269._12_4_ = fVar250;
              auVar105 = vmovlhps_avx(auVar266,auVar269);
              auVar270._4_4_ = fVar239;
              auVar270._0_4_ = fVar239;
              auVar270._8_4_ = fVar239;
              auVar270._12_4_ = fVar239;
              aIStack_9b8[3].low = 0.0;
              aIStack_9b8[3].high = 0.0;
              aIStack_9b8[4].low = 0.0;
              aIStack_9b8[4].high = 0.0;
              aIStack_9b8[5].low = 0.0;
              aIStack_9b8[0xb].high = fStack_214;
              aIStack_9b8[0xb].low = local_218;
              aIStack_9b8[0xc].low = fStack_210;
              aIStack_9b8[0xc].high = fStack_20c;
              auStack_930[0]._0_1_ = true;
              local_9c8._0_4_ = auVar105._0_4_;
              local_9c8._4_4_ = auVar105._4_4_;
              IStack_9c0.low = auVar105._8_4_;
              IStack_9c0.high = auVar105._12_4_;
              uVar195 = vmovlps_avx(auVar270);
              aIStack_9b8[0].low = (float)uVar195;
              aIStack_9b8[0].high = (float)((ulong)uVar195 >> 0x20);
              uVar195 = vmovlps_avx(auVar256);
              aIStack_9b8[1].high = (float)uVar195;
              aIStack_9b8[2].low = (float)((ulong)uVar195 >> 0x20);
              aIStack_9b8[6].low = 0.0;
              aIStack_9b8[6].high = 0.0;
              aIStack_9b8[8].low = SUB84(&this_03[3].lambda_max,0);
              auVar105 = vunpcklpd_avx(auVar72,auVar242);
              aIStack_9b8[9].low = auVar105._0_4_;
              aIStack_9b8._76_8_ = auVar105._4_8_;
              aIStack_9b8[10].high = auVar105._12_4_;
              auVar105 = vunpcklpd_avx(_local_4d8,auVar107);
              aIStack_9b8[0xd] = auVar105._0_8_;
              uStack_948._0_4_ = auVar105._8_4_;
              uStack_948._4_4_ = auVar105._12_4_;
              auVar105 = vmovlhps_avx(auVar159._0_16_,auVar227._0_16_);
              uStack_940 = auVar105._0_4_;
              uStack_93c._0_4_ = auVar105._4_4_;
              stack0xfffffffffffff6c8 = auVar105._8_8_;
              auStack_930[2] = local_c8._8_8_;
              Li::anon_class_128_16_8a10e554::operator()
                        ((anon_class_128_16_8a10e554 *)local_a48,(MediumSample *)local_9c8);
            }
            if ((bool)(undefined1)auStack_930[0] == true) {
              auStack_930[0]._0_1_ = false;
            }
          }
        }
      }
      else if (sVar57 == 3) {
        _local_a48 = (Interval<float>)&local_a88;
        IStack_a40 = (Interval<float>)&local_b1a;
        IStack_a38 = (Interval<float>)&local_aa8;
        pSStack_a30 = &local_878;
        uStack_a28 = (uintptr_t)&local_afc;
        TStack_a18.bits = (long)local_a60 + 8;
        local_a08 = (RNG *)local_728;
        local_9f0 = &local_168;
        local_9e8 = (optional<pbrt::SurfaceInteraction> *)&local_318;
        local_9e0 = &local_b19;
        local_9d8 = &local_b1c;
        local_9d0 = &local_b1b;
        fVar197 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar105 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar105,auVar105);
        auVar106 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
        auVar105 = vfmadd213ss_fma(auVar106,auVar106,auVar105);
        if (auVar105._0_4_ < 0.0) {
          fVar197 = sqrtf(auVar105._0_4_);
        }
        else {
          auVar105 = vsqrtss_avx(auVar105,auVar105);
          fVar197 = auVar105._0_4_;
        }
        local_b18._0_4_ = fVar197;
        fVar197 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar105 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar105,auVar105);
        auVar106 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
        auVar105 = vfmadd213ss_fma(auVar106,auVar106,auVar105);
        if (auVar105._0_4_ < 0.0) {
          fVar197 = sqrtf(auVar105._0_4_);
        }
        else {
          auVar105 = vsqrtss_avx(auVar105,auVar105);
          fVar197 = auVar105._0_4_;
        }
        local_af8._0_4_ = fVar197;
        local_ac8._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        local_a78._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        local_888._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        fVar197 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
        auVar135._4_4_ = fVar197;
        auVar135._0_4_ = fVar197;
        auVar135._8_4_ = fVar197;
        auVar135._12_4_ = fVar197;
        fVar197 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
        auVar201._4_4_ = fVar197;
        auVar201._0_4_ = fVar197;
        auVar201._8_4_ = fVar197;
        auVar201._12_4_ = fVar197;
        auVar105 = vmovlhps_avx(auVar135,auVar201);
        fVar197 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        auVar202._4_4_ = fVar197;
        auVar202._0_4_ = fVar197;
        auVar202._8_4_ = fVar197;
        auVar202._12_4_ = fVar197;
        local_7a8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = auVar105._0_4_;
        local_7a8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = auVar105._4_4_;
        local_7a8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = auVar105._8_4_;
        local_7a8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = auVar105._12_4_;
        local_7a8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
             (Interval<float>)vmovlps_avx(auVar202);
        Transform::operator()((Point3fi *)local_9c8,(Transform *)(this_03 + 3),&local_7a8);
        local_a98._0_4_ = (float)local_b18._0_4_ * (float)local_ae8._0_4_;
        auVar136._0_4_ = (float)local_888._0_4_ / (float)local_af8._0_4_;
        auVar136._4_12_ = SUB6012((undefined1  [60])0x0,0);
        fVar197 = (float)local_a78._0_4_ / (float)local_af8._0_4_;
        auVar106 = ZEXT416((uint)((float)local_ac8._0_4_ / (float)local_af8._0_4_));
        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * (float)this_03[3].lambda_max)),auVar106,
                                   ZEXT416((uint)this_03[3].lambda_min));
        local_8a8 = vfmadd231ss_fma(auVar105,auVar136,
                                    ZEXT416(*(uint *)&this_03[3].values.alloc.memoryResource));
        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 *
                                                 *(float *)((long)&this_03[3].values.ptr + 4))),
                                   auVar106,ZEXT416(*(uint *)&this_03[3].values.ptr));
        local_808 = vfmadd231ss_fma(auVar105,auVar136,ZEXT416((uint)this_03[3].values.nAlloc));
        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 *
                                                 *(float *)((long)&this_03[3].values.nStored + 4))),
                                   auVar106,ZEXT416((uint)this_03[3].values.nStored));
        local_8b8 = vfmadd231ss_fma(auVar105,auVar136,ZEXT416((uint)this_03[4].lambda_min));
        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_808._0_4_ * local_808._0_4_)),local_8a8,
                                   local_8a8);
        auVar105 = vfmadd231ss_fma(auVar105,local_8b8,local_8b8);
        if (0.0 < auVar105._0_4_) {
          auVar253._8_4_ = 0x7fffffff;
          auVar253._0_8_ = 0x7fffffff7fffffff;
          auVar253._12_4_ = 0x7fffffff;
          auVar106 = vandps_avx(local_8a8,auVar253);
          auVar242 = vandps_avx(local_808,auVar253);
          auVar107 = vandps_avx(local_8b8,auVar253);
          auVar106 = vfmadd231ss_fma(ZEXT416((uint)(auVar242._0_4_ * 0.0)),ZEXT816(0) << 0x40,
                                     auVar106);
          auVar106 = vfmadd231ss_fma(auVar106,ZEXT816(0) << 0x40,auVar107);
          fVar197 = auVar106._0_4_ / auVar105._0_4_;
          local_b18._0_4_ = fVar197;
          fVar197 = local_8a8._0_4_ * fVar197;
          i_03.high = fVar197;
          i_03.low = fVar197;
          auVar152._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_9c8,i_03);
          auVar152._8_56_ = extraout_var_08;
          uVar195 = vmovlps_avx(auVar152._0_16_);
          local_9c8._0_4_ = (undefined4)uVar195;
          local_9c8._4_4_ = (undefined4)((ulong)uVar195 >> 0x20);
          i_04.high = (float)local_b18._0_4_ * (float)local_808._0_4_;
          i_04.low = (float)local_b18._0_4_ * (float)local_808._0_4_;
          auVar153._0_8_ = Interval<float>::operator+<float>(&IStack_9c0,i_04);
          auVar153._8_56_ = extraout_var_09;
          uVar195 = vmovlps_avx(auVar153._0_16_);
          IStack_9c0.low = (float)uVar195;
          IStack_9c0.high = (float)((ulong)uVar195 >> 0x20);
          i_05.high = (float)local_b18._0_4_ * (float)local_8b8._0_4_;
          i_05.low = (float)local_b18._0_4_ * (float)local_8b8._0_4_;
          auVar154._0_8_ = Interval<float>::operator+<float>(aIStack_9b8,i_05);
          auVar154._8_56_ = extraout_var_10;
          uVar195 = vmovlps_avx(auVar154._0_16_);
          aIStack_9b8[0].low = (float)uVar195;
          aIStack_9b8[0].high = (float)((ulong)uVar195 >> 0x20);
          local_a98._0_4_ = (float)local_a98._0_4_ - (float)local_b18._0_4_;
        }
        in_ZMM5 = ZEXT1664(local_8a8);
        fVar197 = ((float)local_9c8._0_4_ + (float)local_9c8._4_4_) * 0.5;
        local_a78._0_4_ = fVar197;
        fVar250 = (IStack_9c0.low + IStack_9c0.high) * 0.5;
        local_898._0_4_ = fVar250;
        local_b00 = (aIStack_9b8[0].low + aIStack_9b8[0].high) * 0.5;
        auVar105 = ZEXT816(0) << 0x40;
        bVar102 = false;
        uVar97 = 0;
        do {
          fVar239 = local_8a8._0_4_;
          if ((uVar97 != 0) && (fVar239 = local_808._0_4_, uVar97 != 1)) {
            fVar239 = local_8b8._0_4_;
          }
          pvVar98 = &this_03->values;
          if ((uVar97 != 0) &&
             (pvVar98 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        ((long)&(this_03->values).alloc.memoryResource + 4), uVar97 != 1)) {
            pvVar98 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                      &(this_03->values).ptr;
          }
          fVar249 = fVar197;
          if ((uVar97 != 0) && (fVar249 = fVar250, uVar97 != 1)) {
            fVar249 = local_b00;
          }
          psVar99 = (size_t *)((long)&(this_03->values).ptr + 4);
          if ((uVar97 != 0) && (psVar99 = &(this_03->values).nAlloc, uVar97 != 1)) {
            psVar99 = (size_t *)((long)&(this_03->values).nAlloc + 4);
          }
          fVar259 = fVar197;
          if ((uVar97 != 0) && (fVar259 = fVar250, uVar97 != 1)) {
            fVar259 = local_b00;
          }
          in_ZMM4 = ZEXT464(0x3f800000);
          auVar242 = ZEXT416((uint)((1.0 / fVar239) * (*(float *)psVar99 - fVar259)));
          auVar107 = ZEXT416((uint)((1.0 / fVar239) *
                                   (*(float *)&(pvVar98->alloc).memoryResource - fVar249)));
          auVar106 = vminss_avx(auVar242,auVar107);
          auVar105 = vmaxss_avx(auVar106,auVar105);
          auVar106 = vmaxss_avx(auVar107,auVar242);
          auVar106 = vminss_avx(ZEXT416((uint)(auVar106._0_4_ * 1.0000004)),
                                ZEXT416((uint)local_a98._0_4_));
          auVar238 = ZEXT856(auVar106._8_8_);
          local_a98._0_4_ = auVar106._0_4_;
          if (auVar106._0_4_ < auVar105._0_4_) break;
          bVar102 = 1 < uVar97;
          uVar97 = uVar97 + 1;
        } while (uVar97 != 3);
        if (bVar102) {
          local_b18._0_4_ = auVar105._0_4_;
          uVar195 = 0;
          local_ae8 = ZEXT416((uint)this_03[2].values.nStored);
          SVar278 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&(this_03->values).nStored,lambda);
          auVar222._0_8_ = SVar278.values.values._8_8_;
          auVar222._8_56_ = auVar238;
          uStack_af0 = uVar195;
          local_af8 = (undefined1  [8])SVar278.values.values._0_8_;
          local_ac8 = auVar222._0_16_;
          auVar196 = (undefined1  [56])0x0;
          local_628 = ZEXT416((uint)this_03[2].values.nStored);
          SVar278 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&this_03[1].values.nStored,lambda);
          auVar223._0_8_ = SVar278.values.values._8_8_;
          auVar223._8_56_ = auVar238;
          auVar155._0_8_ = SVar278.values.values._0_8_;
          auVar155._8_56_ = auVar196;
          auVar105 = vunpcklpd_avx(_local_af8,local_ac8);
          local_178 = (float)local_ae8._0_4_ * auVar105._0_4_;
          fStack_174 = (float)local_ae8._0_4_ * auVar105._4_4_;
          fStack_170 = (float)local_ae8._0_4_ * auVar105._8_4_;
          fStack_16c = (float)local_ae8._0_4_ * auVar105._12_4_;
          auVar105 = vmovlhps_avx(auVar155._0_16_,auVar223._0_16_);
          local_188 = (float)local_628._0_4_ * auVar105._0_4_;
          fStack_184 = (float)local_628._0_4_ * auVar105._4_4_;
          fStack_180 = (float)local_628._0_4_ * auVar105._8_4_;
          fStack_17c = (float)local_628._0_4_ * auVar105._12_4_;
          local_1d8 = local_188 + local_178;
          fStack_1d4 = fStack_184 + fStack_174;
          fStack_1d0 = fStack_180 + fStack_170;
          fStack_1cc = fStack_17c + fStack_16c;
          fVar197 = *(float *)&(this_03->values).alloc.memoryResource;
          fVar250 = *(float *)((long)&(this_03->values).alloc.memoryResource + 4);
          fVar249 = *(float *)((long)&(this_03->values).ptr + 4) - fVar197;
          fVar259 = *(float *)&(this_03->values).nAlloc - fVar250;
          fVar239 = *(float *)&(this_03->values).ptr;
          fVar263 = *(float *)((long)&(this_03->values).nAlloc + 4) - fVar239;
          local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.x = (float)local_8a8._0_4_ / fVar249;
          fVar248 = (float)local_808._0_4_ / fVar259;
          local_a60._0_4_ = (float)local_8b8._0_4_ / fVar263;
          local_7c8 = (undefined1  [4])fVar248;
          fVar197 = ((float)local_a78._0_4_ - fVar197) / fVar249 +
                    (float)local_b18._0_4_ * local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.x;
          fVar250 = ((float)local_898._0_4_ - fVar250) / fVar259 + (float)local_b18._0_4_ * fVar248;
          fVar239 = (local_b00 - fVar239) / fVar263 +
                    (float)local_b18._0_4_ * (float)local_a60._0_4_;
          pvVar98 = &this_03[10].values;
          fVar249 = 1.0 / (float)*(int *)&this_03[10].values.alloc.memoryResource;
          pvVar2 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                   ((long)&this_03[10].values.alloc.memoryResource + 4);
          fVar259 = 1.0 / (float)*(int *)((long)&this_03[10].values.alloc.memoryResource + 4);
          in_ZMM4 = ZEXT1664(ZEXT416((uint)fVar259));
          ppfVar3 = &this_03[10].values.ptr;
          fVar263 = 1.0 / (float)*(int *)&this_03[10].values.ptr;
          in_ZMM5 = ZEXT1664(ZEXT416((uint)fVar263));
          lVar90 = 0;
          IVar130 = (Interval<float>)local_728._0_8_;
          do {
            iVar104 = (int)lVar90;
            pBVar92 = &local_6c8;
            if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
              pBVar92 = (BSSRDFProbeSegment *)local_7c8;
            }
            fVar248 = (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
            if ((fVar248 == 0.0) && (!NAN(fVar248))) {
              pBVar92 = &local_6c8;
              if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                pBVar92 = (BSSRDFProbeSegment *)local_7c8;
              }
              local_728._0_8_ = IVar130;
              (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
              IVar130 = (Interval<float>)local_728._0_8_;
            }
            fVar248 = aIStack_9b8[8].high;
            local_728._4_4_ = IVar130.high;
            fVar91 = fVar197;
            if ((iVar104 != 0) && (fVar91 = fVar250, iVar104 != 1)) {
              fVar91 = fVar239;
            }
            pvVar93 = pvVar98;
            if ((iVar104 != 0) && (pvVar93 = pvVar2, iVar104 != 1)) {
              pvVar93 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
            }
            pvVar96 = pvVar98;
            if ((iVar104 != 0) && (pvVar96 = pvVar2, iVar104 != 1)) {
              pvVar96 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
            }
            auVar268._0_4_ = (float)(*(int *)&(pvVar96->alloc).memoryResource + -1);
            auVar268._4_12_ = in_ZMM10._4_12_;
            auVar106 = ZEXT416((uint)(fVar91 * (float)*(int *)&(pvVar93->alloc).memoryResource));
            auVar105 = vminss_avx(auVar268,auVar106);
            uVar195 = vcmpss_avx512f(auVar106,ZEXT816(0) << 0x40,1);
            auVar116._16_48_ = in_ZmmResult._16_48_;
            auVar116._0_16_ = auVar105;
            fVar91 = (float)((uint)!(bool)((byte)uVar195 & 1) * auVar105._0_4_);
            in_ZmmResult._4_60_ = auVar116._4_60_;
            in_ZmmResult._0_4_ = (int)fVar91;
            fVar91 = (float)(int)fVar91;
            local_868.f.values.values[lVar90] = fVar91;
            pBVar92 = &local_6c8;
            if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
              pBVar92 = (BSSRDFProbeSegment *)local_7c8;
            }
            if (0.0 <= (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x) {
              pvVar93 = pvVar98;
              if ((iVar104 != 0) && (pvVar93 = pvVar2, iVar104 != 1)) {
                pvVar93 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
              }
              fVar264 = fVar197;
              if ((iVar104 != 0) && (fVar264 = fVar250, iVar104 != 1)) {
                fVar264 = fVar239;
              }
              pBVar92 = &local_6c8;
              if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                pBVar92 = (BSSRDFProbeSegment *)local_7c8;
              }
              (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90] =
                   (float)local_b18._0_4_ +
                   ((float)((int)fVar91 + 1) / (float)*(int *)&(pvVar93->alloc).memoryResource -
                   fVar264) / (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
              fVar91 = fVar249;
              if ((iVar104 != 0) && (fVar91 = fVar259, iVar104 != 1)) {
                fVar91 = fVar263;
              }
              pBVar92 = &local_6c8;
              if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                pBVar92 = (BSSRDFProbeSegment *)local_7c8;
              }
              *(float *)(local_538 + lVar90 * 4) =
                   fVar91 / (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
              *(undefined4 *)(local_598 + lVar90 * 4) = 1;
              pvVar93 = pvVar98;
              if ((iVar104 != 0) && (pvVar93 = pvVar2, iVar104 != 1)) {
                pvVar93 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
              }
              FVar129 = *(Float *)&(pvVar93->alloc).memoryResource;
            }
            else {
              pvVar93 = pvVar98;
              if ((iVar104 != 0) && (pvVar93 = pvVar2, iVar104 != 1)) {
                pvVar93 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
              }
              fVar264 = fVar197;
              if ((iVar104 != 0) && (fVar264 = fVar250, iVar104 != 1)) {
                fVar264 = fVar239;
              }
              pBVar92 = &local_6c8;
              if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                pBVar92 = (BSSRDFProbeSegment *)local_7c8;
              }
              (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90] =
                   (float)local_b18._0_4_ +
                   ((float)(int)fVar91 / (float)*(int *)&(pvVar93->alloc).memoryResource - fVar264)
                   / (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
              auVar105 = ZEXT416((uint)fVar249);
              if ((iVar104 != 0) && (auVar105 = ZEXT416((uint)fVar259), iVar104 != 1)) {
                auVar105 = ZEXT416((uint)fVar263);
              }
              pBVar92 = &local_6c8;
              if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                pBVar92 = (BSSRDFProbeSegment *)local_7c8;
              }
              auVar40._8_4_ = 0x80000000;
              auVar40._0_8_ = 0x8000000080000000;
              auVar40._12_4_ = 0x80000000;
              in_ZmmResult._0_16_ = vxorps_avx512vl(auVar105,auVar40);
              in_ZmmResult._16_48_ = auVar116._16_48_;
              *(float *)(local_538 + lVar90 * 4) =
                   in_ZmmResult._0_4_ / (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
              *(undefined4 *)(local_598 + lVar90 * 4) = 0xffffffff;
              FVar129 = -NAN;
            }
            (&local_618.eta)[lVar90] = FVar129;
            lVar90 = lVar90 + 1;
          } while (lVar90 != 3);
          uVar97 = (uint)local_728._4_4_ >> 0xd ^ (uint)((ulong)IVar130 >> 0x1b);
          local_728._0_8_ = (long)IVar130 * 0x5851f42d4c957f2d + local_728._8_8_;
          bVar87 = IVar130.high._3_1_ >> 3;
          auVar105 = vcvtusi2ss_avx512f(in_ZMM10._0_16_,uVar97 >> bVar87 | uVar97 << 0x20 - bVar87);
          auVar105 = vminss_avx(ZEXT416((uint)(auVar105._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
          ;
          local_ae8._0_4_ = auVar105._0_4_;
          puVar1 = (undefined1 *)((long)&this_03[2].values.nStored + 4);
          aIStack_9b8[8].high = (float)((uint)((ulong)puVar1 >> 0x20) | 0x10000);
          fVar250 = aIStack_9b8[8].high;
          aIStack_9b8[8].high = fVar248;
          fVar197 = (float)local_b18._0_4_;
          do {
            lVar90 = (long)*(int *)(&DAT_005e6660 +
                                   (ulong)((uint)(local_7a8.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high <
                                                 local_7a8.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.low) |
                                          (uint)(local_7a8.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 x.low < local_7a8.
                                                         super_Point3<pbrt::Interval<float>_>.
                                                                                                                  
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high) * 4 +
                                          (uint)(local_7a8.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 x.low < local_7a8.
                                                         super_Point3<pbrt::Interval<float>_>.
                                                                                                                  
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 2) * 4);
            local_ac8._0_4_ =
                 (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90];
            auVar75._4_4_ = fStack_1d4;
            auVar75._0_4_ = local_1d8;
            auVar75._8_4_ = fStack_1d0;
            auVar75._12_4_ = fStack_1cc;
            uVar240 = *(undefined4 *)
                       (this_03[9].values.nAlloc +
                       (((long)(int)local_868.f.values.values[2] *
                         (long)*(int *)((long)&this_03[10].values.alloc.memoryResource + 4) +
                        (long)(int)local_868.f.values.values[1]) *
                        (long)*(int *)&this_03[10].values.alloc.memoryResource +
                       (long)(int)local_868.f.values.values[0]) * 4);
            auVar41._4_4_ = uVar240;
            auVar41._0_4_ = uVar240;
            auVar41._8_4_ = uVar240;
            auVar41._12_4_ = uVar240;
            in_ZmmResult._0_16_ = vmulps_avx512vl(auVar75,auVar41);
            local_628 = in_ZmmResult._0_16_;
            if (in_ZmmResult._0_4_ <= 0.0) {
LAB_004151e9:
              fVar239 = (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90];
              if (((float)local_a98._0_4_ < fVar239) ||
                 (fVar249 = (float)((int)local_868.f.values.values[lVar90] +
                                   *(int *)(local_598 + lVar90 * 4)),
                 local_868.f.values.values[lVar90] = fVar249, fVar249 == (&local_618.eta)[lVar90]))
              goto LAB_0041521b;
              (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90] =
                   fVar239 + *(float *)(local_538 + lVar90 * 4);
              bVar102 = true;
              fVar197 = (float)local_ac8._0_4_;
            }
            else {
              auVar42._8_4_ = 0x80000000;
              auVar42._0_8_ = 0x8000000080000000;
              auVar42._12_4_ = 0x80000000;
              in_ZmmResult._0_16_ = vxorps_avx512vl(in_ZmmResult._0_16_,auVar42);
              _local_af8 = in_ZmmResult._0_16_;
              do {
                local_b18._0_4_ = fVar197;
                fVar197 = expf(((float)local_ac8._0_4_ - fVar197) * (float)local_af8._0_4_);
                fVar197 = 1.0 - fVar197;
                if (fVar197 <= (float)local_ae8._0_4_) {
                  auVar105 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                        ZEXT416((uint)(((float)local_ae8._0_4_ - fVar197) /
                                                      (1.0 - fVar197))));
                  local_ae8._0_4_ = auVar105._0_4_;
                  cVar103 = '\b';
LAB_00414f1e:
                  fVar197 = (float)local_b18._0_4_;
                }
                else {
                  fVar197 = logf(1.0 - (float)local_ae8._0_4_);
                  fVar197 = (float)local_b18._0_4_ - fVar197 / (float)local_628._0_4_;
                  in_ZMM4 = ZEXT464((uint)fVar197);
                  if ((float)local_a98._0_4_ <= fVar197) {
                    auStack_930[0]._0_1_ = false;
                    auStack_930[1]._4_4_ = fStack_5a4;
                    auStack_930[1]._0_4_ = local_5a8;
                    auStack_930[2]._4_4_ = fStack_59c;
                    auStack_930[2]._0_4_ = fStack_5a0;
                    Li::anon_class_128_16_8a10e554::operator()
                              ((anon_class_128_16_8a10e554 *)local_a48,(MediumSample *)local_9c8);
                    if ((bool)(undefined1)auStack_930[0] == true) {
                      auStack_930[0]._0_1_ = false;
                    }
                    cVar103 = '\x01';
                    goto LAB_00414f1e;
                  }
                  auVar105 = vinsertps_avx(ZEXT416((uint)(fVar197 * (float)local_8a8._0_4_ +
                                                         (float)local_a78._0_4_)),
                                           ZEXT416((uint)(fVar197 * (float)local_808._0_4_ +
                                                         (float)local_898._0_4_)),0x10);
                  local_838.f.values.values[2] = fVar197 * (float)local_8b8._0_4_ + local_b00;
                  local_838.f.values.values._0_8_ = vmovlps_avx(auVar105);
                  local_7f8._0_4_ = fVar197;
                  fVar197 = fVar197 - (float)local_b18._0_4_;
                  local_48._0_4_ = fVar197 * (float)local_af8._0_4_;
                  local_48._4_4_ = fVar197 * (float)local_af8._4_4_;
                  local_48._8_4_ = fVar197 * (float)uStack_af0;
                  local_48._12_4_ = fVar197 * uStack_af0._4_4_;
                  auVar43._8_4_ = 0x3fb8aa3b;
                  auVar43._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar43._12_4_ = 0x3fb8aa3b;
                  auVar105 = vmulps_avx512vl(local_48,auVar43);
                  _local_7b8 = vroundps_avx(auVar105,9);
                  auVar105 = vsubps_avx(auVar105,_local_7b8);
                  auVar238 = ZEXT856(auVar105._8_8_);
                  auVar203._8_4_ = 0x3da1d5b6;
                  auVar203._0_8_ = 0x3da1d5b63da1d5b6;
                  auVar203._12_4_ = 0x3da1d5b6;
                  auVar44._8_4_ = 0x3e658299;
                  auVar44._0_8_ = 0x3e6582993e658299;
                  auVar44._12_4_ = 0x3e658299;
                  auVar106 = vfmadd213ps_avx512vl(auVar203,auVar105,auVar44);
                  auVar45._8_4_ = 0x3f3263b7;
                  auVar45._0_8_ = 0x3f3263b73f3263b7;
                  auVar45._12_4_ = 0x3f3263b7;
                  auVar106 = vfmadd213ps_avx512vl(auVar106,auVar105,auVar45);
                  auVar46._8_4_ = 0x3f7ff3bf;
                  auVar46._0_8_ = 0x3f7ff3bf3f7ff3bf;
                  auVar46._12_4_ = 0x3f7ff3bf;
                  _local_888 = vfmadd213ps_avx512vl(auVar106,auVar105,auVar46);
                  auVar196 = ZEXT856(local_888._8_8_);
                  SVar278 = CloudMediumProvider::Density
                                      (*(CloudMediumProvider **)this_03,(Point3f *)&local_838,lambda
                                      );
                  auVar224._0_8_ = SVar278.values.values._8_8_;
                  auVar224._8_56_ = auVar196;
                  auVar156._0_8_ = SVar278.values.values._0_8_;
                  auVar156._8_56_ = auVar238;
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_838.f.values.values[1] *
                                                           *(float *)((long)&this_03[6].values.alloc
                                                                             .memoryResource + 4))),
                                             ZEXT416((uint)local_838.f.values.values[0]),
                                             ZEXT416(*(uint *)&this_03[6].values.alloc.
                                                               memoryResource));
                  auVar105 = vfmadd231ss_fma(auVar105,ZEXT416((uint)local_838.f.values.values[2]),
                                             ZEXT416(*(uint *)&this_03[6].values.ptr));
                  fVar239 = auVar105._0_4_ + *(float *)((long)&this_03[6].values.ptr + 4);
                  local_438 = ZEXT416((uint)fVar239);
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_838.f.values.values[1] *
                                                           *(float *)((long)&this_03[6].values.
                                                                             nAlloc + 4))),
                                             ZEXT416((uint)local_838.f.values.values[0]),
                                             ZEXT416((uint)this_03[6].values.nAlloc));
                  auVar105 = vfmadd231ss_fma(auVar105,ZEXT416((uint)local_838.f.values.values[2]),
                                             ZEXT416((uint)this_03[6].values.nStored));
                  local_448._0_4_ =
                       auVar105._0_4_ + *(float *)((long)&this_03[6].values.nStored + 4);
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_838.f.values.values[1] *
                                                           (float)this_03[7].lambda_max)),
                                             ZEXT416((uint)local_838.f.values.values[0]),
                                             ZEXT416((uint)this_03[7].lambda_min));
                  auVar105 = vfmadd231ss_fma(auVar105,ZEXT416((uint)local_838.f.values.values[2]),
                                             ZEXT416(*(uint *)&this_03[7].values.alloc.
                                                               memoryResource));
                  fVar249 = auVar105._0_4_ +
                            *(float *)((long)&this_03[7].values.alloc.memoryResource + 4);
                  local_458 = ZEXT416((uint)fVar249);
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_838.f.values.values[1] *
                                                           *(float *)((long)&this_03[7].values.ptr +
                                                                     4))),
                                             ZEXT416((uint)local_838.f.values.values[0]),
                                             ZEXT416(*(uint *)&this_03[7].values.ptr));
                  auVar105 = vfmadd231ss_fma(auVar105,ZEXT416((uint)local_838.f.values.values[2]),
                                             ZEXT416((uint)this_03[7].values.nAlloc));
                  fVar259 = auVar105._0_4_ + *(float *)((long)&this_03[7].values.nAlloc + 4);
                  bVar102 = fVar259 == 1.0;
                  fVar197 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar105 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar105,auVar105);
                  auVar106 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
                  auVar105 = vfmadd213ss_fma(auVar106,auVar106,auVar105);
                  if (auVar105._0_4_ < 0.0) {
                    local_438 = ZEXT416((uint)fVar239);
                    local_448 = ZEXT416((uint)local_448._0_4_);
                    local_458 = ZEXT416((uint)fVar249);
                    local_468 = CONCAT44(local_468._4_4_,fVar259);
                    local_7d8 = auVar156._0_16_;
                    local_748 = auVar224._0_16_;
                    fVar197 = sqrtf(auVar105._0_4_);
                    fVar259 = (float)local_468;
                    auVar105 = local_7d8;
                    auVar106 = local_748;
                  }
                  else {
                    auVar105 = vsqrtss_avx(auVar105,auVar105);
                    fVar197 = auVar105._0_4_;
                    auVar105 = auVar156._0_16_;
                    auVar106 = auVar224._0_16_;
                  }
                  auVar111 = local_628;
                  auVar243._0_4_ = (int)(float)local_7b8._0_4_;
                  auVar243._4_4_ = (int)(float)local_7b8._4_4_;
                  auVar243._8_4_ = (int)fStack_7b0;
                  auVar243._12_4_ = (int)fStack_7ac;
                  auVar47._8_4_ = 0xffffffe1;
                  auVar47._0_8_ = 0xffffffe1ffffffe1;
                  auVar47._12_4_ = 0xffffffe1;
                  uVar85 = vpcmpgtd_avx512vl(auVar243,auVar47);
                  uVar85 = uVar85 & 0xf;
                  auVar48._8_4_ = 0x1e;
                  auVar48._0_8_ = 0x1e0000001e;
                  auVar48._12_4_ = 0x1e;
                  uVar88 = vpcmpgtd_avx512vl(auVar243,auVar48);
                  uVar88 = uVar88 & 0xf;
                  auVar242 = vpslld_avx(auVar243,0x17);
                  auVar242 = vpaddd_avx(auVar242,_local_888);
                  auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar16 = (bool)((byte)uVar88 & 1);
                  auVar109._0_4_ =
                       (uint)bVar16 * auVar107._0_4_ |
                       (uint)!bVar16 * (uint)((byte)uVar85 & 1) * auVar242._0_4_;
                  bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
                  auVar109._4_4_ =
                       (uint)bVar16 * auVar107._4_4_ |
                       (uint)!bVar16 * (uint)((byte)(uVar85 >> 1) & 1) * auVar242._4_4_;
                  bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
                  auVar109._8_4_ =
                       (uint)bVar16 * auVar107._8_4_ |
                       (uint)!bVar16 * (uint)((byte)(uVar85 >> 2) & 1) * auVar242._8_4_;
                  bVar16 = SUB81(uVar88 >> 3,0);
                  auVar109._12_4_ =
                       (uint)bVar16 * auVar107._12_4_ |
                       (uint)!bVar16 * (uint)(byte)(uVar85 >> 3) * auVar242._12_4_;
                  in_ZMM10 = ZEXT1664(auVar109);
                  auVar242 = vshufpd_avx(auVar109,auVar109,1);
                  auVar106 = vmovlhps_avx(auVar105,auVar106);
                  fVar239 = local_438._0_4_ / fVar259;
                  auVar118._4_12_ = local_438._4_12_;
                  auVar118._0_4_ = fVar239;
                  fVar249 = local_458._0_4_ / fVar259;
                  auVar119._4_12_ = local_458._4_12_;
                  auVar119._0_4_ = fVar249;
                  auVar118._16_48_ = in_ZmmResult._16_48_;
                  auVar117._4_60_ = auVar118._4_60_;
                  auVar117._0_4_ =
                       (uint)bVar102 * (int)local_438._0_4_ + (uint)!bVar102 * (int)fVar239;
                  iVar104 = (uint)bVar102 * local_448._0_4_ +
                            (uint)!bVar102 * (int)((float)local_448._0_4_ / fVar259);
                  auVar119._16_48_ = in_ZmmResult._16_48_;
                  in_ZmmResult._4_60_ = auVar119._4_60_;
                  in_ZmmResult._0_4_ =
                       (uint)bVar102 * (int)local_458._0_4_ + (uint)!bVar102 * (int)fVar249;
                  aIStack_9b8[1].low = (ray->super_Ray).time;
                  in_ZMM5 = ZEXT464((uint)aIStack_9b8[1].low);
                  auVar276._0_4_ = auVar106._0_4_ * local_178;
                  auVar276._4_4_ = auVar106._4_4_ * fStack_174;
                  auVar276._8_4_ = auVar106._8_4_ * fStack_170;
                  local_458._12_4_ = auVar106._12_4_ * fStack_16c;
                  local_458._0_12_ = auVar276;
                  aIStack_9b8[0xb].low = auVar106._0_4_ * local_188;
                  aIStack_9b8[0xb].high = auVar106._4_4_ * fStack_184;
                  aIStack_9b8[0xc].low = auVar106._8_4_ * fStack_180;
                  aIStack_9b8[0xc].high = auVar106._12_4_ * fStack_17c;
                  aIStack_9b8[2].high =
                       -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z / fVar197;
                  uVar88._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
                  uVar88._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar273._0_8_ = uVar88 ^ 0x8000000080000000;
                  auVar273._8_4_ = 0x80000000;
                  auVar273._12_4_ = 0x80000000;
                  auVar137._4_4_ = fVar197;
                  auVar137._0_4_ = fVar197;
                  auVar137._8_4_ = fVar197;
                  auVar137._12_4_ = fVar197;
                  auVar105 = vdivps_avx(auVar273,auVar137);
                  auVar254._4_4_ = iVar104;
                  auVar254._0_4_ = iVar104;
                  auVar254._8_4_ = iVar104;
                  auVar254._12_4_ = iVar104;
                  auVar261._4_4_ = in_ZmmResult._0_4_;
                  auVar261._0_4_ = in_ZmmResult._0_4_;
                  auVar261._8_4_ = in_ZmmResult._0_4_;
                  auVar261._12_4_ = in_ZmmResult._0_4_;
                  in_ZMM4 = ZEXT1664(auVar261);
                  aIStack_9b8[3].high =
                       (float)((uint)(auVar273._0_8_ >> 0x20) ^ uVar88._4_4_ ^ 0x80000000);
                  aIStack_9b8[3].low = 0.0;
                  aIStack_9b8[4].low = 0.0;
                  aIStack_9b8[4].high = 0.0;
                  aIStack_9b8[5].low = 0.0;
                  aIStack_9b8[0xd].low = (float)local_628._0_4_;
                  aIStack_9b8[0xd].high = (float)local_628._4_4_;
                  uStack_948._0_4_ = auVar111._8_4_;
                  uStack_948._4_4_ = auVar111._12_4_;
                  auStack_930[0]._0_1_ = true;
                  auVar107 = vshufps_avx(auVar117._0_16_,auVar254,0x40);
                  local_9c8._0_4_ = auVar107._0_4_;
                  local_9c8._4_4_ = auVar107._4_4_;
                  IStack_9c0.low = auVar107._8_4_;
                  IStack_9c0.high = auVar107._12_4_;
                  uVar195 = vmovlps_avx(auVar261);
                  aIStack_9b8[0].low = (float)uVar195;
                  aIStack_9b8[0].high = (float)((ulong)uVar195 >> 0x20);
                  uVar195 = vmovlps_avx(auVar105);
                  aIStack_9b8[1].high = (float)uVar195;
                  aIStack_9b8[2].low = (float)((ulong)uVar195 >> 0x20);
                  aIStack_9b8[6].low = 0.0;
                  aIStack_9b8[6].high = 0.0;
                  aIStack_9b8[7].low = (float)local_ab0;
                  aIStack_9b8[7].high = (float)(local_ab0 >> 0x20);
                  aIStack_9b8[8].low = SUB84(puVar1,0);
                  aIStack_9b8._76_8_ = auVar276._4_8_;
                  stack0xfffffffffffff6c8 = 0;
                  auVar105 = vunpcklpd_avx(auVar109,auVar242);
                  auStack_930[1] = auVar105._0_8_;
                  auStack_930[2] = auVar105._8_8_;
                  aIStack_9b8[8].high = fVar250;
                  aIStack_9b8[9].low = auVar276._0_4_;
                  aIStack_9b8[10].high = local_458._12_4_;
                  uStack_940 = aIStack_9b8[3].low;
                  uStack_93c._0_4_ = aIStack_9b8[3].high;
                  local_628 = auVar111;
                  local_448 = auVar106;
                  local_438 = auVar109;
                  bVar102 = Li::anon_class_128_16_8a10e554::operator()
                                      ((anon_class_128_16_8a10e554 *)local_a48,
                                       (MediumSample *)local_9c8);
                  uVar195 = local_728._0_8_;
                  uVar240 = local_728._4_4_;
                  if ((bool)(undefined1)auStack_930[0] == true) {
                    auStack_930[0]._0_1_ = false;
                  }
                  cVar103 = !bVar102;
                  fVar197 = (float)local_b18._0_4_;
                  if (!(bool)cVar103) {
                    local_728._0_8_ = local_728._0_8_ * 0x5851f42d4c957f2d + local_728._8_8_;
                    uVar97 = (uint)uVar240 >> 0xd ^ (uint)((ulong)uVar195 >> 0x1b);
                    bVar87 = SUB81(uVar195,7) >> 3;
                    auVar105 = vcvtusi2ss_avx512f(in_ZMM13._0_16_,
                                                  uVar97 >> bVar87 | uVar97 << 0x20 - bVar87);
                    auVar105 = vminss_avx(ZEXT416((uint)(auVar105._0_4_ * 2.3283064e-10)),
                                          ZEXT416(0x3f7fffff));
                    local_ae8._0_4_ = auVar105._0_4_;
                    fVar197 = (float)local_7f8._0_4_;
                  }
                  local_468 = local_af8;
                  uStack_460 = uStack_af0;
                  lambda = local_730;
                }
              } while (cVar103 == '\0');
              if (cVar103 == '\b') goto LAB_004151e9;
LAB_0041521b:
              bVar102 = false;
            }
          } while (bVar102);
LAB_004164f3:
          sampler = (SamplerHandle *)local_7e0;
        }
      }
      else {
        _local_a48 = (Interval<float>)&local_a88;
        IStack_a40 = (Interval<float>)&local_b1a;
        IStack_a38 = (Interval<float>)&local_aa8;
        pSStack_a30 = &local_878;
        uStack_a28 = (uintptr_t)&local_afc;
        TStack_a18.bits = (long)local_a60 + 8;
        local_a08 = (RNG *)local_728;
        local_9f0 = &local_168;
        local_9e8 = (optional<pbrt::SurfaceInteraction> *)&local_318;
        local_9e0 = &local_b19;
        local_9d8 = &local_b1c;
        local_9d0 = &local_b1b;
        fVar197 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar105 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar105,auVar105);
        auVar106 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
        auVar105 = vfmadd213ss_fma(auVar106,auVar106,auVar105);
        if (auVar105._0_4_ < 0.0) {
          fVar197 = sqrtf(auVar105._0_4_);
        }
        else {
          auVar105 = vsqrtss_avx(auVar105,auVar105);
          fVar197 = auVar105._0_4_;
        }
        local_b18._0_4_ = fVar197;
        fVar197 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar105 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar105,auVar105);
        auVar106 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
        auVar105 = vfmadd213ss_fma(auVar106,auVar106,auVar105);
        if (auVar105._0_4_ < 0.0) {
          fVar197 = sqrtf(auVar105._0_4_);
        }
        else {
          auVar105 = vsqrtss_avx(auVar105,auVar105);
          fVar197 = auVar105._0_4_;
        }
        local_af8._0_4_ = fVar197;
        local_ac8._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        local_ab0 = CONCAT44(local_ab0._4_4_,(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y
                            );
        local_a78._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        fVar197 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
        auVar105._4_4_ = fVar197;
        auVar105._0_4_ = fVar197;
        auVar105._8_4_ = fVar197;
        auVar105._12_4_ = fVar197;
        fVar197 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
        auVar242._4_4_ = fVar197;
        auVar242._0_4_ = fVar197;
        auVar242._8_4_ = fVar197;
        auVar242._12_4_ = fVar197;
        auVar105 = vmovlhps_avx(auVar105,auVar242);
        fVar197 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        auVar107._4_4_ = fVar197;
        auVar107._0_4_ = fVar197;
        auVar107._8_4_ = fVar197;
        auVar107._12_4_ = fVar197;
        local_7a8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = auVar105._0_4_;
        local_7a8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = auVar105._4_4_;
        local_7a8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = auVar105._8_4_;
        local_7a8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = auVar105._12_4_;
        local_7a8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
             (Interval<float>)vmovlps_avx(auVar107);
        Transform::operator()((Point3fi *)local_9c8,(Transform *)(this_03 + 3),&local_7a8);
        local_a98._0_4_ = (float)local_b18._0_4_ * (float)local_ae8._0_4_;
        auVar106._0_4_ = (float)local_a78._0_4_ / (float)local_af8._0_4_;
        auVar106._4_12_ = SUB6012((undefined1  [60])0x0,0);
        fVar197 = (float)local_ab0 / (float)local_af8._0_4_;
        auVar242 = ZEXT416((uint)((float)local_ac8._0_4_ / (float)local_af8._0_4_));
        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * (float)this_03[3].lambda_max)),auVar242,
                                   ZEXT416((uint)this_03[3].lambda_min));
        local_7d8 = vfmadd231ss_fma(auVar105,auVar106,
                                    ZEXT416(*(uint *)&this_03[3].values.alloc.memoryResource));
        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 *
                                                 *(float *)((long)&this_03[3].values.ptr + 4))),
                                   auVar242,ZEXT416(*(uint *)&this_03[3].values.ptr));
        local_8b8 = vfmadd231ss_fma(auVar105,auVar106,ZEXT416((uint)this_03[3].values.nAlloc));
        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 *
                                                 *(float *)((long)&this_03[3].values.nStored + 4))),
                                   auVar242,ZEXT416((uint)this_03[3].values.nStored));
        local_8a8 = vfmadd231ss_fma(auVar105,auVar106,ZEXT416((uint)this_03[4].lambda_min));
        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_8b8._0_4_ * local_8b8._0_4_)),local_7d8,
                                   local_7d8);
        auVar105 = vfmadd231ss_fma(auVar105,local_8a8,local_8a8);
        if (0.0 < auVar105._0_4_) {
          auVar111._8_4_ = 0x7fffffff;
          auVar111._0_8_ = 0x7fffffff7fffffff;
          auVar111._12_4_ = 0x7fffffff;
          auVar106 = vandps_avx(local_7d8,auVar111);
          auVar242 = vandps_avx(local_8b8,auVar111);
          auVar107 = vandps_avx(local_8a8,auVar111);
          auVar106 = vfmadd231ss_fma(ZEXT416((uint)(auVar242._0_4_ * 0.0)),ZEXT816(0) << 0x40,
                                     auVar106);
          auVar106 = vfmadd231ss_fma(auVar106,ZEXT816(0) << 0x40,auVar107);
          fVar197 = auVar106._0_4_ / auVar105._0_4_;
          local_b18._0_4_ = fVar197;
          fVar197 = local_7d8._0_4_ * fVar197;
          IVar130.high = fVar197;
          IVar130.low = fVar197;
          auVar185._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_9c8,IVar130);
          auVar185._8_56_ = extraout_var_11;
          uVar195 = vmovlps_avx(auVar185._0_16_);
          local_9c8._0_4_ = (undefined4)uVar195;
          local_9c8._4_4_ = (undefined4)((ulong)uVar195 >> 0x20);
          IVar131.high = (float)local_b18._0_4_ * (float)local_8b8._0_4_;
          IVar131.low = (float)local_b18._0_4_ * (float)local_8b8._0_4_;
          auVar247._0_8_ = Interval<float>::operator+<float>(&IStack_9c0,IVar131);
          auVar247._8_56_ = extraout_var_12;
          uVar195 = vmovlps_avx(auVar247._0_16_);
          IStack_9c0.low = (float)uVar195;
          IStack_9c0.high = (float)((ulong)uVar195 >> 0x20);
          i_06.high = (float)local_b18._0_4_ * (float)local_8a8._0_4_;
          i_06.low = (float)local_b18._0_4_ * (float)local_8a8._0_4_;
          auVar160._0_8_ = Interval<float>::operator+<float>(aIStack_9b8,i_06);
          auVar160._8_56_ = extraout_var_13;
          uVar195 = vmovlps_avx(auVar160._0_16_);
          aIStack_9b8[0].low = (float)uVar195;
          aIStack_9b8[0].high = (float)((ulong)uVar195 >> 0x20);
          local_a98._0_4_ = (float)local_a98._0_4_ - (float)local_b18._0_4_;
        }
        in_ZMM5 = ZEXT1664(local_7d8);
        fVar197 = ((float)local_9c8._0_4_ + (float)local_9c8._4_4_) * 0.5;
        local_ab0 = CONCAT44(local_ab0._4_4_,fVar197);
        fVar250 = (IStack_9c0.low + IStack_9c0.high) * 0.5;
        local_7f8._0_4_ = fVar250;
        fVar239 = (aIStack_9b8[0].low + aIStack_9b8[0].high) * 0.5;
        local_808._0_4_ = fVar239;
        auVar105 = ZEXT816(0) << 0x40;
        bVar102 = false;
        uVar97 = 0;
        do {
          fVar249 = local_7d8._0_4_;
          if ((uVar97 != 0) && (fVar249 = local_8b8._0_4_, uVar97 != 1)) {
            fVar249 = local_8a8._0_4_;
          }
          pvVar98 = &this_03->values;
          if ((uVar97 != 0) &&
             (pvVar98 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        ((long)&(this_03->values).alloc.memoryResource + 4), uVar97 != 1)) {
            pvVar98 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                      &(this_03->values).ptr;
          }
          fVar259 = fVar197;
          if ((uVar97 != 0) && (fVar259 = fVar250, uVar97 != 1)) {
            fVar259 = fVar239;
          }
          psVar99 = (size_t *)((long)&(this_03->values).ptr + 4);
          if ((uVar97 != 0) && (psVar99 = &(this_03->values).nAlloc, uVar97 != 1)) {
            psVar99 = (size_t *)((long)&(this_03->values).nAlloc + 4);
          }
          fVar263 = fVar197;
          if ((uVar97 != 0) && (fVar263 = fVar250, uVar97 != 1)) {
            fVar263 = fVar239;
          }
          in_ZMM4 = ZEXT464(0x3f800000);
          auVar242 = ZEXT416((uint)((1.0 / fVar249) * (*(float *)psVar99 - fVar263)));
          auVar107 = ZEXT416((uint)((1.0 / fVar249) *
                                   (*(float *)&(pvVar98->alloc).memoryResource - fVar259)));
          auVar106 = vminss_avx(auVar242,auVar107);
          auVar105 = vmaxss_avx(auVar106,auVar105);
          auVar106 = vmaxss_avx(auVar107,auVar242);
          auVar106 = vminss_avx(ZEXT416((uint)(auVar106._0_4_ * 1.0000004)),
                                ZEXT416((uint)local_a98._0_4_));
          auVar238 = ZEXT856(auVar106._8_8_);
          local_a98._0_4_ = auVar106._0_4_;
          if (auVar106._0_4_ < auVar105._0_4_) break;
          bVar102 = 1 < uVar97;
          uVar97 = uVar97 + 1;
        } while (uVar97 != 3);
        if (bVar102) {
          local_b18._0_4_ = auVar105._0_4_;
          uVar195 = 0;
          local_ae8 = ZEXT416((uint)this_03[2].values.nStored);
          SVar278 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&(this_03->values).nStored,lambda);
          auVar228._0_8_ = SVar278.values.values._8_8_;
          auVar228._8_56_ = auVar238;
          uStack_af0 = uVar195;
          local_af8 = (undefined1  [8])SVar278.values.values._0_8_;
          local_ac8 = auVar228._0_16_;
          auVar196 = (undefined1  [56])0x0;
          local_638 = ZEXT416((uint)this_03[2].values.nStored);
          SVar278 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&this_03[1].values.nStored,lambda);
          auVar229._0_8_ = SVar278.values.values._8_8_;
          auVar229._8_56_ = auVar238;
          auVar161._0_8_ = SVar278.values.values._0_8_;
          auVar161._8_56_ = auVar196;
          auVar105 = vunpcklpd_avx(_local_af8,local_ac8);
          local_198 = (float)local_ae8._0_4_ * auVar105._0_4_;
          fStack_194 = (float)local_ae8._0_4_ * auVar105._4_4_;
          fStack_190 = (float)local_ae8._0_4_ * auVar105._8_4_;
          fStack_18c = (float)local_ae8._0_4_ * auVar105._12_4_;
          auVar105 = vmovlhps_avx(auVar161._0_16_,auVar229._0_16_);
          local_1a8 = (float)local_638._0_4_ * auVar105._0_4_;
          fStack_1a4 = (float)local_638._0_4_ * auVar105._4_4_;
          fStack_1a0 = (float)local_638._0_4_ * auVar105._8_4_;
          fStack_19c = (float)local_638._0_4_ * auVar105._12_4_;
          local_1e8 = local_1a8 + local_198;
          fStack_1e4 = fStack_1a4 + fStack_194;
          fStack_1e0 = fStack_1a0 + fStack_190;
          fStack_1dc = fStack_19c + fStack_18c;
          fVar197 = *(float *)&(this_03->values).alloc.memoryResource;
          fVar250 = *(float *)((long)&(this_03->values).alloc.memoryResource + 4);
          fVar249 = *(float *)((long)&(this_03->values).ptr + 4) - fVar197;
          fVar259 = *(float *)&(this_03->values).nAlloc - fVar250;
          fVar239 = *(float *)&(this_03->values).ptr;
          fVar263 = *(float *)((long)&(this_03->values).nAlloc + 4) - fVar239;
          local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.x = (float)local_7d8._0_4_ / fVar249;
          fVar248 = (float)local_8b8._0_4_ / fVar259;
          local_a60._0_4_ = (float)local_8a8._0_4_ / fVar263;
          local_7c8 = (undefined1  [4])fVar248;
          fVar197 = ((float)local_ab0 - fVar197) / fVar249 +
                    (float)local_b18._0_4_ * local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.x;
          fVar250 = ((float)local_7f8._0_4_ - fVar250) / fVar259 + (float)local_b18._0_4_ * fVar248;
          fVar239 = ((float)local_808._0_4_ - fVar239) / fVar263 +
                    (float)local_b18._0_4_ * (float)local_a60._0_4_;
          pvVar98 = &this_03[10].values;
          fVar249 = 1.0 / (float)*(int *)&this_03[10].values.alloc.memoryResource;
          pvVar2 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                   ((long)&this_03[10].values.alloc.memoryResource + 4);
          fVar259 = 1.0 / (float)*(int *)((long)&this_03[10].values.alloc.memoryResource + 4);
          in_ZMM4 = ZEXT1664(ZEXT416((uint)fVar259));
          ppfVar3 = &this_03[10].values.ptr;
          fVar263 = 1.0 / (float)*(int *)&this_03[10].values.ptr;
          in_ZMM5 = ZEXT1664(ZEXT416((uint)fVar263));
          lVar90 = 0;
          IVar130 = (Interval<float>)local_728._0_8_;
          IVar131 = aIStack_9b8[7];
          do {
            iVar104 = (int)lVar90;
            pBVar92 = &local_6c8;
            if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
              pBVar92 = (BSSRDFProbeSegment *)local_7c8;
            }
            fVar248 = (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
            if ((fVar248 == 0.0) && (!NAN(fVar248))) {
              pBVar92 = &local_6c8;
              if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                pBVar92 = (BSSRDFProbeSegment *)local_7c8;
              }
              local_728._0_8_ = IVar130;
              aIStack_9b8[7] = IVar131;
              (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
              IVar130 = (Interval<float>)local_728._0_8_;
              IVar131 = aIStack_9b8[7];
            }
            local_728._4_4_ = IVar130.high;
            uVar240 = local_728._4_4_;
            fVar248 = fVar197;
            if ((iVar104 != 0) && (fVar248 = fVar250, iVar104 != 1)) {
              fVar248 = fVar239;
            }
            pvVar93 = pvVar98;
            if ((iVar104 != 0) && (pvVar93 = pvVar2, iVar104 != 1)) {
              pvVar93 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
            }
            pvVar96 = pvVar98;
            if ((iVar104 != 0) && (pvVar96 = pvVar2, iVar104 != 1)) {
              pvVar96 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
            }
            auVar271._0_4_ = (float)(*(int *)&(pvVar96->alloc).memoryResource + -1);
            auVar271._4_12_ = in_ZMM10._4_12_;
            auVar106 = ZEXT416((uint)(fVar248 * (float)*(int *)&(pvVar93->alloc).memoryResource));
            auVar105 = vminss_avx(auVar271,auVar106);
            uVar195 = vcmpss_avx512f(auVar106,ZEXT816(0) << 0x40,1);
            auVar120._16_48_ = in_ZmmResult._16_48_;
            auVar120._0_16_ = auVar105;
            fVar248 = (float)((uint)!(bool)((byte)uVar195 & 1) * auVar105._0_4_);
            in_ZmmResult._4_60_ = auVar120._4_60_;
            in_ZmmResult._0_4_ = (int)fVar248;
            fVar248 = (float)(int)fVar248;
            local_868.f.values.values[lVar90] = fVar248;
            pBVar92 = &local_6c8;
            if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
              pBVar92 = (BSSRDFProbeSegment *)local_7c8;
            }
            if (0.0 <= (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x) {
              pvVar93 = pvVar98;
              if ((iVar104 != 0) && (pvVar93 = pvVar2, iVar104 != 1)) {
                pvVar93 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
              }
              fVar91 = fVar197;
              if ((iVar104 != 0) && (fVar91 = fVar250, iVar104 != 1)) {
                fVar91 = fVar239;
              }
              pBVar92 = &local_6c8;
              if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                pBVar92 = (BSSRDFProbeSegment *)local_7c8;
              }
              (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90] =
                   (float)local_b18._0_4_ +
                   ((float)((int)fVar248 + 1) / (float)*(int *)&(pvVar93->alloc).memoryResource -
                   fVar91) / (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
              fVar248 = fVar249;
              if ((iVar104 != 0) && (fVar248 = fVar259, iVar104 != 1)) {
                fVar248 = fVar263;
              }
              pBVar92 = &local_6c8;
              if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                pBVar92 = (BSSRDFProbeSegment *)local_7c8;
              }
              *(float *)(local_538 + lVar90 * 4) =
                   fVar248 / (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
              *(undefined4 *)(local_598 + lVar90 * 4) = 1;
              pvVar93 = pvVar98;
              if ((iVar104 != 0) && (pvVar93 = pvVar2, iVar104 != 1)) {
                pvVar93 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
              }
              FVar129 = *(Float *)&(pvVar93->alloc).memoryResource;
            }
            else {
              pvVar93 = pvVar98;
              if ((iVar104 != 0) && (pvVar93 = pvVar2, iVar104 != 1)) {
                pvVar93 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3;
              }
              fVar91 = fVar197;
              if ((iVar104 != 0) && (fVar91 = fVar250, iVar104 != 1)) {
                fVar91 = fVar239;
              }
              pBVar92 = &local_6c8;
              if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                pBVar92 = (BSSRDFProbeSegment *)local_7c8;
              }
              (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90] =
                   (float)local_b18._0_4_ +
                   ((float)(int)fVar248 / (float)*(int *)&(pvVar93->alloc).memoryResource - fVar91)
                   / (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
              auVar105 = ZEXT416((uint)fVar249);
              if ((iVar104 != 0) && (auVar105 = ZEXT416((uint)fVar259), iVar104 != 1)) {
                auVar105 = ZEXT416((uint)fVar263);
              }
              pBVar92 = &local_6c8;
              if ((iVar104 != 0) && (pBVar92 = (BSSRDFProbeSegment *)local_a60, iVar104 == 1)) {
                pBVar92 = (BSSRDFProbeSegment *)local_7c8;
              }
              auVar258._8_4_ = 0x80000000;
              auVar258._0_8_ = 0x8000000080000000;
              auVar258._12_4_ = 0x80000000;
              in_ZmmResult._0_16_ = vxorps_avx512vl(auVar105,auVar258);
              in_ZmmResult._16_48_ = auVar120._16_48_;
              *(float *)(local_538 + lVar90 * 4) =
                   in_ZmmResult._0_4_ / (pBVar92->p0).super_Tuple3<pbrt::Point3,_float>.x;
              *(undefined4 *)(local_598 + lVar90 * 4) = 0xffffffff;
              FVar129 = -NAN;
            }
            (&local_618.eta)[lVar90] = FVar129;
            lVar90 = lVar90 + 1;
          } while (lVar90 != 3);
          local_728._0_8_ = (long)IVar130 * 0x5851f42d4c957f2d + local_728._8_8_;
          uVar97 = (uint)uVar240 >> 0xd ^ (uint)((ulong)IVar130 >> 0x1b);
          bVar87 = IVar130.high._3_1_ >> 3;
          auVar105 = vcvtusi2ss_avx512f(in_ZMM10._0_16_,uVar97 >> bVar87 | uVar97 << 0x20 - bVar87);
          auVar105 = vminss_avx(ZEXT416((uint)(auVar105._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
          ;
          local_ae8._0_4_ = auVar105._0_4_;
          aIStack_9b8[7].high = (float)((uint)((ulong)this_03 >> 0x20) | 0x40000);
          fVar250 = aIStack_9b8[7].high;
          local_748._0_8_ = (ulong)((long)&this_03[2].values.nStored + 4U) | 0x1000000000000;
          fVar197 = (float)local_b18._0_4_;
          do {
            lVar90 = (long)*(int *)(&DAT_005e6660 +
                                   (ulong)((uint)(local_7a8.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high <
                                                 local_7a8.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.low) |
                                          (uint)(local_7a8.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 x.low < local_7a8.
                                                         super_Point3<pbrt::Interval<float>_>.
                                                                                                                  
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high) * 4 +
                                          (uint)(local_7a8.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 x.low < local_7a8.
                                                         super_Point3<pbrt::Interval<float>_>.
                                                                                                                  
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 2) * 4);
            local_ac8._0_4_ =
                 (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90];
            auVar74._4_4_ = fStack_1e4;
            auVar74._0_4_ = local_1e8;
            auVar74._8_4_ = fStack_1e0;
            auVar74._12_4_ = fStack_1dc;
            uVar240 = *(undefined4 *)
                       (this_03[9].values.nAlloc +
                       (((long)(int)local_868.f.values.values[2] *
                         (long)*(int *)((long)&this_03[10].values.alloc.memoryResource + 4) +
                        (long)(int)local_868.f.values.values[1]) *
                        (long)*(int *)&this_03[10].values.alloc.memoryResource +
                       (long)(int)local_868.f.values.values[0]) * 4);
            auVar49._4_4_ = uVar240;
            auVar49._0_4_ = uVar240;
            auVar49._8_4_ = uVar240;
            auVar49._12_4_ = uVar240;
            in_ZmmResult._0_16_ = vmulps_avx512vl(auVar74,auVar49);
            local_638 = in_ZmmResult._0_16_;
            if (in_ZmmResult._0_4_ <= 0.0) {
LAB_00416496:
              fVar239 = (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90];
              if (((float)local_a98._0_4_ < fVar239) ||
                 (fVar249 = (float)((int)local_868.f.values.values[lVar90] +
                                   *(int *)(local_598 + lVar90 * 4)),
                 local_868.f.values.values[lVar90] = fVar249, fVar249 == (&local_618.eta)[lVar90]))
              goto LAB_004164c8;
              (&local_7a8.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar90] =
                   fVar239 + *(float *)(local_538 + lVar90 * 4);
              bVar102 = true;
              fVar197 = (float)local_ac8._0_4_;
            }
            else {
              auVar50._8_4_ = 0x80000000;
              auVar50._0_8_ = 0x8000000080000000;
              auVar50._12_4_ = 0x80000000;
              in_ZmmResult._0_16_ = vxorps_avx512vl(in_ZmmResult._0_16_,auVar50);
              _local_af8 = in_ZmmResult._0_16_;
              do {
                local_b18._0_4_ = fVar197;
                aIStack_9b8[7] = IVar131;
                fVar197 = expf(((float)local_ac8._0_4_ - fVar197) * (float)local_af8._0_4_);
                fVar197 = 1.0 - fVar197;
                if (fVar197 <= (float)local_ae8._0_4_) {
                  auVar105 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                        ZEXT416((uint)(((float)local_ae8._0_4_ - fVar197) /
                                                      (1.0 - fVar197))));
                  local_ae8._0_4_ = auVar105._0_4_;
                  cVar103 = '\b';
LAB_004161b4:
                  fVar197 = (float)local_b18._0_4_;
                  IVar131 = aIStack_9b8[7];
                }
                else {
                  fVar197 = logf(1.0 - (float)local_ae8._0_4_);
                  fVar197 = (float)local_b18._0_4_ - fVar197 / (float)local_638._0_4_;
                  in_ZMM4 = ZEXT464((uint)fVar197);
                  if ((float)local_a98._0_4_ <= fVar197) {
                    auStack_930[0]._0_1_ = false;
                    auStack_930[1]._4_4_ = fStack_5a4;
                    auStack_930[1]._0_4_ = local_5a8;
                    auStack_930[2]._4_4_ = fStack_59c;
                    auStack_930[2]._0_4_ = fStack_5a0;
                    Li::anon_class_128_16_8a10e554::operator()
                              ((anon_class_128_16_8a10e554 *)local_a48,(MediumSample *)local_9c8);
                    if ((bool)(undefined1)auStack_930[0] == true) {
                      auStack_930[0]._0_1_ = false;
                    }
                    cVar103 = '\x01';
                    goto LAB_004161b4;
                  }
                  auVar105 = vinsertps_avx(ZEXT416((uint)(fVar197 * (float)local_7d8._0_4_ +
                                                         (float)local_ab0)),
                                           ZEXT416((uint)(fVar197 * (float)local_8b8._0_4_ +
                                                         (float)local_7f8._0_4_)),0x10);
                  local_838.f.values.values[2] =
                       fVar197 * (float)local_8a8._0_4_ + (float)local_808._0_4_;
                  local_838.f.values.values._0_8_ = vmovlps_avx(auVar105);
                  fVar239 = fVar197 - (float)local_b18._0_4_;
                  local_58._0_4_ = fVar239 * (float)local_af8._0_4_;
                  local_58._4_4_ = fVar239 * (float)local_af8._4_4_;
                  local_58._8_4_ = fVar239 * (float)uStack_af0;
                  local_58._12_4_ = fVar239 * uStack_af0._4_4_;
                  auVar51._8_4_ = 0x3fb8aa3b;
                  auVar51._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar51._12_4_ = 0x3fb8aa3b;
                  auVar105 = vmulps_avx512vl(local_58,auVar51);
                  _local_888 = vroundps_avx(auVar105,9);
                  auVar105 = vsubps_avx(auVar105,_local_888);
                  auVar238 = ZEXT856(auVar105._8_8_);
                  auVar205._8_4_ = 0x3da1d5b6;
                  auVar205._0_8_ = 0x3da1d5b63da1d5b6;
                  auVar205._12_4_ = 0x3da1d5b6;
                  auVar52._8_4_ = 0x3e658299;
                  auVar52._0_8_ = 0x3e6582993e658299;
                  auVar52._12_4_ = 0x3e658299;
                  auVar106 = vfmadd213ps_avx512vl(auVar205,auVar105,auVar52);
                  auVar53._8_4_ = 0x3f3263b7;
                  auVar53._0_8_ = 0x3f3263b73f3263b7;
                  auVar53._12_4_ = 0x3f3263b7;
                  auVar106 = vfmadd213ps_avx512vl(auVar106,auVar105,auVar53);
                  auVar54._8_4_ = 0x3f7ff3bf;
                  auVar54._0_8_ = 0x3f7ff3bf3f7ff3bf;
                  auVar54._12_4_ = 0x3f7ff3bf;
                  local_a78 = vfmadd213ps_avx512vl(auVar106,auVar105,auVar54);
                  auVar196 = ZEXT856(local_a78._8_8_);
                  local_b00 = fVar197;
                  SVar278 = NanoVDBMediumProvider::Density
                                      (*(NanoVDBMediumProvider **)this_03,(Point3f *)&local_838,
                                       lambda);
                  auVar230._0_8_ = SVar278.values.values._8_8_;
                  auVar230._8_56_ = auVar196;
                  auVar162._0_8_ = SVar278.values.values._0_8_;
                  auVar162._8_56_ = auVar238;
                  _local_7b8 = auVar162._0_16_;
                  local_898 = auVar230._0_16_;
                  SVar278 = NanoVDBMediumProvider::Le
                                      (*(NanoVDBMediumProvider **)this_03,(Point3f *)&local_838,
                                       lambda);
                  auVar231._0_8_ = SVar278.values.values._8_8_;
                  auVar231._8_56_ = auVar196;
                  local_488 = auVar231._0_16_;
                  auVar163._0_8_ = SVar278.values.values._0_8_;
                  auVar163._8_56_ = auVar238;
                  local_478 = auVar163._0_16_;
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_838.f.values.values[1] *
                                                           *(float *)((long)&this_03[6].values.alloc
                                                                             .memoryResource + 4))),
                                             ZEXT416((uint)local_838.f.values.values[0]),
                                             ZEXT416(*(uint *)&this_03[6].values.alloc.
                                                               memoryResource));
                  auVar105 = vfmadd231ss_fma(auVar105,ZEXT416((uint)local_838.f.values.values[2]),
                                             ZEXT416(*(uint *)&this_03[6].values.ptr));
                  fVar239 = auVar105._0_4_ + *(float *)((long)&this_03[6].values.ptr + 4);
                  local_498 = ZEXT416((uint)fVar239);
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_838.f.values.values[1] *
                                                           *(float *)((long)&this_03[6].values.
                                                                             nAlloc + 4))),
                                             ZEXT416((uint)local_838.f.values.values[0]),
                                             ZEXT416((uint)this_03[6].values.nAlloc));
                  auVar105 = vfmadd231ss_fma(auVar105,ZEXT416((uint)local_838.f.values.values[2]),
                                             ZEXT416((uint)this_03[6].values.nStored));
                  fVar249 = auVar105._0_4_ + *(float *)((long)&this_03[6].values.nStored + 4);
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_838.f.values.values[1] *
                                                           (float)this_03[7].lambda_max)),
                                             ZEXT416((uint)local_838.f.values.values[0]),
                                             ZEXT416((uint)this_03[7].lambda_min));
                  auVar105 = vfmadd231ss_fma(auVar105,ZEXT416((uint)local_838.f.values.values[2]),
                                             ZEXT416(*(uint *)&this_03[7].values.alloc.
                                                               memoryResource));
                  fVar259 = auVar105._0_4_ +
                            *(float *)((long)&this_03[7].values.alloc.memoryResource + 4);
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(local_838.f.values.values[1] *
                                                           *(float *)((long)&this_03[7].values.ptr +
                                                                     4))),
                                             ZEXT416((uint)local_838.f.values.values[0]),
                                             ZEXT416(*(uint *)&this_03[7].values.ptr));
                  auVar105 = vfmadd231ss_fma(auVar105,ZEXT416((uint)local_838.f.values.values[2]),
                                             ZEXT416((uint)this_03[7].values.nAlloc));
                  fVar263 = auVar105._0_4_ + *(float *)((long)&this_03[7].values.nAlloc + 4);
                  bVar102 = fVar263 == 1.0;
                  fVar197 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar105 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar105,auVar105);
                  auVar106 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
                  auVar105 = vfmadd213ss_fma(auVar106,auVar106,auVar105);
                  if (auVar105._0_4_ < 0.0) {
                    local_498 = ZEXT416((uint)fVar239);
                    local_5b8 = ZEXT416((uint)fVar249);
                    local_5c8 = ZEXT416((uint)fVar259);
                    local_8bc = fVar263;
                    fVar197 = sqrtf(auVar105._0_4_);
                    fVar263 = local_8bc;
                    auVar105 = local_5c8;
                    fVar249 = (float)local_5b8._0_4_;
                    auVar106 = local_488;
                  }
                  else {
                    auVar105 = vsqrtss_avx(auVar105,auVar105);
                    fVar197 = auVar105._0_4_;
                    auVar105 = ZEXT416((uint)fVar259);
                    auVar106 = local_488;
                  }
                  auVar244._0_4_ = (int)(float)local_888._0_4_;
                  auVar244._4_4_ = (int)(float)local_888._4_4_;
                  auVar244._8_4_ = (int)fStack_880;
                  auVar244._12_4_ = (int)fStack_87c;
                  auVar55._8_4_ = 0xffffffe1;
                  auVar55._0_8_ = 0xffffffe1ffffffe1;
                  auVar55._12_4_ = 0xffffffe1;
                  uVar85 = vpcmpgtd_avx512vl(auVar244,auVar55);
                  uVar85 = uVar85 & 0xf;
                  auVar56._8_4_ = 0x1e;
                  auVar56._0_8_ = 0x1e0000001e;
                  auVar56._12_4_ = 0x1e;
                  uVar88 = vpcmpgtd_avx512vl(auVar244,auVar56);
                  uVar88 = uVar88 & 0xf;
                  auVar242 = vpslld_avx(auVar244,0x17);
                  auVar242 = vpaddd_avx(auVar242,local_a78);
                  auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar16 = (bool)((byte)uVar88 & 1);
                  auVar110._0_4_ =
                       (uint)bVar16 * auVar107._0_4_ |
                       (uint)!bVar16 * (uint)((byte)uVar85 & 1) * auVar242._0_4_;
                  bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
                  auVar110._4_4_ =
                       (uint)bVar16 * auVar107._4_4_ |
                       (uint)!bVar16 * (uint)((byte)(uVar85 >> 1) & 1) * auVar242._4_4_;
                  bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
                  auVar110._8_4_ =
                       (uint)bVar16 * auVar107._8_4_ |
                       (uint)!bVar16 * (uint)((byte)(uVar85 >> 2) & 1) * auVar242._8_4_;
                  bVar16 = SUB81(uVar88 >> 3,0);
                  auVar110._12_4_ =
                       (uint)bVar16 * auVar107._12_4_ |
                       (uint)!bVar16 * (uint)(byte)(uVar85 >> 3) * auVar242._12_4_;
                  in_ZMM10 = ZEXT1664(auVar110);
                  auVar242 = vshufpd_avx(auVar110,auVar110,1);
                  in_ZMM13 = ZEXT1664(auVar242);
                  local_488 = vmovlhps_avx(_local_7b8,local_898);
                  fVar239 = local_498._0_4_ / fVar263;
                  auVar122._4_12_ = local_498._4_12_;
                  auVar122._0_4_ = fVar239;
                  fVar259 = auVar105._0_4_ / fVar263;
                  auVar123._4_12_ = auVar105._4_12_;
                  auVar123._0_4_ = fVar259;
                  auVar122._16_48_ = in_ZmmResult._16_48_;
                  auVar121._4_60_ = auVar122._4_60_;
                  auVar121._0_4_ =
                       (uint)bVar102 * (int)local_498._0_4_ + (uint)!bVar102 * (int)fVar239;
                  iVar104 = (uint)bVar102 * (int)fVar249 + (uint)!bVar102 * (int)(fVar249 / fVar263)
                  ;
                  auVar123._16_48_ = in_ZmmResult._16_48_;
                  in_ZmmResult._4_60_ = auVar123._4_60_;
                  in_ZmmResult._0_4_ =
                       (uint)bVar102 * (int)auVar105._0_4_ + (uint)!bVar102 * (int)fVar259;
                  aIStack_9b8[1].low = (ray->super_Ray).time;
                  in_ZMM5 = ZEXT464((uint)aIStack_9b8[1].low);
                  auVar277._0_4_ = local_488._0_4_ * local_198;
                  auVar277._4_4_ = local_488._4_4_ * fStack_194;
                  auVar277._8_4_ = local_488._8_4_ * fStack_190;
                  local_498._12_4_ = local_488._12_4_ * fStack_18c;
                  local_498._0_12_ = auVar277;
                  aIStack_9b8[0xb].low = local_488._0_4_ * local_1a8;
                  aIStack_9b8[0xb].high = local_488._4_4_ * fStack_1a4;
                  aIStack_9b8[0xc].low = local_488._8_4_ * fStack_1a0;
                  aIStack_9b8[0xc].high = local_488._12_4_ * fStack_19c;
                  aIStack_9b8[2].high =
                       -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z / fVar197;
                  uVar85._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
                  uVar85._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar274._0_8_ = uVar85 ^ 0x8000000080000000;
                  auVar274._8_4_ = 0x80000000;
                  auVar274._12_4_ = 0x80000000;
                  auVar138._4_4_ = fVar197;
                  auVar138._0_4_ = fVar197;
                  auVar138._8_4_ = fVar197;
                  auVar138._12_4_ = fVar197;
                  auVar105 = vdivps_avx(auVar274,auVar138);
                  auVar257._4_4_ = iVar104;
                  auVar257._0_4_ = iVar104;
                  auVar257._8_4_ = iVar104;
                  auVar257._12_4_ = iVar104;
                  auVar262._4_4_ = in_ZmmResult._0_4_;
                  auVar262._0_4_ = in_ZmmResult._0_4_;
                  auVar262._8_4_ = in_ZmmResult._0_4_;
                  auVar262._12_4_ = in_ZmmResult._0_4_;
                  in_ZMM4 = ZEXT1664(auVar262);
                  aIStack_9b8[3].high =
                       (float)((uint)(auVar274._0_8_ >> 0x20) ^ uVar85._4_4_ ^ 0x80000000);
                  aIStack_9b8[3].low = 0.0;
                  aIStack_9b8[4].low = 0.0;
                  aIStack_9b8[4].high = 0.0;
                  aIStack_9b8[5].low = 0.0;
                  aIStack_9b8[0xd] = local_638._0_8_;
                  uStack_948._0_4_ = local_638._8_4_;
                  uStack_948._4_4_ = local_638._12_4_;
                  auStack_930[0]._0_1_ = true;
                  auVar107 = vshufps_avx(auVar121._0_16_,auVar257,0x40);
                  local_9c8._0_4_ = auVar107._0_4_;
                  local_9c8._4_4_ = auVar107._4_4_;
                  IStack_9c0.low = auVar107._8_4_;
                  IStack_9c0.high = auVar107._12_4_;
                  uVar195 = vmovlps_avx(auVar262);
                  aIStack_9b8[0].low = (float)uVar195;
                  aIStack_9b8[0].high = (float)((ulong)uVar195 >> 0x20);
                  uVar195 = vmovlps_avx(auVar105);
                  aIStack_9b8[1].high = (float)uVar195;
                  aIStack_9b8[2].low = (float)((ulong)uVar195 >> 0x20);
                  aIStack_9b8[6].low = 0.0;
                  aIStack_9b8[6].high = 0.0;
                  aIStack_9b8[7].low = SUB84(this_03,0);
                  aIStack_9b8[8].low = local_748._0_4_;
                  aIStack_9b8[8].high = local_748._4_4_;
                  aIStack_9b8._76_8_ = auVar277._4_8_;
                  auVar105 = vmovlhps_avx(local_478,auVar106);
                  uStack_940 = auVar105._0_4_;
                  uStack_93c._0_4_ = auVar105._4_4_;
                  stack0xfffffffffffff6c8 = auVar105._8_8_;
                  auVar105 = vunpcklpd_avx(auVar110,auVar242);
                  auStack_930[1] = auVar105._0_8_;
                  auStack_930[2] = auVar105._8_8_;
                  aIStack_9b8[7].high = fVar250;
                  aIStack_9b8[9].low = auVar277._0_4_;
                  aIStack_9b8[10].high = local_498._12_4_;
                  local_478 = auVar110;
                  bVar102 = Li::anon_class_128_16_8a10e554::operator()
                                      ((anon_class_128_16_8a10e554 *)local_a48,
                                       (MediumSample *)local_9c8);
                  uVar195 = local_728._0_8_;
                  uVar240 = local_728._4_4_;
                  if ((bool)(undefined1)auStack_930[0] == true) {
                    auStack_930[0]._0_1_ = false;
                  }
                  cVar103 = !bVar102;
                  fVar197 = (float)local_b18._0_4_;
                  if (!(bool)cVar103) {
                    local_728._0_8_ = local_728._0_8_ * 0x5851f42d4c957f2d + local_728._8_8_;
                    uVar97 = (uint)uVar240 >> 0xd ^ (uint)((ulong)uVar195 >> 0x1b);
                    bVar87 = SUB81(uVar195,7) >> 3;
                    auVar105 = vcvtusi2ss_avx512f(in_XMM14,uVar97 >> bVar87 |
                                                           uVar97 << 0x20 - bVar87);
                    auVar105 = vminss_avx(ZEXT416((uint)(auVar105._0_4_ * 2.3283064e-10)),
                                          ZEXT416(0x3f7fffff));
                    local_ae8._0_4_ = auVar105._0_4_;
                    fVar197 = local_b00;
                  }
                  local_78 = local_af8;
                  uStack_70 = uStack_af0;
                  lambda = local_730;
                  IVar131 = (Interval<float>)CONCAT44(aIStack_9b8[7].high,aIStack_9b8[7].low);
                }
              } while (cVar103 == '\0');
              if (cVar103 == '\b') goto LAB_00416496;
LAB_004164c8:
              bVar102 = false;
            }
            aIStack_9b8[7] = IVar131;
          } while (bVar102);
          goto LAB_004164f3;
        }
      }
    }
    pVVar82 = local_ad0;
    uVar97 = 1;
    if ((local_b1a == '\0') && (uVar97 = 0, local_b19 == false)) {
      *(long *)(in_FS_OFFSET + -0x330) = *(long *)(in_FS_OFFSET + -0x330) + 1;
      if ((0 < local_afc) && ((bool)local_220 == local_168.set)) {
        LogFatal<char_const(&)[57]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                   ,0x43f,"Check failed: %s",
                   (char (*) [57])"prevSurfaceIntr.has_value() ^ prevMediumIntr.has_value()");
      }
      if ((byte)local_328 == '\0') {
        pLVar13 = *(pointer *)
                   ((long)&(local_ad0->super_RayIntegrator).super_ImageTileIntegrator.
                           super_Integrator.infiniteLights.
                           super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                           ._M_impl.super__Vector_impl_data + 8);
        uVar97 = 3;
        for (pLVar101 = (local_ad0->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                        infiniteLights.
                        super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                        _M_impl.super__Vector_impl_data._M_start; pLVar101 != pLVar13;
            pLVar101 = pLVar101 + 1) {
          uVar85 = (pLVar101->
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   ).bits;
          auVar105 = ZEXT816(0) << 0x40;
          auVar106 = ZEXT816(0) << 0x40;
          if (0x6ffffffffffff < uVar85) {
            this_02 = (ImageInfiniteLight *)(uVar85 & 0xffffffffffff);
            auVar105 = in_ZMM4._0_16_;
            auVar106 = in_ZMM5._0_16_;
            auVar242 = in_ZMM10._0_16_;
            auVar107 = in_ZMM13._0_16_;
            if (uVar85 >> 0x30 == 8) {
              auVar238 = ZEXT856(0);
              auVar196 = ZEXT856(0);
              in_ZMM4 = ZEXT1664(auVar105);
              in_ZMM5 = ZEXT1664(auVar106);
              in_ZMM10 = ZEXT1664(auVar242);
              in_ZMM13 = ZEXT1664(auVar107);
              SVar278 = ImageInfiniteLight::Le(this_02,&ray->super_Ray,lambda);
              auVar234._0_8_ = SVar278.values.values._8_8_;
              auVar234._8_56_ = auVar196;
              auVar106 = auVar234._0_16_;
              auVar166._0_8_ = SVar278.values.values._0_8_;
              auVar166._8_56_ = auVar238;
              auVar105 = auVar166._0_16_;
            }
            else if ((short)(uVar85 >> 0x30) == 7) {
              auVar238 = ZEXT856(0);
              auVar196 = ZEXT856(0);
              in_ZMM4 = ZEXT1664(auVar105);
              in_ZMM5 = ZEXT1664(auVar106);
              in_ZMM10 = ZEXT1664(auVar242);
              in_ZMM13 = ZEXT1664(auVar107);
              SVar278 = UniformInfiniteLight::Le
                                  ((UniformInfiniteLight *)this_02,&ray->super_Ray,lambda);
              auVar233._0_8_ = SVar278.values.values._8_8_;
              auVar233._8_56_ = auVar196;
              auVar106 = auVar233._0_16_;
              auVar165._0_8_ = SVar278.values.values._0_8_;
              auVar165._8_56_ = auVar238;
              auVar105 = auVar165._0_16_;
            }
            else {
              auVar238 = ZEXT856(0);
              auVar196 = ZEXT856(0);
              in_ZMM4 = ZEXT1664(auVar105);
              in_ZMM5 = ZEXT1664(auVar106);
              in_ZMM10 = ZEXT1664(auVar242);
              in_ZMM13 = ZEXT1664(auVar107);
              SVar278 = PortalImageInfiniteLight::Le
                                  ((PortalImageInfiniteLight *)this_02,&ray->super_Ray,lambda);
              auVar235._0_8_ = SVar278.values.values._8_8_;
              auVar235._8_56_ = auVar196;
              auVar106 = auVar235._0_16_;
              auVar167._0_8_ = SVar278.values.values._0_8_;
              auVar167._8_56_ = auVar238;
              auVar105 = auVar167._0_16_;
            }
          }
          auVar105 = vmovlhps_avx(auVar105,auVar106);
          local_728._0_4_ = auVar105._0_4_;
          local_728._4_4_ = auVar105._4_4_;
          local_728._8_4_ = auVar105._8_4_;
          local_728._12_4_ = auVar105._12_4_;
          if (((float)local_728._0_4_ != 0.0) || (NAN((float)local_728._0_4_))) {
LAB_0041670f:
            if ((local_afc == 0) || (local_b1c == true)) {
              auVar141._0_4_ = (float)local_728._0_4_ * local_a88.values.values[0];
              auVar141._4_4_ = (float)local_728._4_4_ * local_a88.values.values[1];
              auVar141._8_4_ = (float)local_728._8_4_ * local_a88.values.values[2];
              auVar141._12_4_ = (float)local_728._12_4_ * local_a88.values.values[3];
              lVar90 = 1;
              fVar197 = local_aa8.values.values[0];
              do {
                fVar197 = fVar197 + local_aa8.values.values[lVar90];
                lVar90 = lVar90 + 1;
              } while (lVar90 != 4);
              fVar197 = fVar197 * 0.25;
              auVar207._0_4_ = fVar197 * (lambda->pdf).values[0];
              auVar207._4_4_ = fVar197 * (lambda->pdf).values[1];
              auVar207._8_4_ = fVar197 * (lambda->pdf).values[2];
              auVar207._12_4_ = fVar197 * (lambda->pdf).values[3];
              uVar85 = vcmpps_avx512vl(auVar207,_DAT_005c8010,4);
              auVar105 = vdivps_avx512vl(auVar141,auVar207);
              fVar197 = (float)((uint)((byte)uVar85 & 1) * auVar105._0_4_);
              fVar249 = (float)((uint)((byte)(uVar85 >> 1) & 1) * auVar105._4_4_);
              in_ZmmResult._4_4_ = fVar249;
              in_ZmmResult._0_4_ = (int)fVar197;
              fVar239 = (float)((uint)((byte)(uVar85 >> 2) & 1) * auVar105._8_4_);
              in_ZmmResult._8_4_ = fVar239;
              fVar250 = (float)((uint)((byte)(uVar85 >> 3) & 1) * auVar105._12_4_);
              in_ZmmResult._12_4_ = fVar250;
              fStack_a54 = fVar249 + fStack_a54;
              local_a60._8_4_ = fVar197 + (float)local_a60._8_4_;
              fStack_a50 = fVar239 + fStack_a50;
              fStack_a4c = fVar250 + fStack_a4c;
            }
            else {
              local_a48 = (undefined1  [4])0x0;
              uStack_a28._0_4_ = 0.0;
              uStack_a28._4_4_ = 0.0;
              fStack_a20 = 0.0;
              fStack_a1c = 0.0;
              fStack_a44 = 0.0;
              IStack_a40.low = 0.0;
              IStack_a40.high = 0.0;
              pSStack_a30 = (SampledSpectrum *)0x0;
              if (local_220 == '\x01') {
                aIStack_9b8[0].low = (float)uStack_308;
                aIStack_9b8[0].high = (float)((ulong)uStack_308 >> 0x20);
                local_9c8._0_4_ = local_318._0_4_;
                local_9c8._4_4_ = local_318._4_4_;
                IStack_9c0.low = (float)uStack_310;
                IStack_9c0.high = (float)((ulong)uStack_310 >> 0x20);
                aIStack_9b8[2].low = (float)(undefined4)uStack_2e8;
                aIStack_9b8[1].low = (float)uStack_2f0;
                aIStack_9b8[1].high = (float)((ulong)uStack_2f0 >> 0x20);
                aIStack_9b8[3].high = *(float *)(local_680 + 1);
                aIStack_9b8[2].high = (float)*local_680;
                aIStack_9b8[3].low = (float)((ulong)*local_680 >> 0x20);
              }
              else {
                if (local_168.set == false) {
                  IStack_a38.low = (float)uStack_a28;
                  IStack_a38.high = uStack_a28._4_4_;
                  LogFatal<char_const(&)[4]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                             ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
                }
                aIStack_9b8[0].low = (float)local_168.optionalValue._16_8_;
                aIStack_9b8[0].high = (float)((ulong)local_168.optionalValue._16_8_ >> 0x20);
                local_9c8._0_4_ = local_168.optionalValue.__align._0_4_;
                local_9c8._4_4_ = local_168.optionalValue.__align._4_4_;
                IStack_9c0.low = (float)local_168.optionalValue._8_8_;
                IStack_9c0.high = (float)((ulong)local_168.optionalValue._8_8_ >> 0x20);
                aIStack_9b8[1].low = 0.0;
                aIStack_9b8[1].high = 0.0;
                aIStack_9b8[2].low = 0.0;
                aIStack_9b8[2].high = 0.0;
                aIStack_9b8[3].low = 0.0;
                aIStack_9b8[3].high = 0.0;
              }
              uStack_a28._0_4_ = aIStack_9b8[2].low;
              uStack_a28._4_4_ = aIStack_9b8[2].high;
              fStack_a20 = aIStack_9b8[3].low;
              fStack_a1c = aIStack_9b8[3].high;
              local_a48 = (undefined1  [4])local_9c8._0_4_;
              fStack_a44 = (float)local_9c8._4_4_;
              IStack_a40.low = IStack_9c0.low;
              IStack_a40.high = IStack_9c0.high;
              IStack_a38.low = aIStack_9b8[0].low;
              IStack_a38.high = aIStack_9b8[0].high;
              pSStack_a30 = (SampledSpectrum *)CONCAT44(aIStack_9b8[1].high,aIStack_9b8[1].low);
              uVar14 = (pLVar101->
                       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                       ).bits;
              uVar85 = (local_ad0->lightSampler).
                       super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                       .bits;
              pEVar94 = (ExhaustiveLightSampler *)(uVar85 & 0xffffffffffff);
              sVar57 = (short)(uVar85 >> 0x30);
              auVar105 = in_ZMM4._0_16_;
              auVar242 = in_ZMM10._0_16_;
              auVar107 = in_ZMM13._0_16_;
              auVar106 = in_ZMM5._0_16_;
              local_9c8._0_4_ = (undefined4)uVar14;
              local_9c8._4_4_ = (undefined4)(uVar14 >> 0x20);
              if (uVar85 < 0x3000000000000) {
                if (sVar57 == 2) {
                  in_ZMM4 = ZEXT1664(auVar105);
                  in_ZMM5 = ZEXT1664(auVar106);
                  in_ZMM10 = ZEXT1664(auVar242);
                  in_ZMM13 = ZEXT1664(auVar107);
                  local_b18._0_4_ =
                       PowerLightSampler::PDF
                                 ((PowerLightSampler *)pEVar94,(LightSampleContext *)local_a48,
                                  (LightHandle *)local_9c8);
                  local_b18._4_4_ = extraout_XMM0_Db;
                  local_b18._8_4_ = extraout_XMM0_Dc;
                  local_b18._12_4_ = extraout_XMM0_Dd;
                }
                else {
                  sVar15 = (pEVar94->lights).nStored;
                  auVar105 = vcvtusi2ss_avx512f(auVar106,sVar15);
                  fVar197 = 1.0 / auVar105._0_4_;
                  auVar125._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar125._0_4_ = fVar197;
                  auVar125._16_48_ = in_ZmmResult._16_48_;
                  auVar124._4_60_ = auVar125._4_60_;
                  auVar124._0_4_ = (uint)(sVar15 != 0) * (int)fVar197;
                  local_b18 = auVar124._0_16_;
                }
              }
              else if (sVar57 == 3) {
                in_ZMM4 = ZEXT1664(auVar105);
                in_ZMM5 = ZEXT1664(auVar106);
                in_ZMM10 = ZEXT1664(auVar242);
                in_ZMM13 = ZEXT1664(auVar107);
                local_b18._0_4_ =
                     BVHLightSampler::PDF
                               ((BVHLightSampler *)pEVar94,(LightSampleContext *)local_a48,
                                (LightHandle *)local_9c8);
                local_b18._4_4_ = extraout_XMM0_Db_00;
                local_b18._8_4_ = extraout_XMM0_Dc_00;
                local_b18._12_4_ = extraout_XMM0_Dd_00;
              }
              else {
                in_ZMM4 = ZEXT1664(auVar105);
                in_ZMM5 = ZEXT1664(auVar106);
                in_ZMM10 = ZEXT1664(auVar242);
                in_ZMM13 = ZEXT1664(auVar107);
                local_b18._0_4_ =
                     ExhaustiveLightSampler::PDF
                               (pEVar94,(LightSampleContext *)local_a48,(LightHandle *)local_9c8);
                local_b18._4_4_ = extraout_XMM0_Db_01;
                local_b18._8_4_ = extraout_XMM0_Dc_01;
                local_b18._12_4_ = extraout_XMM0_Dd_01;
              }
              aIStack_9b8[2].low = (float)uStack_a28;
              aIStack_9b8[2].high = uStack_a28._4_4_;
              aIStack_9b8[3].low = fStack_a20;
              aIStack_9b8[3].high = fStack_a1c;
              local_9c8._0_4_ = local_a48;
              local_9c8._4_4_ = fStack_a44;
              IStack_9c0.low = IStack_a40.low;
              IStack_9c0.high = IStack_a40.high;
              aIStack_9b8[0].low = IStack_a38.low;
              aIStack_9b8[0].high = IStack_a38.high;
              aIStack_9b8[1].low = SUB84(pSStack_a30,0);
              aIStack_9b8[1].high = (float)((ulong)pSStack_a30 >> 0x20);
              pVVar4 = &(ray->super_Ray).d;
              local_538._0_4_ = (pVVar4->super_Tuple3<pbrt::Vector3,_float>).x;
              local_538._4_4_ = (pVVar4->super_Tuple3<pbrt::Vector3,_float>).y;
              local_538._8_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
              local_618.eta = 0.0;
              local_7a8.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = (Interval<float>)local_9c8;
              local_7a8.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = (Interval<float>)local_538;
              local_7a8.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = (Interval<float>)&local_618;
              uVar85 = (pLVar101->
                       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                       ).bits;
              uVar89 = (uint)(ushort)(uVar85 >> 0x30);
              auVar105 = in_ZMM4._0_16_;
              auVar106 = in_ZMM5._0_16_;
              auVar242 = in_ZMM10._0_16_;
              auVar107 = in_ZMM13._0_16_;
              if (uVar85 < 0x5000000000000) {
                fVar197 = 0.0;
                if (0x2ffffffffffff < uVar85) {
                  if (uVar89 == 3) {
                    LVar59.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = fStack_a44;
                    LVar59.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)local_a48;
                    LVar59.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = IStack_a40.high;
                    LVar59.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = IStack_a40.low;
                    LVar59.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = IStack_a38.high;
                    LVar59.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = IStack_a38.low;
                    auVar64._4_4_ = IStack_a38.high;
                    auVar64._0_4_ = IStack_a38.low;
                    auVar64._8_8_ = pSStack_a30;
                    auVar64._16_4_ = (float)uStack_a28;
                    auVar64._20_4_ = uStack_a28._4_4_;
                    auVar64._24_4_ = fStack_a20;
                    auVar64._28_4_ = fStack_a1c;
                    in_ZMM4 = ZEXT1664(auVar105);
                    in_ZMM5 = ZEXT1664(auVar106);
                    in_ZMM10 = ZEXT1664(auVar242);
                    in_ZMM13 = ZEXT1664(auVar107);
                    LVar59.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = pSStack_a30;
                    auVar277 = SUB1612(auVar64._16_16_,4);
                    LVar59.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar64._16_16_,0)
                    ;
                    LVar59.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar277._0_4_;
                    LVar59.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar277._4_4_;
                    LVar59.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar277._8_4_;
                    fVar197 = ProjectionLight::PDF_Li
                                        ((ProjectionLight *)(uVar85 & 0xffffffffffff),LVar59,
                                         (Vector3f)pVVar4->super_Tuple3<pbrt::Vector3,_float>,
                                         WithMIS);
                  }
                  else {
                    LVar60.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = fStack_a44;
                    LVar60.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)local_a48;
                    LVar60.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = IStack_a40.high;
                    LVar60.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = IStack_a40.low;
                    LVar60.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = IStack_a38.high;
                    LVar60.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = IStack_a38.low;
                    auVar65._4_4_ = IStack_a38.high;
                    auVar65._0_4_ = IStack_a38.low;
                    auVar65._8_8_ = pSStack_a30;
                    auVar65._16_4_ = (float)uStack_a28;
                    auVar65._20_4_ = uStack_a28._4_4_;
                    auVar65._24_4_ = fStack_a20;
                    auVar65._28_4_ = fStack_a1c;
                    in_ZMM4 = ZEXT1664(auVar105);
                    in_ZMM5 = ZEXT1664(auVar106);
                    in_ZMM10 = ZEXT1664(auVar242);
                    in_ZMM13 = ZEXT1664(auVar107);
                    LVar60.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = pSStack_a30;
                    auVar277 = SUB1612(auVar65._16_16_,4);
                    LVar60.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar65._16_16_,0)
                    ;
                    LVar60.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar277._0_4_;
                    LVar60.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar277._4_4_;
                    LVar60.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar277._8_4_;
                    fVar197 = GoniometricLight::PDF_Li
                                        ((GoniometricLight *)(uVar85 & 0xffffffffffff),LVar60,
                                         (Vector3f)pVVar4->super_Tuple3<pbrt::Vector3,_float>,
                                         WithMIS);
                  }
                }
              }
              else {
                local_598._0_8_ = uVar85;
                in_ZMM4 = ZEXT1664(auVar105);
                in_ZMM5 = ZEXT1664(auVar106);
                in_ZMM10 = ZEXT1664(auVar242);
                in_ZMM13 = ZEXT1664(auVar107);
                fVar197 = detail::DispatchSplit<5>::operator()
                                    ((DispatchSplit<5> *)&local_868,local_598,uVar89 - 4);
              }
              fVar197 = fVar197 * (float)local_b18._0_4_;
              local_878.values.values[0] = fVar197 * local_878.values.values[0];
              local_878.values.values[1] = fVar197 * local_878.values.values[1];
              local_878.values.values[2] = fVar197 * local_878.values.values[2];
              local_878.values.values[3] = fVar197 * local_878.values.values[3];
              auVar142._0_4_ = (float)local_728._0_4_ * local_a88.values.values[0];
              auVar142._4_4_ = (float)local_728._4_4_ * local_a88.values.values[1];
              auVar142._8_4_ = (float)local_728._8_4_ * local_a88.values.values[2];
              auVar142._12_4_ = (float)local_728._12_4_ * local_a88.values.values[3];
              fVar197 = local_878.values.values[0] + local_aa8.values.values[0];
              local_9c8._0_4_ = fVar197;
              local_9c8._4_4_ = local_878.values.values[1] + local_aa8.values.values[1];
              IStack_9c0.low = local_878.values.values[2] + local_aa8.values.values[2];
              IStack_9c0.high = local_878.values.values[3] + local_aa8.values.values[3];
              lVar90 = 1;
              do {
                fVar197 = fVar197 + *(float *)(local_9c8 + lVar90 * 4);
                lVar90 = lVar90 + 1;
              } while (lVar90 != 4);
              fVar197 = fVar197 * 0.25;
              auVar208._0_4_ = fVar197 * (lambda->pdf).values[0];
              auVar208._4_4_ = fVar197 * (lambda->pdf).values[1];
              auVar208._8_4_ = fVar197 * (lambda->pdf).values[2];
              auVar208._12_4_ = fVar197 * (lambda->pdf).values[3];
              uVar85 = vcmpps_avx512vl(auVar208,_DAT_005c8010,4);
              auVar105 = vdivps_avx512vl(auVar142,auVar208);
              fVar197 = (float)((uint)((byte)uVar85 & 1) * auVar105._0_4_);
              fVar250 = (float)((uint)((byte)(uVar85 >> 1) & 1) * auVar105._4_4_);
              in_ZmmResult._4_4_ = fVar250;
              in_ZmmResult._0_4_ = (int)fVar197;
              fVar239 = (float)((uint)((byte)(uVar85 >> 2) & 1) * auVar105._8_4_);
              in_ZmmResult._8_4_ = fVar239;
              fVar249 = (float)((uint)((byte)(uVar85 >> 3) & 1) * auVar105._12_4_);
              in_ZmmResult._12_4_ = fVar249;
              fStack_a54 = fVar250 + fStack_a54;
              local_a60._8_4_ = fVar197 + (float)local_a60._8_4_;
              fStack_a50 = fVar239 + fStack_a50;
              fStack_a4c = fVar249 + fStack_a4c;
            }
          }
          else {
            uVar85 = 0;
            while (uVar88 = uVar85, uVar88 != 3) {
              if ((*(float *)(local_728 + uVar88 * 4 + 4) != 0.0) ||
                 (uVar85 = uVar88 + 1, NAN(*(float *)(local_728 + uVar88 * 4 + 4)))) break;
            }
            if (uVar88 < 3) goto LAB_0041670f;
          }
        }
      }
      else {
        uVar8._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        uVar8._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar139._0_8_ = uVar8 ^ 0x8000000080000000;
        auVar139._8_4_ = 0x80000000;
        auVar139._12_4_ = 0x80000000;
        auVar206._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar206._4_4_ = 0x80000000;
        auVar206._8_4_ = 0x80000000;
        auVar206._12_4_ = 0x80000000;
        uVar195 = vmovlps_avx(auVar139);
        local_9c8._0_4_ = (undefined4)uVar195;
        local_9c8._4_4_ = (undefined4)((ulong)uVar195 >> 0x20);
        auVar238 = ZEXT856(auVar139._8_8_);
        auVar196 = ZEXT856(auVar206._8_8_);
        auVar106 = in_ZMM4._0_16_;
        auVar242 = in_ZMM5._0_16_;
        auVar107 = in_ZMM10._0_16_;
        auVar111 = in_ZMM13._0_16_;
        IStack_9c0.low = auVar206._0_4_;
        SVar278 = SurfaceInteraction::Le
                            ((SurfaceInteraction *)&local_428.__align,(Vector3f *)local_9c8,lambda);
        auVar185 = local_428._192_64_;
        auVar127._16_48_ = in_ZmmResult._16_48_;
        auVar232._0_8_ = SVar278.values.values._8_8_;
        auVar232._8_56_ = auVar196;
        auVar164._0_8_ = SVar278.values.values._0_8_;
        auVar164._8_56_ = auVar238;
        _local_7c8 = vmovlhps_avx(auVar164._0_16_,auVar232._0_16_);
        auVar105 = _local_7c8;
        if (((float)local_7c8 != 0.0) || (NAN((float)local_7c8))) {
LAB_004165f1:
          if ((local_afc == 0) || (local_b1c == true)) {
            auVar140._0_4_ = (float)local_7c8 * local_a88.values.values[0];
            auVar140._4_4_ = afStack_7c4[0] * local_a88.values.values[1];
            auVar140._8_4_ = afStack_7c4[1] * local_a88.values.values[2];
            auVar140._12_4_ = afStack_7c4[2] * local_a88.values.values[3];
            lVar90 = 1;
            fVar197 = local_aa8.values.values[0];
            do {
              fVar197 = fVar197 + local_aa8.values.values[lVar90];
              lVar90 = lVar90 + 1;
              _local_7c8 = auVar105;
            } while (lVar90 != 4);
          }
          else {
            uVar195 = local_428._200_8_;
            local_a48 = (undefined1  [4])0x0;
            uStack_a28._0_4_ = 0.0;
            uStack_a28._4_4_ = 0.0;
            fStack_a20 = 0.0;
            fStack_a1c = 0.0;
            fStack_a44 = 0.0;
            IStack_a40.low = 0.0;
            IStack_a40.high = 0.0;
            pSStack_a30 = (SampledSpectrum *)0x0;
            if (local_220 == '\x01') {
              aIStack_9b8[0].low = (float)uStack_308;
              aIStack_9b8[0].high = (float)((ulong)uStack_308 >> 0x20);
              local_9c8._0_4_ = local_318._0_4_;
              local_9c8._4_4_ = local_318._4_4_;
              IStack_9c0.low = (float)uStack_310;
              IStack_9c0.high = (float)((ulong)uStack_310 >> 0x20);
              aIStack_9b8[2].low = (float)(undefined4)uStack_2e8;
              aIStack_9b8[1].low = (float)uStack_2f0;
              aIStack_9b8[1].high = (float)((ulong)uStack_2f0 >> 0x20);
              aIStack_9b8[3].high = *(float *)(local_680 + 1);
              aIStack_9b8[2].high = (float)*local_680;
              aIStack_9b8[3].low = (float)((ulong)*local_680 >> 0x20);
            }
            else {
              if (local_168.set == false) {
                IStack_a38.low = (float)uStack_a28;
                IStack_a38.high = uStack_a28._4_4_;
                _local_7c8 = auVar105;
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
              }
              aIStack_9b8[0].low = (float)local_168.optionalValue._16_8_;
              aIStack_9b8[0].high = (float)((ulong)local_168.optionalValue._16_8_ >> 0x20);
              local_9c8._0_4_ = local_168.optionalValue.__align._0_4_;
              local_9c8._4_4_ = local_168.optionalValue.__align._4_4_;
              IStack_9c0.low = (float)local_168.optionalValue._8_8_;
              IStack_9c0.high = (float)((ulong)local_168.optionalValue._8_8_ >> 0x20);
              aIStack_9b8[1].low = 0.0;
              aIStack_9b8[1].high = 0.0;
              aIStack_9b8[2].low = 0.0;
              aIStack_9b8[2].high = 0.0;
              aIStack_9b8[3].low = 0.0;
              aIStack_9b8[3].high = 0.0;
            }
            uStack_a28._0_4_ = aIStack_9b8[2].low;
            uStack_a28._4_4_ = aIStack_9b8[2].high;
            fStack_a20 = aIStack_9b8[3].low;
            fStack_a1c = aIStack_9b8[3].high;
            local_a48 = (undefined1  [4])local_9c8._0_4_;
            fStack_a44 = (float)local_9c8._4_4_;
            IStack_a40.low = IStack_9c0.low;
            IStack_a40.high = IStack_9c0.high;
            IStack_a38.low = aIStack_9b8[0].low;
            IStack_a38.high = aIStack_9b8[0].high;
            pSStack_a30 = (SampledSpectrum *)CONCAT44(aIStack_9b8[1].high,aIStack_9b8[1].low);
            uVar85 = (pVVar82->lightSampler).
                     super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                     .bits;
            pEVar94 = (ExhaustiveLightSampler *)(uVar85 & 0xffffffffffff);
            sVar57 = (short)(uVar85 >> 0x30);
            local_9c8._0_4_ = local_428._200_4_;
            local_9c8._4_4_ = local_428._204_4_;
            if (uVar85 < 0x3000000000000) {
              if (sVar57 == 2) {
                _local_7c8 = auVar105;
                local_b18._0_4_ =
                     PowerLightSampler::PDF
                               ((PowerLightSampler *)pEVar94,(LightSampleContext *)local_a48,
                                (LightHandle *)local_9c8);
                local_b18._4_4_ = extraout_XMM0_Db_02;
                local_b18._8_4_ = extraout_XMM0_Dc_02;
                local_b18._12_4_ = extraout_XMM0_Dd_02;
              }
              else {
                sVar15 = (pEVar94->lights).nStored;
                auVar271 = vcvtusi2ss_avx512f(auVar242,sVar15);
                fVar197 = 1.0 / auVar271._0_4_;
                auVar127._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar127._0_4_ = fVar197;
                auVar126._4_60_ = auVar127._4_60_;
                auVar126._0_4_ = (uint)(sVar15 != 0) * (int)fVar197;
                local_b18 = auVar126._0_16_;
                _local_7c8 = auVar105;
              }
            }
            else if (sVar57 == 3) {
              _local_7c8 = auVar105;
              local_b18._0_4_ =
                   BVHLightSampler::PDF
                             ((BVHLightSampler *)pEVar94,(LightSampleContext *)local_a48,
                              (LightHandle *)local_9c8);
              local_b18._4_4_ = extraout_XMM0_Db_03;
              local_b18._8_4_ = extraout_XMM0_Dc_03;
              local_b18._12_4_ = extraout_XMM0_Dd_03;
            }
            else {
              _local_7c8 = auVar105;
              local_b18._0_4_ =
                   ExhaustiveLightSampler::PDF
                             (pEVar94,(LightSampleContext *)local_a48,(LightHandle *)local_9c8);
              local_b18._4_4_ = extraout_XMM0_Db_04;
              local_b18._8_4_ = extraout_XMM0_Dc_04;
              local_b18._12_4_ = extraout_XMM0_Dd_04;
            }
            aIStack_9b8[2].low = (float)uStack_a28;
            aIStack_9b8[2].high = uStack_a28._4_4_;
            aIStack_9b8[3].low = fStack_a20;
            aIStack_9b8[3].high = fStack_a1c;
            local_9c8._0_4_ = local_a48;
            local_9c8._4_4_ = fStack_a44;
            IStack_9c0.low = IStack_a40.low;
            IStack_9c0.high = IStack_a40.high;
            aIStack_9b8[0].low = IStack_a38.low;
            aIStack_9b8[0].high = IStack_a38.high;
            aIStack_9b8[1].low = SUB84(pSStack_a30,0);
            aIStack_9b8[1].high = (float)((ulong)pSStack_a30 >> 0x20);
            pVVar4 = &(ray->super_Ray).d;
            uVar6 = (pVVar4->super_Tuple3<pbrt::Vector3,_float>).x;
            uVar10 = (pVVar4->super_Tuple3<pbrt::Vector3,_float>).y;
            local_728._0_4_ = uVar6;
            local_728._4_4_ = uVar10;
            local_728._8_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar76._60_4_ = 0;
            auVar76._0_60_ = stack0xfffffffffffffa6c;
            _local_598 = auVar76 << 0x20;
            local_7a8.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = (Interval<float>)local_9c8;
            local_7a8.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = (Interval<float>)local_728;
            local_7a8.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = (Interval<float>)local_598;
            if ((ulong)uVar195 < 0x5000000000000) {
              fVar197 = 0.0;
              if (0x2ffffffffffff < (ulong)uVar195) {
                if (auVar185._14_2_ == 3) {
                  LVar61.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = fStack_a44;
                  LVar61.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)local_a48;
                  LVar61.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = IStack_a40.high;
                  LVar61.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = IStack_a40.low;
                  LVar61.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = IStack_a38.high;
                  LVar61.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = IStack_a38.low;
                  auVar66._4_4_ = IStack_a38.high;
                  auVar66._0_4_ = IStack_a38.low;
                  auVar66._8_8_ = pSStack_a30;
                  auVar66._16_4_ = (float)uStack_a28;
                  auVar66._20_4_ = uStack_a28._4_4_;
                  auVar66._24_4_ = fStack_a20;
                  auVar66._28_4_ = fStack_a1c;
                  LVar61.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = pSStack_a30;
                  auVar277 = SUB1612(auVar66._16_16_,4);
                  LVar61.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar66._16_16_,0);
                  LVar61.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar277._0_4_;
                  LVar61.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar277._4_4_;
                  LVar61.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar277._8_4_;
                  fVar197 = ProjectionLight::PDF_Li
                                      ((ProjectionLight *)(uVar195 & 0xffffffffffff),LVar61,
                                       (Vector3f)pVVar4->super_Tuple3<pbrt::Vector3,_float>,WithMIS)
                  ;
                }
                else {
                  LVar62.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = fStack_a44;
                  LVar62.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)local_a48;
                  LVar62.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = IStack_a40.high;
                  LVar62.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = IStack_a40.low;
                  LVar62.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = IStack_a38.high;
                  LVar62.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = IStack_a38.low;
                  auVar67._4_4_ = IStack_a38.high;
                  auVar67._0_4_ = IStack_a38.low;
                  auVar67._8_8_ = pSStack_a30;
                  auVar67._16_4_ = (float)uStack_a28;
                  auVar67._20_4_ = uStack_a28._4_4_;
                  auVar67._24_4_ = fStack_a20;
                  auVar67._28_4_ = fStack_a1c;
                  LVar62.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = pSStack_a30;
                  auVar277 = SUB1612(auVar67._16_16_,4);
                  LVar62.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar67._16_16_,0);
                  LVar62.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar277._0_4_;
                  LVar62.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar277._4_4_;
                  LVar62.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar277._8_4_;
                  fVar197 = GoniometricLight::PDF_Li
                                      ((GoniometricLight *)(uVar195 & 0xffffffffffff),LVar62,
                                       (Vector3f)pVVar4->super_Tuple3<pbrt::Vector3,_float>,WithMIS)
                  ;
                }
              }
            }
            else {
              local_538._0_8_ = uVar195;
              fVar197 = detail::DispatchSplit<5>::operator()
                                  ((DispatchSplit<5> *)&local_618,local_538,auVar185._14_2_ - 4);
            }
            fVar197 = fVar197 * (float)local_b18._0_4_;
            local_878.values.values[0] = fVar197 * local_878.values.values[0];
            local_878.values.values[1] = fVar197 * local_878.values.values[1];
            local_878.values.values[2] = fVar197 * local_878.values.values[2];
            local_878.values.values[3] = fVar197 * local_878.values.values[3];
            auVar140._0_4_ = (float)local_7c8 * local_a88.values.values[0];
            auVar140._4_4_ = afStack_7c4[0] * local_a88.values.values[1];
            auVar140._8_4_ = afStack_7c4[1] * local_a88.values.values[2];
            auVar140._12_4_ = afStack_7c4[2] * local_a88.values.values[3];
            fVar197 = local_878.values.values[0] + local_aa8.values.values[0];
            local_9c8._0_4_ = fVar197;
            local_9c8._4_4_ = local_878.values.values[1] + local_aa8.values.values[1];
            IStack_9c0.low = local_878.values.values[2] + local_aa8.values.values[2];
            IStack_9c0.high = local_878.values.values[3] + local_aa8.values.values[3];
            lVar90 = 1;
            do {
              fVar197 = fVar197 + *(float *)(local_9c8 + lVar90 * 4);
              lVar90 = lVar90 + 1;
            } while (lVar90 != 4);
          }
          fVar197 = fVar197 * 0.25;
          auVar210._0_4_ = fVar197 * (lambda->pdf).values[0];
          auVar210._4_4_ = fVar197 * (lambda->pdf).values[1];
          auVar210._8_4_ = fVar197 * (lambda->pdf).values[2];
          auVar210._12_4_ = fVar197 * (lambda->pdf).values[3];
          uVar85 = vcmpps_avx512vl(auVar210,_DAT_005c8010,4);
          auVar105 = vdivps_avx512vl(auVar140,auVar210);
          fVar197 = (float)((uint)((byte)uVar85 & 1) * auVar105._0_4_);
          fVar250 = (float)((uint)((byte)(uVar85 >> 1) & 1) * auVar105._4_4_);
          in_ZmmResult._4_4_ = fVar250;
          in_ZmmResult._0_4_ = (int)fVar197;
          fVar239 = (float)((uint)((byte)(uVar85 >> 2) & 1) * auVar105._8_4_);
          in_ZmmResult._8_4_ = fVar239;
          fVar249 = (float)((uint)((byte)(uVar85 >> 3) & 1) * auVar105._12_4_);
          in_ZmmResult._12_4_ = fVar249;
          in_ZmmResult._16_48_ = auVar127._16_48_;
          fStack_a54 = fVar250 + fStack_a54;
          local_a60._8_4_ = fVar197 + (float)local_a60._8_4_;
          fStack_a50 = fVar239 + fStack_a50;
          fStack_a4c = fVar249 + fStack_a4c;
          auVar105 = _local_7c8;
        }
        else {
          uVar85 = 0;
          while (uVar88 = uVar85, uVar88 != 3) {
            if ((*(float *)(local_7c8 + uVar88 * 4 + 4) != 0.0) ||
               (uVar85 = uVar88 + 1, NAN(*(float *)(local_7c8 + uVar88 * 4 + 4)))) break;
          }
          if (uVar88 < 3) goto LAB_004165f1;
        }
        _local_7c8 = auVar105;
        local_650.bits =
             (pVVar82->super_RayIntegrator).super_ImageTileIntegrator.camera.
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits;
        local_658 = *(Tuple2<pbrt::Point2,_float> *)sampler;
        in_ZMM4 = ZEXT1664(auVar106);
        in_ZMM5 = ZEXT1664(auVar242);
        in_ZMM10 = ZEXT1664(auVar107);
        in_ZMM13 = ZEXT1664(auVar111);
        SurfaceInteraction::GetBSDF
                  (&local_618,(SurfaceInteraction *)&local_428.__align,ray,lambda,
                   (CameraHandle *)&local_650,local_738,(SamplerHandle *)&local_658);
        auVar107 = in_ZMM13._0_16_;
        auVar242 = in_ZMM10._0_16_;
        auVar106 = in_ZMM5._0_16_;
        auVar105 = in_ZMM4._0_16_;
        if ((uint6)local_618.bxdf.
                   super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                   .bits == 0) {
          if ((byte)local_328 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
          }
          uVar97 = 0;
          SurfaceInteraction::SkipIntersection
                    ((SurfaceInteraction *)&local_428.__align,ray,(Float)local_428._248_4_);
        }
        else {
          local_318 = local_428.__align;
          uStack_310 = local_428._8_8_;
          uStack_308 = local_428._16_8_;
          uStack_300 = local_428._24_8_;
          uStack_2f8 = local_428._32_8_;
          uStack_2f0 = local_428._40_8_;
          uStack_2e8 = local_428._48_8_;
          uStack_2e0 = local_428._56_8_;
          local_2d8 = local_428._64_8_;
          uStack_2d0 = local_428._72_8_;
          auVar238._48_4_ = local_428._128_4_;
          auVar238._0_48_ = local_428._80_48_;
          auVar238._52_4_ = local_428._132_4_;
          in_ZmmResult._56_4_ = local_428._136_4_;
          in_ZmmResult._0_56_ = auVar238;
          in_ZmmResult._60_4_ = local_428._140_4_;
          auVar71._4_4_ = local_428._132_4_;
          auVar71._0_4_ = local_428._128_4_;
          auVar71._8_4_ = local_428._136_4_;
          auVar71._12_4_ = local_428._140_4_;
          uVar85 = auVar71._8_8_;
          uStack_288 = local_428._144_8_;
          uStack_280 = local_428._152_8_;
          afStack_278 = local_428._160_8_;
          afStack_270 = local_428._168_8_;
          uStack_268 = local_428._176_8_;
          uStack_260 = local_428._184_8_;
          auStack_2c8 = local_428._80_48_;
          local_298 = auVar238._48_8_;
          uStack_290 = in_ZmmResult._56_8_;
          local_258 = local_428._192_8_;
          uStack_250 = local_428._200_8_;
          local_688[4] = *(undefined8 *)(local_540 + 0x20);
          uVar88 = *(ulong *)(local_540 + 8);
          uVar195 = *(undefined8 *)(local_540 + 0x10);
          uVar58 = *(undefined8 *)(local_540 + 0x18);
          *local_688 = *(undefined8 *)local_540;
          local_688[1] = uVar88;
          local_688[2] = uVar195;
          local_688[3] = uVar58;
          local_220 = '\x01';
          if (local_168.set == true) {
            local_168.set = false;
          }
          iVar104 = local_afc + 1;
          uVar97 = 1;
          bVar102 = local_afc < local_ad0->maxDepth;
          local_afc = iVar104;
          if (bVar102) {
            if ((local_ad0->regularize == true) && (local_b1b == true)) {
              *(long *)(in_FS_OFFSET + -0x370) = *(long *)(in_FS_OFFSET + -0x370) + 1;
              BSDF::Regularize(&local_618);
            }
            *(long *)(in_FS_OFFSET + -0x368) = *(long *)(in_FS_OFFSET + -0x368) + 1;
            if ((uint)(CONCAT26(local_618.bxdf.
                                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                .bits._6_2_,
                                (uint6)local_618.bxdf.
                                       super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                       .bits) >> 0x31) < 3) {
              if (CONCAT26(local_618.bxdf.
                           super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                           .bits._6_2_,
                           (uint6)local_618.bxdf.
                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                  .bits) < 0x3000000000000) {
                this_00 = (DiffuseBxDF *)
                          (ulong)(uint6)local_618.bxdf.
                                        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                        .bits;
                if (local_618.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits._6_2_ == 2) {
                  BVar84 = DiffuseBxDF::Flags(this_00);
                }
                else {
                  fVar197 = (this_00->R).values.values[0];
                  uVar88 = 0;
                  BVar84 = DiffuseReflection;
                  if ((fVar197 == 0.0) && (!NAN(fVar197))) {
                    uVar86 = 0xffffffffffffffff;
                    while (uVar86 != 2) {
                      fVar197 = (this_00->R).values.values[uVar86 + 2];
                      uVar86 = uVar86 + 1;
                      if ((fVar197 != 0.0) || (NAN(fVar197))) goto LAB_0041790e;
                    }
                    uVar86 = 3;
LAB_0041790e:
                    uVar88 = 0;
                    BVar84 = (uint)(uVar86 < 3) * 5;
                  }
                }
              }
              else {
                this_01 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                          (ulong)(uint6)local_618.bxdf.
                                        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                        .bits;
                if (local_618.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits._6_2_ == 4) {
                  BVar84 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                     (this_01);
                }
                else if (local_618.bxdf.
                         super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                         .bits._6_2_ == 3) {
                  BVar84 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                                     ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                       *)this_01);
                }
                else {
                  auVar111 = vminss_avx(ZEXT416((uint)(this_01->top).mfDistrib.alpha_y),
                                        ZEXT416((uint)(this_01->top).mfDistrib.alpha_x));
                  uVar88 = auVar111._8_8_;
                  uVar85 = 0;
                  BVar84 = (uint)(auVar111._0_4_ < 0.001) * 8 + (GlossyTransmission|Reflection);
                }
              }
            }
            else if (local_618.bxdf.
                     super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                     .bits._6_2_ >> 3 == 0) {
              BVar84 = Unset;
              if (local_618.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits._6_2_ == 7) {
                BVar84 = GlossyReflection;
              }
            }
            else if (local_618.bxdf.
                     super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                     .bits._6_2_ == 8) {
              BVar84 = GlossyReflection;
            }
            else if (local_618.bxdf.
                     super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                     .bits._6_2_ == 9) {
              auVar111 = vminss_avx(ZEXT416(((uint *)(ulong)(uint6)local_618.bxdf.
                                                                                                                                      
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                                  .bits)[1]),
                                    ZEXT416(*(uint *)(ulong)(uint6)local_618.bxdf.
                                                                                                                                      
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                                  .bits));
              uVar88 = auVar111._8_8_;
              uVar85 = 0;
              BVar84 = (uint)(auVar111._0_4_ < 0.001) * 8 + GlossyReflection;
            }
            else {
              BVar84 = DiffuseReflection;
            }
            if ((BVar84 & (Glossy|Diffuse)) != Unset) {
              local_660 = *(Tuple2<pbrt::Point2,_float> *)sampler;
              auVar238 = ZEXT856(uVar88);
              auVar196 = ZEXT856(uVar85);
              SVar278 = SampleLd(local_ad0,(Interaction *)&local_428.__align,&local_618,lambda,
                                 (SamplerHandle *)&local_660,&local_a88,&local_aa8);
              auVar236._0_8_ = SVar278.values.values._8_8_;
              auVar236._8_56_ = auVar196;
              auVar168._0_8_ = SVar278.values.values._0_8_;
              auVar168._8_56_ = auVar238;
              auVar271 = vmovlhps_avx(auVar168._0_16_,auVar236._0_16_);
              auVar111 = *(undefined1 (*) [16])(lambda->pdf).values;
              uVar85 = vcmpps_avx512vl(auVar111,_DAT_005c8010,4);
              auVar111 = vdivps_avx512vl(auVar271,auVar111);
              fVar249 = (float)((uint)((byte)uVar85 & 1) * auVar111._0_4_);
              fVar239 = (float)((uint)((byte)(uVar85 >> 1) & 1) * auVar111._4_4_);
              in_ZmmResult._4_4_ = fVar239;
              in_ZmmResult._0_4_ = (int)fVar249;
              fVar250 = (float)((uint)((byte)(uVar85 >> 2) & 1) * auVar111._8_4_);
              in_ZmmResult._8_4_ = fVar250;
              fVar197 = (float)((uint)((byte)(uVar85 >> 3) & 1) * auVar111._12_4_);
              in_ZmmResult._12_4_ = fVar197;
              fStack_a54 = fVar239 + fStack_a54;
              local_a60._8_4_ = fVar249 + (float)local_a60._8_4_;
              fStack_a50 = fVar250 + fStack_a50;
              fStack_a4c = fVar197 + fStack_a4c;
            }
            uVar7 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
            uVar11 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
            local_b18._4_4_ = uVar11;
            local_b18._0_4_ = uVar7;
            local_b18._8_8_ = 0;
            local_ae8 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
            TVar12 = *(Tuple2<pbrt::Point2,_float> *)sampler;
            local_9c8._0_4_ = TVar12.x;
            local_9c8._4_4_ = TVar12.y;
            in_ZMM4 = ZEXT1664(auVar105);
            in_ZMM5 = ZEXT1664(auVar106);
            in_ZMM10 = ZEXT1664(auVar242);
            in_ZMM13 = ZEXT1664(auVar107);
            FVar129 = detail::DispatchSplit<8>::operator()
                                ((DispatchSplit<8> *)local_a48,local_9c8,(ulong)TVar12 >> 0x30);
            local_af8._0_4_ = FVar129;
            TVar12 = *(Tuple2<pbrt::Point2,_float> *)sampler;
            sVar57 = TVar12.y._2_2_;
            if ((ulong)TVar12 < 0x5000000000000) {
              pHVar95 = (HaltonSampler *)((ulong)TVar12 & 0xffffffffffff);
              if ((ulong)TVar12 < 0x3000000000000) {
                if (sVar57 == 2) {
                  auVar169._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar95);
                  auVar169._8_56_ = extraout_var_14;
                  auVar105 = auVar169._0_16_;
                }
                else {
                  auVar173._0_8_ = HaltonSampler::Get2D(pHVar95);
                  auVar173._8_56_ = extraout_var_18;
                  auVar105 = auVar173._0_16_;
                }
              }
              else if (sVar57 == 3) {
                auVar171._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar95);
                auVar171._8_56_ = extraout_var_16;
                auVar105 = auVar171._0_16_;
              }
              else {
                auVar175._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar95);
                auVar175._8_56_ = extraout_var_20;
                auVar105 = auVar175._0_16_;
              }
            }
            else {
              pDVar100 = (DebugMLTSampler *)((ulong)TVar12 & 0xffffffffffff);
              if ((ulong)TVar12 < 0x7000000000000) {
                if (sVar57 == 6) {
                  auVar170._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar100);
                  auVar170._8_56_ = extraout_var_15;
                  auVar105 = auVar170._0_16_;
                }
                else {
                  auVar174._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar100);
                  auVar174._8_56_ = extraout_var_19;
                  auVar105 = auVar174._0_16_;
                }
              }
              else if (sVar57 == 7) {
                auVar172._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar100);
                auVar172._8_56_ = extraout_var_17;
                auVar105 = auVar172._0_16_;
              }
              else {
                local_ac8._0_4_ = DebugMLTSampler::Get1D(pDVar100);
                local_ac8._4_4_ = extraout_XMM0_Db_05;
                local_ac8._8_4_ = extraout_XMM0_Dc_05;
                local_ac8._12_4_ = extraout_XMM0_Dd_05;
                auVar176._0_4_ = DebugMLTSampler::Get1D(pDVar100);
                auVar176._4_60_ = extraout_var_02;
                auVar105 = vinsertps_avx(local_ac8,auVar176._0_16_,0x10);
              }
            }
            auVar246._0_8_ = local_b18._0_8_ ^ 0x8000000080000000;
            auVar246._8_4_ = local_b18._8_4_ ^ 0x80000000;
            auVar246._12_4_ = local_b18._12_4_ ^ 0x80000000;
            woRender.super_Tuple3<pbrt::Vector3,_float>.z = -local_ae8._0_4_;
            auVar211._0_8_ = local_ae8._0_8_ ^ 0x8000000080000000;
            auVar211._8_4_ = local_ae8._8_4_ ^ 0x80000000;
            auVar211._12_4_ = local_ae8._12_4_ ^ 0x80000000;
            uVar195 = vmovlps_avx(auVar105);
            local_9c8._0_4_ = (undefined4)uVar195;
            local_9c8._4_4_ = (undefined4)((ulong)uVar195 >> 0x20);
            woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar246._0_8_;
            woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar246._0_8_ >> 0x20);
            local_b18 = auVar246;
            local_ae8 = auVar211;
            BSDF::Sample_f(&local_868,&local_618,woRender,(Float)local_af8._0_4_,
                           (Point2f *)local_9c8,Radiance,All);
            auVar105 = local_b18;
            auVar242 = in_ZMM13._0_16_;
            auVar106 = in_ZMM10._0_16_;
            uVar97 = 3;
            if (0.0 < local_868.pdf) {
              auVar258 = ZEXT416((uint)local_428._136_4_);
              fVar197 = (float)local_428._136_4_ * local_868.wi.super_Tuple3<pbrt::Vector3,_float>.z
              ;
              auVar271 = ZEXT416((uint)fVar197);
              auVar107 = vfmadd132ss_fma(ZEXT416((uint)local_428._132_4_),ZEXT416((uint)fVar197),
                                         ZEXT416((uint)local_868.wi.
                                                       super_Tuple3<pbrt::Vector3,_float>.y));
              auVar111 = vfmsub213ss_fma(ZEXT416((uint)local_868.wi.
                                                       super_Tuple3<pbrt::Vector3,_float>.z),
                                         ZEXT416((uint)local_428._136_4_),ZEXT416((uint)fVar197));
              auVar107 = vfmadd231ss_fma(ZEXT416((uint)(auVar107._0_4_ + auVar111._0_4_)),
                                         ZEXT416((uint)local_428._128_4_),
                                         ZEXT416((uint)local_868.wi.
                                                       super_Tuple3<pbrt::Vector3,_float>.x));
              uVar240 = auVar107._0_4_;
              auVar212._4_4_ = uVar240;
              auVar212._0_4_ = uVar240;
              auVar212._8_4_ = uVar240;
              auVar212._12_4_ = uVar240;
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar107 = vandps_avx512vl(auVar212,auVar26);
              local_a88.values.values[0] =
                   auVar107._0_4_ * local_868.f.values.values[0] * local_a88.values.values[0];
              local_a88.values.values[1] =
                   auVar107._4_4_ * local_868.f.values.values[1] * local_a88.values.values[1];
              local_a88.values.values[2] =
                   auVar107._8_4_ * local_868.f.values.values[2] * local_a88.values.values[2];
              local_a88.values.values[3] =
                   auVar107._12_4_ * local_868.f.values.values[3] * local_a88.values.values[3];
              local_878.values.values = local_aa8.values.values;
              if (local_618.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits._6_2_ - 3 < 2) {
                wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
                     local_868.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                wiRender.super_Tuple3<pbrt::Vector3,_float>.x =
                     local_868.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                wiRender.super_Tuple3<pbrt::Vector3,_float>.z =
                     local_868.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_ae8._0_4_;
                woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_b18._0_4_;
                woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_b18._4_4_;
                auVar258 = ZEXT416((uint)local_868.wi.super_Tuple3<pbrt::Vector3,_float>.z);
                auVar271 = ZEXT416((uint)fVar197);
                local_b18 = auVar105;
                FVar129 = BSDF::PDF(&local_618,woRender_00,wiRender,Radiance,All);
                fVar197 = FVar129 / local_868.pdf;
                local_a88.values.values[0] = fVar197 * local_a88.values.values[0];
                local_a88.values.values[1] = fVar197 * local_a88.values.values[1];
                local_a88.values.values[2] = fVar197 * local_a88.values.values[2];
                local_a88.values.values[3] = fVar197 * local_a88.values.values[3];
                local_aa8.values.values[0] = FVar129 * local_aa8.values.values[0];
                local_aa8.values.values[1] = FVar129 * local_aa8.values.values[1];
                local_aa8.values.values[2] = FVar129 * local_aa8.values.values[2];
                local_aa8.values.values[3] = FVar129 * local_aa8.values.values[3];
              }
              else {
                local_aa8.values.values[0] = local_868.pdf * local_aa8.values.values[0];
                local_aa8.values.values[1] = local_868.pdf * local_aa8.values.values[1];
                local_aa8.values.values[2] = local_868.pdf * local_aa8.values.values[2];
                local_aa8.values.values[3] = local_868.pdf * local_aa8.values.values[3];
              }
              pVVar82 = local_ad0;
              rescale(&local_a88,&local_aa8,&local_878);
              local_b1c = SUB41((local_868.flags & Specular) >> 4,0);
              local_b1b = (bool)(local_b1b | (local_868.flags & Specular) == Unset);
              bVar102 = (local_868.flags & Transmission) == Unset;
              local_b18._0_4_ = local_618.eta;
              SurfaceInteraction::SpawnRay
                        ((RayDifferential *)local_9c8,(SurfaceInteraction *)&local_428.__align,ray,
                         &local_618,&local_868.wi,local_868.flags);
              (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = IStack_9c0.high;
              (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = aIStack_9b8[0].low;
              *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                   CONCAT44(aIStack_9b8[1].low,aIStack_9b8[0].high);
              (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_9c8._0_4_;
              (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_9c8._4_4_;
              *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                   CONCAT44(IStack_9c0.high,IStack_9c0.low);
              (ray->super_Ray).medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = CONCAT44(aIStack_9b8[2].high,aIStack_9b8[2].low);
              *(ulong *)(local_690 + 0x14) = CONCAT44(aIStack_9b8[6].low,aIStack_9b8[5].high);
              (((Vector3f *)(local_690 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).x =
                   aIStack_9b8[6].high;
              (((Vector3f *)(local_690 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).y =
                   aIStack_9b8[7].low;
              *(ulong *)(local_690 + 0x24) = CONCAT44(aIStack_9b8[8].low,aIStack_9b8[7].high);
              *(ulong *)(local_690 + 0x2c) = CONCAT44(aIStack_9b8[9].low,aIStack_9b8[8].high);
              *(ulong *)local_690 = CONCAT44(aIStack_9b8[3].high,aIStack_9b8[3].low);
              *(ulong *)(local_690 + 8) = CONCAT44(aIStack_9b8[4].high,aIStack_9b8[4].low);
              (((Point3f *)(local_690 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x =
                   aIStack_9b8[5].low;
              (((Point3f *)(local_690 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y =
                   aIStack_9b8[5].high;
              *(ulong *)(local_690 + 0x18) = CONCAT44(aIStack_9b8[6].high,aIStack_9b8[6].low);
              local_668 = (undefined1  [8])
                          (pVVar82->super_RayIntegrator).super_ImageTileIntegrator.camera.
                          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                          .bits;
              auVar185 = ZEXT1664(auVar258);
              in_ZMM4 = ZEXT1664(auVar111);
              in_ZMM5 = ZEXT1664(auVar271);
              in_ZMM10 = ZEXT1664(auVar106);
              in_ZMM13 = ZEXT1664(auVar242);
              SurfaceInteraction::GetBSSRDF
                        ((SurfaceInteraction *)local_a60,(RayDifferential *)&local_428.__align,
                         (SampledWavelengths *)ray,(CameraHandle *)lambda,(ScratchBuffer *)local_668
                        );
              sampler = (SamplerHandle *)local_7e0;
              fVar197 = local_5d8._0_4_ * (float)local_b18._0_4_ * (float)local_b18._0_4_;
              auVar128._16_48_ = in_ZmmResult._16_48_;
              auVar128._0_16_ = ZEXT416((uint)fVar197);
              in_ZmmResult._4_60_ = auVar128._4_60_;
              in_ZmmResult._0_4_ =
                   (uint)bVar102 * (int)local_5d8._0_4_ + (uint)!bVar102 * (int)fVar197;
              local_5d8 = in_ZmmResult._0_16_;
              if (((CONCAT44(local_a60._4_4_,local_a60._0_4_) & 0xffffffffffff) != 0) &&
                 ((local_868.flags & Transmission) != Unset)) {
                TVar12 = *local_7e0;
                local_9c8._0_4_ = TVar12.x;
                local_9c8._4_4_ = TVar12.y;
                FVar129 = detail::DispatchSplit<8>::operator()
                                    ((DispatchSplit<8> *)local_a48,local_9c8,(ulong)TVar12 >> 0x30);
                local_b18._0_4_ = FVar129;
                TVar12 = *(Tuple2<pbrt::Point2,_float> *)sampler;
                sVar57 = TVar12.y._2_2_;
                if ((ulong)TVar12 < 0x5000000000000) {
                  pHVar95 = (HaltonSampler *)((ulong)TVar12 & 0xffffffffffff);
                  if ((ulong)TVar12 < 0x3000000000000) {
                    if (sVar57 == 2) {
                      auVar177._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar95);
                      auVar177._8_56_ = extraout_var_21;
                      auVar105 = auVar177._0_16_;
                    }
                    else {
                      auVar181._0_8_ = HaltonSampler::Get2D(pHVar95);
                      auVar181._8_56_ = extraout_var_25;
                      auVar105 = auVar181._0_16_;
                    }
                  }
                  else if (sVar57 == 3) {
                    auVar179._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar95);
                    auVar179._8_56_ = extraout_var_23;
                    auVar105 = auVar179._0_16_;
                  }
                  else {
                    auVar183._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar95);
                    auVar183._8_56_ = extraout_var_27;
                    auVar105 = auVar183._0_16_;
                  }
                }
                else {
                  pDVar100 = (DebugMLTSampler *)((ulong)TVar12 & 0xffffffffffff);
                  if ((ulong)TVar12 < 0x7000000000000) {
                    if (sVar57 == 6) {
                      auVar178._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar100);
                      auVar178._8_56_ = extraout_var_22;
                      auVar105 = auVar178._0_16_;
                    }
                    else {
                      auVar182._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar100);
                      auVar182._8_56_ = extraout_var_26;
                      auVar105 = auVar182._0_16_;
                    }
                  }
                  else if (sVar57 == 7) {
                    auVar180._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar100);
                    auVar180._8_56_ = extraout_var_24;
                    auVar105 = auVar180._0_16_;
                  }
                  else {
                    local_ae8._0_4_ = DebugMLTSampler::Get1D(pDVar100);
                    local_ae8._4_4_ = extraout_XMM0_Db_06;
                    local_ae8._8_4_ = extraout_XMM0_Dc_06;
                    local_ae8._12_4_ = extraout_XMM0_Dd_06;
                    auVar184._0_4_ = DebugMLTSampler::Get1D(pDVar100);
                    auVar184._4_60_ = extraout_var_03;
                    auVar105 = vinsertps_avx(local_ae8,auVar184._0_16_,0x10);
                  }
                }
                uVar195 = vmovlps_avx(auVar105);
                local_9c8._0_4_ = (undefined4)uVar195;
                local_9c8._4_4_ = (undefined4)((ulong)uVar195 >> 0x20);
                TabulatedBSSRDF::Sample
                          (&local_6c8,
                           (TabulatedBSSRDF *)
                           (CONCAT44(local_a60._4_4_,local_a60._0_4_) & 0xffffffffffff),
                           (Float)local_b18._0_4_,(Point2f *)local_9c8);
                uVar97 = 3;
                if (local_6c8.valid != false) {
                  TVar12 = *(Tuple2<pbrt::Point2,_float> *)sampler;
                  local_9c8._0_4_ = TVar12.x;
                  local_9c8._4_4_ = TVar12.y;
                  FVar129 = detail::DispatchSplit<8>::operator()
                                      ((DispatchSplit<8> *)local_a48,local_9c8,(ulong)TVar12 >> 0x30
                                      );
                  auVar247 = _local_598;
                  uVar85 = (ulong)((uint)FVar129 >> 0x1f ^ (uint)FVar129) * 0x7fb5d329728ea185;
                  uVar85 = (uVar85 >> 0x1b ^ uVar85) * -0x7e25210b43d22bb3;
                  uVar88 = uVar85 >> 0x21 ^ uVar85;
                  uVar85 = (uVar85 >> 0x1f ^ uVar88) * 0x7fb5d329728ea185;
                  uVar85 = (uVar85 >> 0x1b ^ uVar85) * -0x7e25210b43d22bb3;
                  uVar85 = ((uVar85 >> 0x21 ^ uVar85) + 1) * 0x5851f42d4c957f2d +
                           uVar88 * -0x4f5c17a566d501a4 + 1;
                  in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
                  auStack_768 = (undefined1  [32])0x0;
                  auVar143._4_4_ = local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                  auVar143._0_4_ = local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                  auVar143._8_4_ = local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                  auVar143._12_4_ = local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                  auVar213._4_4_ = local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.y;
                  auVar213._0_4_ = local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.y;
                  auVar213._8_4_ = local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.y;
                  auVar213._12_4_ = local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.y;
                  local_7a8.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = 0.0;
                  local_7a8.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = 0.0;
                  local_7a8.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = 0.0;
                  local_7a8.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = 0.0;
                  local_7a8.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = 0.0;
                  local_7a8.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = 0.0;
                  pSStack_790 = (SampledSpectrum *)0x0;
                  auStack_788 = (undefined1  [32])0x0;
                  local_598 = vmovlhps_avx(auVar143,auVar213);
                  auVar214._4_4_ = local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar214._0_4_ = local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar214._8_4_ = local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar214._12_4_ = local_6c8.p0.super_Tuple3<pbrt::Point3,_float>.z;
                  IVar130 = (Interval<float>)vmovlps_avx(auVar214);
                  IStack_588.low = IVar130.low;
                  IStack_588.high = IVar130.high;
                  FStack_580 = local_6c8.time;
                  uStack_55c = auVar247._60_4_;
                  auStack_57c = ZEXT1232(ZEXT812(0)) << 0x20;
                  local_558 = ZEXT816(0) << 0x20;
                  local_b18 = ZEXT816(0) << 0x20;
                  do {
                    auVar185 = ZEXT1664(auVar185._0_16_);
                    in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                    in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                    in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                    in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                    Interaction::SpawnRayTo((Ray *)local_728,(Interaction *)local_598,&local_6c8.p1)
                    ;
                    if (((((float)local_728._12_4_ != 0.0) || ((float)local_728._16_4_ != 0.0)) ||
                        ((float)local_728._20_4_ != 0.0)) || (NAN((float)local_728._20_4_))) {
                      *(long *)(in_FS_OFFSET + -0x380) = *(long *)(in_FS_OFFSET + -0x380) + 1;
                      if (((local_678->
                           super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                           ).bits & 0xffffffffffff) == 0) {
                        in_ZmmResult = ZEXT464(0) << 0x20;
                        auStack_930[5] = in_ZmmResult._0_8_;
                        auStack_930[5] = 0;
                        auStack_930[6] = 0;
                        auStack_8f8[0] = 0;
                        auStack_8f8[1] = 0;
                        auStack_8f8[2] = 0;
                        auStack_8f8[3] = 0;
                        auStack_8f8[4] = 0;
                        auStack_8f8[5] = 0;
                        uStack_948._0_4_ = in_ZmmResult._0_4_;
                        local_9c8._0_4_ = 0.0;
                        uStack_948._4_4_ = 0.0;
                        uStack_940 = 0.0;
                        uStack_93c._0_4_ = 0.0;
                        aIStack_9b8[7] = (Interval<float>)0x0;
                        stack0xfffffffffffff6c8 = 0;
                        auStack_930[0]._0_1_ = false;
                        auStack_930[0]._1_7_ = 0;
                        auStack_930[1]._0_4_ = 0.0;
                        auStack_930[1]._4_4_ = 0.0;
                        auStack_930[2]._0_4_ = 0.0;
                        auStack_930[2]._4_4_ = 0.0;
                        auStack_930[3] = 0;
                        aIStack_9b8[8].low = 0.0;
                        aIStack_9b8[8].high = 0.0;
                        aIStack_9b8[9].low = 0.0;
                        aIStack_9b8._76_8_ = (SampledSpectrum *)0x0;
                        aIStack_9b8[10].high = 0.0;
                        aIStack_9b8[0xb].low = 0.0;
                        aIStack_9b8[0xb].high = 0.0;
                        aIStack_9b8[0xc].low = 0.0;
                        aIStack_9b8[0xc].high = 0.0;
                        aIStack_9b8[1].high = 0.0;
                        aIStack_9b8[2].low = 0.0;
                        poVar81 = (optional<pbrt::MediumInteraction> *)0x0;
                        aIStack_9b8[3].low = 0.0;
                        aIStack_9b8[3].high = 0.0;
                        aIStack_9b8[4].low = 0.0;
                        aIStack_9b8[4].high = 0.0;
                        aIStack_9b8[5].low = 0.0;
                        aIStack_9b8[5].high = 0.0;
                        local_8c8 = 0;
                        local_9c8._4_4_ = uStack_948._4_4_;
                        IStack_9c0.low = (float)uStack_940;
                        IStack_9c0.high = (float)(undefined4)uStack_93c;
                        aIStack_9b8[0].low = aIStack_9b8[8].low;
                        aIStack_9b8[0].high = aIStack_9b8[8].high;
                        aIStack_9b8[1].low = aIStack_9b8[9].low;
                        aIStack_9b8[2].high = aIStack_9b8[10].high;
                        aIStack_9b8[6].low = (float)local_9c8._0_4_;
                        aIStack_9b8[6].high = (float)uStack_948._4_4_;
                        aIStack_9b8[0xd] = (Interval<float>)auStack_8f8[5];
                        uStack_948._0_4_ = local_9c8._0_4_;
                        auStack_930[4] = auStack_8f8[5];
                      }
                      else {
                        PrimitiveHandle::Intersect
                                  ((optional<pbrt::ShapeIntersection> *)local_9c8,local_678,
                                   (Ray *)local_728,1.0);
                        poVar81 = (optional<pbrt::MediumInteraction> *)aIStack_9b8._12_8_;
                      }
                      aIStack_9b8[2].low = (float)((ulong)poVar81 >> 0x20);
                      aIStack_9b8[1].high = SUB84(poVar81,0);
                      cVar103 = local_8c8._0_1_;
                      if (local_8c8._0_1_ != false) {
                        in_ZmmResult._4_4_ = local_9c8._4_4_;
                        in_ZmmResult._0_4_ = local_9c8._0_4_;
                        in_ZmmResult._8_4_ = IStack_9c0.low;
                        in_ZmmResult._12_4_ = IStack_9c0.high;
                        in_ZmmResult._16_4_ = aIStack_9b8[0].low;
                        in_ZmmResult._20_4_ = aIStack_9b8[0].high;
                        in_ZmmResult._24_4_ = aIStack_9b8[1].low;
                        in_ZmmResult._28_4_ = aIStack_9b8[1].high;
                        in_ZmmResult._32_4_ = aIStack_9b8[2].low;
                        in_ZmmResult._36_4_ = aIStack_9b8[2].high;
                        in_ZmmResult._40_4_ = aIStack_9b8[3].low;
                        in_ZmmResult._44_4_ = aIStack_9b8[3].high;
                        in_ZmmResult._48_4_ = aIStack_9b8[4].low;
                        in_ZmmResult._52_4_ = aIStack_9b8[4].high;
                        in_ZmmResult._56_4_ = aIStack_9b8[5].low;
                        in_ZmmResult._60_4_ = aIStack_9b8[5].high;
                        _local_598 = in_ZmmResult;
                        local_558._4_4_ = aIStack_9b8[6].high;
                        local_558._0_4_ = aIStack_9b8[6].low;
                        local_558._8_8_ = aIStack_9b8[7];
                        if (auStack_930[5] == local_428._192_8_) {
                          IStack_a38.low = aIStack_9b8[0].low;
                          IStack_a38.high = aIStack_9b8[0].high;
                          local_a48 = (undefined1  [4])local_9c8._0_4_;
                          fStack_a44 = (float)local_9c8._4_4_;
                          IStack_a40.low = IStack_9c0.low;
                          IStack_a40.high = IStack_9c0.high;
                          uStack_a28._0_4_ = aIStack_9b8[4].low;
                          pSStack_a30 = (SampledSpectrum *)
                                        CONCAT44(aIStack_9b8[3].high,aIStack_9b8[3].low);
                          fStack_a1c = aIStack_9b8[9].low;
                          uStack_a28._4_4_ = aIStack_9b8[8].low;
                          uStack_a28 = CONCAT44(aIStack_9b8[8].low,aIStack_9b8[4].low);
                          fStack_a20 = aIStack_9b8[8].high;
                          fStack_a10 = aIStack_9b8[10].high;
                          TStack_a18.bits._0_4_ = aIStack_9b8[9].high;
                          TStack_a18.bits._4_4_ = aIStack_9b8[10].low;
                          local_a08._4_4_ = *(float *)(local_698 + 1);
                          fStack_a0c = (float)*local_698;
                          local_a08._0_4_ = (float)((ulong)*local_698 >> 0x20);
                          local_9f8._0_4_ = *(float *)(local_6a0 + 1);
                          local_a00 = (Tuple2<pbrt::Point2,_float> *)*local_6a0;
                          local_9f0._4_4_ = *(float *)(local_6a8 + 1);
                          local_9f8._4_4_ = (float)*local_6a8;
                          local_9f0._0_4_ = (float)((ulong)*local_6a8 >> 0x20);
                          fVar197 = (float)local_b18._0_4_ + 1.0;
                          local_b18 = ZEXT416((uint)fVar197);
                          uVar97 = (uint)(uVar85 >> 0x2d) ^ (uint)(uVar85 >> 0x1b);
                          bVar87 = (byte)(uVar85 >> 0x3b);
                          auVar105 = vcvtusi2ss_avx512f(auVar185._0_16_,
                                                        uVar97 >> bVar87 | uVar97 << 0x20 - bVar87);
                          auVar105 = vminss_avx(ZEXT416((uint)(auVar105._0_4_ * 2.3283064e-10)),
                                                ZEXT416(0x3f7fffff));
                          if (auVar105._0_4_ < 1.0 / fVar197) {
                            auVar63._4_4_ = local_9c8._4_4_;
                            auVar63._0_4_ = local_9c8._0_4_;
                            auVar63._8_4_ = IStack_9c0.low;
                            auVar63._12_4_ = IStack_9c0.high;
                            auVar63._16_4_ = aIStack_9b8[0].low;
                            auVar63._20_4_ = aIStack_9b8[0].high;
                            in_ZmmResult._24_8_ = pSStack_a30;
                            in_ZmmResult._0_24_ = auVar63;
                            in_ZmmResult._32_4_ = aIStack_9b8[4].low;
                            in_ZmmResult._36_4_ = aIStack_9b8[8].low;
                            in_ZmmResult._40_4_ = aIStack_9b8[8].high;
                            in_ZmmResult._44_4_ = aIStack_9b8[9].low;
                            in_ZmmResult._48_4_ = aIStack_9b8[9].high;
                            in_ZmmResult._52_4_ = aIStack_9b8[10].low;
                            in_ZmmResult._56_4_ = aIStack_9b8[10].high;
                            in_ZmmResult._60_4_ = fStack_a0c;
                            auVar68._4_4_ = aIStack_9b8[8].low;
                            auVar68._0_4_ = aIStack_9b8[4].low;
                            auVar68._8_4_ = aIStack_9b8[8].high;
                            auVar68._12_4_ = aIStack_9b8[9].low;
                            auVar68._16_4_ = aIStack_9b8[9].high;
                            auVar68._20_4_ = aIStack_9b8[10].low;
                            auVar68._24_4_ = aIStack_9b8[10].high;
                            auVar68._28_4_ = fStack_a0c;
                            auVar68._32_4_ = (float)local_a08;
                            auVar68._36_4_ = local_a08._4_4_;
                            auVar68._40_8_ = (Tuple2<pbrt::Point2,_float> *)*local_6a0;
                            auVar68._48_4_ = (float)local_9f8;
                            auVar68._52_4_ = local_9f8._4_4_;
                            auVar68._56_4_ = (float)local_9f0;
                            auVar68._60_4_ = local_9f0._4_4_;
                            auStack_768 = auVar68._32_32_;
                            local_7a8.super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low =
                                 (float)local_9c8._0_4_;
                            local_7a8.super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
                                 (float)local_9c8._4_4_;
                            local_7a8.super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low =
                                 IStack_9c0.low;
                            local_7a8.super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
                                 IStack_9c0.high;
                            local_7a8.super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = auVar63._16_8_;
                            pSStack_790 = pSStack_a30;
                            auStack_788 = in_ZmmResult._32_32_;
                          }
                          uVar85 = uVar85 * 0x5851f42d4c957f2d + uVar88 * 2 + 1;
                        }
                      }
                      aIStack_9b8._12_8_ = poVar81;
                      if (local_8c8._0_1_ != false) {
                        local_8c8 = local_8c8 & 0xffffffffffffff00;
                      }
                    }
                    else {
                      cVar103 = '\0';
                    }
                    sampler = (SamplerHandle *)local_7e0;
                  } while (cVar103 != '\0');
                  uVar97 = 3;
                  if (0.0 < (float)local_b18._0_4_) {
                    in_ZmmResult._4_4_ =
                         local_7a8.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                    in_ZmmResult._0_4_ =
                         (int)local_7a8.super_Point3<pbrt::Interval<float>_>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                    in_ZmmResult._8_4_ =
                         local_7a8.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
                    in_ZmmResult._12_4_ =
                         local_7a8.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
                    in_ZmmResult._16_4_ =
                         local_7a8.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
                    in_ZmmResult._20_4_ =
                         local_7a8.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
                    in_ZmmResult._24_8_ = pSStack_790;
                    in_ZmmResult._32_32_ = auStack_788;
                    fStack_6e8 = auStack_768._0_4_;
                    fStack_6e4 = auStack_768._4_4_;
                    TStack_6e0._0_8_ = auStack_768._8_8_;
                    TStack_6e0.z = auStack_768._16_4_;
                    TStack_6d4._0_8_ = auStack_768._20_8_;
                    TStack_6d4.z = auStack_768._28_4_;
                    local_728._0_4_ =
                         local_7a8.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                    local_728._4_4_ =
                         local_7a8.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                    local_728._8_4_ =
                         local_7a8.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
                    local_728._12_4_ =
                         local_7a8.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
                    local_728._16_4_ =
                         local_7a8.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
                    local_728._20_4_ =
                         local_7a8.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
                    local_728._24_8_ = pSStack_790;
                    fStack_708 = auStack_788._0_4_;
                    TStack_704._0_8_ = auStack_788._4_8_;
                    TStack_704.z = auStack_788._12_4_;
                    pSStack_6f8 = auStack_788._16_8_;
                    fStack_6f0 = auStack_788._24_4_;
                    fStack_6ec = auStack_788._28_4_;
                    uVar85 = CONCAT44(local_a60._4_4_,local_a60._0_4_);
                    in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                    in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                    in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                    in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                    bxdf = (BSSRDFAdapter *)ScratchBuffer::Alloc(local_738,4,4);
                    TabulatedBSSRDF::ProbeIntersectionToSample
                              ((BSSRDFSample *)local_a48,
                               (TabulatedBSSRDF *)(uVar85 & 0xffffffffffff),
                               (SubsurfaceInteraction *)local_728,bxdf);
                    puVar83 = local_698;
                    pVVar82 = local_ad0;
                    IVar80.high = (float)local_728._12_4_;
                    IVar80.low = (float)local_728._8_4_;
                    IVar79.high = (float)local_728._4_4_;
                    IVar79.low = (float)local_728._0_4_;
                    IVar78.high = local_7a8.super_Point3<pbrt::Interval<float>_>.
                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
                    IVar78.low = local_7a8.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
                    IVar77.high = local_7a8.super_Point3<pbrt::Interval<float>_>.
                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                    IVar77.low = local_7a8.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                    auVar107 = in_ZMM13._0_16_;
                    auVar242 = in_ZMM10._0_16_;
                    auVar106 = in_ZMM5._0_16_;
                    auVar105 = in_ZMM4._0_16_;
                    bVar102 = true;
                    if (((float)local_a48 == 0.0) && (!NAN((float)local_a48))) {
                      uVar85 = 0;
                      while (uVar88 = uVar85, uVar88 != 3) {
                        if ((*(float *)(local_a48 + uVar88 * 4 + 4) != 0.0) ||
                           (uVar85 = uVar88 + 1, NAN(*(float *)(local_a48 + uVar88 * 4 + 4))))
                        break;
                      }
                      bVar102 = uVar88 < 3;
                    }
                    uVar97 = 3;
                    if ((bVar102) &&
                       ((IStack_a38.low != 0.0 ||
                        (local_7a8.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = IVar77,
                        local_7a8.super_Point3<pbrt::Interval<float>_>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IVar78,
                        local_728._0_8_ = IVar79, local_728._8_8_ = IVar80, NAN(IStack_a38.low)))))
                    {
                      auVar216._0_4_ = (float)local_b18._0_4_ * (float)local_a48;
                      auVar216._4_4_ = (float)local_b18._0_4_ * fStack_a44;
                      auVar216._8_4_ = (float)local_b18._0_4_ * IStack_a40.low;
                      auVar216._12_4_ = (float)local_b18._0_4_ * IStack_a40.high;
                      auVar145._4_4_ = IStack_a38.low;
                      auVar145._0_4_ = IStack_a38.low;
                      auVar145._8_4_ = IStack_a38.low;
                      auVar145._12_4_ = IStack_a38.low;
                      auVar111 = vdivps_avx(auVar216,auVar145);
                      local_a88.values.values[0] = auVar111._0_4_ * local_a88.values.values[0];
                      local_a88.values.values[1] = auVar111._4_4_ * local_a88.values.values[1];
                      local_a88.values.values[2] = auVar111._8_4_ * local_a88.values.values[2];
                      local_a88.values.values[3] = auVar111._12_4_ * local_a88.values.values[3];
                      uStack_948._0_4_ = 0.0;
                      aIStack_9b8[6].low = (float)(undefined4)uStack_948;
                      auStack_930[5] = 0;
                      auStack_930[6] = 0;
                      auStack_8f8[0] = 0;
                      auStack_8f8[1] = 0;
                      auStack_8f8[2] = 0;
                      auStack_8f8[3] = 0;
                      auStack_8f8[4] = 0;
                      uStack_948._4_4_ = 0.0;
                      aIStack_9b8[6].high = (float)uStack_948._4_4_;
                      uStack_940 = 0.0;
                      aIStack_9b8[7].low = (float)uStack_940;
                      uStack_93c._0_4_ = 0.0;
                      aIStack_9b8[7].high = (float)(undefined4)uStack_93c;
                      auStack_930[0]._0_1_ = false;
                      auStack_930[0]._1_7_ = 0;
                      auStack_930[1]._0_4_ = 0.0;
                      auStack_930[1]._4_4_ = 0.0;
                      auStack_930[2]._0_4_ = 0.0;
                      auStack_930[2]._4_4_ = 0.0;
                      auStack_930[3] = 0;
                      auStack_930[4] = 0;
                      aIStack_9b8[0xd] = (Interval<float>)auStack_930[4];
                      aIStack_9b8[0xb].low = 0.0;
                      aIStack_9b8[0xb].high = 0.0;
                      aIStack_9b8[0xc].low = 0.0;
                      aIStack_9b8[0xc].high = 0.0;
                      aIStack_9b8[1].low = 0.0;
                      aIStack_9b8[4].high = 0.0;
                      aIStack_9b8[5].low = 0.0;
                      aIStack_9b8[0].low = (float)local_728._16_4_;
                      aIStack_9b8[0].high = (float)local_728._20_4_;
                      local_9c8._0_4_ = local_728._0_4_;
                      local_9c8._4_4_ = local_728._4_4_;
                      IStack_9c0.low = (float)local_728._8_4_;
                      IStack_9c0.high = (float)local_728._12_4_;
                      aIStack_9b8[4].low = fStack_708;
                      aIStack_9b8[3].low = (float)local_728._24_8_;
                      aIStack_9b8[3].high = SUB84(local_728._24_8_,4);
                      aIStack_9b8[9].low = TStack_704.z;
                      aIStack_9b8[8].low = TStack_704.x;
                      aIStack_9b8[8].high = TStack_704.y;
                      aIStack_9b8[10].high = fStack_6f0;
                      aIStack_9b8._76_8_ = pSStack_6f8;
                      unique0x1001134f = auStack_930[6];
                      *(float *)(local_698 + 1) = fStack_6e4;
                      *puVar83 = CONCAT44(fStack_6e8,fStack_6ec);
                      puVar83 = local_6a0;
                      *(float *)(local_6a0 + 1) = TStack_6e0.z;
                      *puVar83 = TStack_6e0._0_8_;
                      puVar83 = local_6a8;
                      *(float *)(local_6a8 + 1) = TStack_6d4.z;
                      *puVar83 = TStack_6d4._0_8_;
                      aIStack_9b8[2].high = local_9e8._0_4_;
                      local_b1b = true;
                      if (local_ad0->regularize == true) {
                        *(long *)(in_FS_OFFSET + -0x370) = *(long *)(in_FS_OFFSET + -0x370) + 1;
                        aIStack_9b8._12_8_ = local_9f0;
                        BSDF::Regularize((BSDF *)&pSStack_a30);
                        poVar81 = (optional<pbrt::MediumInteraction> *)aIStack_9b8._12_8_;
                      }
                      else {
                        *(long *)(in_FS_OFFSET + -0x368) = *(long *)(in_FS_OFFSET + -0x368) + 1;
                        poVar81 = local_9f0;
                      }
                      auVar111 = aIStack_9b8._88_16_;
                      aIStack_9b8[2].low = (float)((ulong)poVar81 >> 0x20);
                      aIStack_9b8[1].high = SUB84(poVar81,0);
                      local_318._4_4_ = local_9c8._4_4_;
                      local_318._0_4_ = local_9c8._0_4_;
                      uStack_310 = CONCAT44(IStack_9c0.high,IStack_9c0.low);
                      uStack_308 = CONCAT44(aIStack_9b8[0].high,aIStack_9b8[0].low);
                      uStack_300 = CONCAT44(aIStack_9b8[1].high,aIStack_9b8[1].low);
                      uStack_2f8 = CONCAT44(aIStack_9b8[2].high,aIStack_9b8[2].low);
                      uStack_2f0 = CONCAT44(aIStack_9b8[3].high,aIStack_9b8[3].low);
                      uStack_2e8 = CONCAT44(aIStack_9b8[4].high,aIStack_9b8[4].low);
                      uStack_2e0 = CONCAT44(aIStack_9b8[5].high,aIStack_9b8[5].low);
                      local_2d8 = CONCAT44(aIStack_9b8[6].high,aIStack_9b8[6].low);
                      uStack_2d0 = CONCAT44(aIStack_9b8[7].high,aIStack_9b8[7].low);
                      auStack_2c8._4_4_ = aIStack_9b8[8].high;
                      auStack_2c8._0_4_ = aIStack_9b8[8].low;
                      auStack_2c8._8_4_ = aIStack_9b8[9].low;
                      auStack_2c8._12_4_ = aIStack_9b8[9].high;
                      auStack_2c8._16_4_ = aIStack_9b8[10].low;
                      auStack_2c8._20_4_ = aIStack_9b8[10].high;
                      auStack_2c8._24_4_ = aIStack_9b8[0xb].low;
                      auStack_2c8._28_4_ = aIStack_9b8[0xb].high;
                      auStack_2c8._32_4_ = aIStack_9b8[0xc].low;
                      auStack_2c8._36_4_ = aIStack_9b8[0xc].high;
                      auStack_2c8._40_4_ = aIStack_9b8[0xd].low;
                      auStack_2c8._44_4_ = aIStack_9b8[0xd].high;
                      auVar196._48_4_ = (undefined4)uStack_948;
                      auVar196._0_48_ = auStack_2c8;
                      auVar196._52_4_ = uStack_948._4_4_;
                      auVar69._56_4_ = uStack_940;
                      auVar69._0_56_ = auVar196;
                      auVar69._60_4_ = (undefined4)uStack_93c;
                      uStack_280 = CONCAT71(auStack_930[0]._1_7_,(undefined1)auStack_930[0]);
                      uStack_288 = stack0xfffffffffffff6c8;
                      afStack_278[0] = (float)auStack_930[1];
                      afStack_278[1] = auStack_930[1]._4_4_;
                      afStack_270[0] = (float)auStack_930[2];
                      afStack_270[1] = auStack_930[2]._4_4_;
                      uStack_268 = auStack_930[3];
                      uStack_260 = auStack_930[4];
                      local_298 = auVar196._48_8_;
                      uStack_290 = auVar69._56_8_;
                      in_ZmmResult._16_48_ = auVar69._16_48_;
                      local_258 = auStack_930[5];
                      uStack_250 = auStack_930[6];
                      local_688[4] = local_548[4];
                      uVar85 = local_548[1];
                      uVar195 = local_548[2];
                      uVar58 = local_548[3];
                      *local_688 = *local_548;
                      local_688[1] = uVar85;
                      local_688[2] = uVar195;
                      local_688[3] = uVar58;
                      local_220 = '\x01';
                      aIStack_9b8._88_16_ = auVar111;
                      aIStack_9b8._12_8_ = poVar81;
                      if (local_168.set == true) {
                        LogFatal<char_const(&)[28]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                                   ,0x4d8,"Check failed: %s",
                                   (char (*) [28])"!prevMediumIntr.has_value()");
                      }
                      local_670 = *(Tuple2<pbrt::Point2,_float> *)sampler;
                      auVar238 = ZEXT856(uVar85);
                      auVar196 = ZEXT856(CONCAT44((undefined4)uStack_93c,uStack_940));
                      in_ZMM4 = ZEXT1664(auVar105);
                      in_ZMM5 = ZEXT1664(auVar106);
                      in_ZMM10 = ZEXT1664(auVar242);
                      in_ZMM13 = ZEXT1664(auVar107);
                      SVar278 = SampleLd(pVVar82,(Interaction *)local_9c8,(BSDF *)&pSStack_a30,
                                         lambda,(SamplerHandle *)&local_670,&local_a88,&local_aa8);
                      auVar237._0_8_ = SVar278.values.values._8_8_;
                      auVar237._8_56_ = auVar196;
                      auVar186._0_8_ = SVar278.values.values._0_8_;
                      auVar186._8_56_ = auVar238;
                      auVar106 = vmovlhps_avx(auVar186._0_16_,auVar237._0_16_);
                      auVar105 = *(undefined1 (*) [16])(lambda->pdf).values;
                      uVar85 = vcmpps_avx512vl(auVar105,_DAT_005c8010,4);
                      auVar105 = vdivps_avx512vl(auVar106,auVar105);
                      fVar197 = (float)((uint)((byte)uVar85 & 1) * auVar105._0_4_);
                      fVar250 = (float)((uint)((byte)(uVar85 >> 1) & 1) * auVar105._4_4_);
                      in_ZmmResult._4_4_ = fVar250;
                      in_ZmmResult._0_4_ = (int)fVar197;
                      fVar239 = (float)((uint)((byte)(uVar85 >> 2) & 1) * auVar105._8_4_);
                      in_ZmmResult._8_4_ = fVar239;
                      fVar249 = (float)((uint)((byte)(uVar85 >> 3) & 1) * auVar105._12_4_);
                      in_ZmmResult._12_4_ = fVar249;
                      local_a60._8_4_ = fVar197 + (float)local_a60._8_4_;
                      fStack_a54 = fVar250 + fStack_a54;
                      fStack_a50 = fVar239 + fStack_a50;
                      fStack_a4c = fVar249 + fStack_a4c;
                      local_538._0_8_ = *sampler;
                      FVar129 = detail::DispatchSplit<8>::operator()
                                          ((DispatchSplit<8> *)&local_838,local_538,
                                           (ulong)local_538._0_8_ >> 0x30);
                      local_b18._0_4_ = FVar129;
                      local_ae8._8_8_ = 0;
                      local_ae8._0_4_ = aIStack_9b8[1].high;
                      local_ae8._4_4_ = aIStack_9b8[2].low;
                      local_af8._0_4_ = aIStack_9b8[2].high;
                      TVar12 = *(Tuple2<pbrt::Point2,_float> *)sampler;
                      sVar57 = TVar12.y._2_2_;
                      if ((ulong)TVar12 < 0x5000000000000) {
                        pHVar95 = (HaltonSampler *)((ulong)TVar12 & 0xffffffffffff);
                        if ((ulong)TVar12 < 0x3000000000000) {
                          if (sVar57 == 2) {
                            auVar187._0_8_ =
                                 PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar95);
                            auVar187._8_56_ = extraout_var_28;
                            auVar105 = auVar187._0_16_;
                          }
                          else {
                            auVar191._0_8_ = HaltonSampler::Get2D(pHVar95);
                            auVar191._8_56_ = extraout_var_32;
                            auVar105 = auVar191._0_16_;
                          }
                        }
                        else if (sVar57 == 3) {
                          auVar189._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar95);
                          auVar189._8_56_ = extraout_var_30;
                          auVar105 = auVar189._0_16_;
                        }
                        else {
                          auVar193._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar95);
                          auVar193._8_56_ = extraout_var_34;
                          auVar105 = auVar193._0_16_;
                        }
                      }
                      else {
                        pDVar100 = (DebugMLTSampler *)((ulong)TVar12 & 0xffffffffffff);
                        if ((ulong)TVar12 < 0x7000000000000) {
                          if (sVar57 == 6) {
                            auVar188._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar100)
                            ;
                            auVar188._8_56_ = extraout_var_29;
                            auVar105 = auVar188._0_16_;
                          }
                          else {
                            auVar192._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar100);
                            auVar192._8_56_ = extraout_var_33;
                            auVar105 = auVar192._0_16_;
                          }
                        }
                        else if (sVar57 == 7) {
                          auVar190._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar100);
                          auVar190._8_56_ = extraout_var_31;
                          auVar105 = auVar190._0_16_;
                        }
                        else {
                          local_ac8._0_4_ = DebugMLTSampler::Get1D(pDVar100);
                          local_ac8._4_4_ = extraout_XMM0_Db_07;
                          local_ac8._8_4_ = extraout_XMM0_Dc_07;
                          local_ac8._12_4_ = extraout_XMM0_Dd_07;
                          auVar194._0_4_ = DebugMLTSampler::Get1D(pDVar100);
                          auVar194._4_60_ = extraout_var_04;
                          auVar105 = vinsertps_avx(local_ac8,auVar194._0_16_,0x10);
                        }
                      }
                      auVar106 = local_ae8;
                      local_538._0_8_ = vmovlps_avx(auVar105);
                      woRender_01.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_af8._0_4_;
                      woRender_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_ae8._0_4_;
                      woRender_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_ae8._4_4_;
                      local_ae8 = auVar106;
                      BSDF::Sample_f(&local_838,(BSDF *)&pSStack_a30,woRender_01,
                                     (Float)local_b18._0_4_,(Point2f *)local_538,Radiance,All);
                      uVar97 = 3;
                      if (0.0 < local_838.pdf) {
                        fVar197 = (float)uStack_940 *
                                  local_838.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                        in_ZMM5 = ZEXT464((uint)fVar197);
                        auVar105 = vfmadd132ss_fma(ZEXT416((uint)uStack_948._4_4_),
                                                   ZEXT416((uint)fVar197),
                                                   ZEXT416((uint)local_838.wi.
                                                                 super_Tuple3<pbrt::Vector3,_float>.
                                                                 y));
                        auVar106 = vfmsub213ss_fma(ZEXT416((uint)local_838.wi.
                                                                 super_Tuple3<pbrt::Vector3,_float>.
                                                                 z),ZEXT416((uint)uStack_940),
                                                   ZEXT416((uint)fVar197));
                        in_ZMM4 = ZEXT1664(auVar106);
                        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(auVar105._0_4_ + auVar106._0_4_)),
                                                   ZEXT416((uint)(undefined4)uStack_948),
                                                   ZEXT416((uint)local_838.wi.
                                                                 super_Tuple3<pbrt::Vector3,_float>.
                                                                 x));
                        uVar240 = auVar105._0_4_;
                        auVar217._4_4_ = uVar240;
                        auVar217._0_4_ = uVar240;
                        auVar217._8_4_ = uVar240;
                        auVar217._12_4_ = uVar240;
                        auVar27._8_4_ = 0x7fffffff;
                        auVar27._0_8_ = 0x7fffffff7fffffff;
                        auVar27._12_4_ = 0x7fffffff;
                        in_ZmmResult._0_16_ = vandps_avx512vl(auVar217,auVar27);
                        local_a88.values.values[0] =
                             in_ZmmResult._0_4_ * local_838.f.values.values[0] *
                             local_a88.values.values[0];
                        local_a88.values.values[1] =
                             in_ZmmResult._4_4_ * local_838.f.values.values[1] *
                             local_a88.values.values[1];
                        local_a88.values.values[2] =
                             in_ZmmResult._8_4_ * local_838.f.values.values[2] *
                             local_a88.values.values[2];
                        local_a88.values.values[3] =
                             in_ZmmResult._12_4_ * local_838.f.values.values[3] *
                             local_a88.values.values[3];
                        local_878.values.values = local_aa8.values.values;
                        local_aa8.values.values[1] = local_838.pdf * local_aa8.values.values[1];
                        local_aa8.values.values[0] = local_838.pdf * local_aa8.values.values[0];
                        local_aa8.values.values[2] = local_838.pdf * local_aa8.values.values[2];
                        local_aa8.values.values[3] = local_838.pdf * local_aa8.values.values[3];
                        local_b1c = (bool)((byte)(undefined1)local_838.flags >> 4 & 1);
                        Interaction::SpawnRay
                                  ((RayDifferential *)local_538,(Interaction *)local_9c8,
                                   &local_838.wi);
                        (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
                             (float)local_538._12_4_;
                        (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
                             (float)local_538._16_4_;
                        *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                             local_538._20_8_;
                        (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x =
                             (float)local_538._0_4_;
                        (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
                             (float)local_538._4_4_;
                        *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                             CONCAT44(local_538._12_4_,local_538._8_4_);
                        (ray->super_Ray).medium.
                        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                        .bits = local_538._32_8_;
                        auVar70._4_8_ = local_538._64_8_;
                        auVar70._0_4_ = local_538._60_4_;
                        auVar70._12_20_ = local_538._72_20_;
                        *(undefined1 (*) [32])(local_690 + 0x14) = auVar70;
                        *(undefined8 *)local_690 = local_538._40_8_;
                        *(undefined8 *)(local_690 + 8) = local_538._48_8_;
                        (((Point3f *)(local_690 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x =
                             (float)local_538._56_4_;
                        (((Point3f *)(local_690 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y =
                             (float)local_538._60_4_;
                        *(undefined8 *)(local_690 + 0x18) = local_538._64_8_;
                        uVar97 = 0;
                      }
                    }
                  }
                }
                if (uVar97 != 0) goto LAB_00417ef6;
              }
              if ((local_a88.values.values[0] == 0.0) && (!NAN(local_a88.values.values[0]))) {
                uVar85 = 0;
                while (uVar88 = uVar85, uVar88 != 3) {
                  fVar197 = local_a88.values.values[uVar88 + 1];
                  if ((fVar197 != 0.0) || (uVar85 = uVar88 + 1, NAN(fVar197))) break;
                }
                uVar97 = 3;
                if (2 < uVar88) goto LAB_00417ef6;
              }
              auVar144._0_4_ = (float)local_5d8._0_4_ * local_a88.values.values[0];
              auVar144._4_4_ = (float)local_5d8._0_4_ * local_a88.values.values[1];
              auVar144._8_4_ = (float)local_5d8._0_4_ * local_a88.values.values[2];
              auVar144._12_4_ = (float)local_5d8._0_4_ * local_a88.values.values[3];
              lVar90 = 1;
              fVar197 = local_aa8.values.values[0];
              do {
                fVar197 = fVar197 + local_aa8.values.values[lVar90];
                lVar90 = lVar90 + 1;
              } while (lVar90 != 4);
              fVar197 = fVar197 * 0.25;
              auVar215._4_4_ = fVar197;
              auVar215._0_4_ = fVar197;
              auVar215._8_4_ = fVar197;
              auVar215._12_4_ = fVar197;
              auVar105 = vdivps_avx(auVar144,auVar215);
              local_9c8._0_4_ = auVar105._0_4_;
              local_9c8._4_4_ = auVar105._4_4_;
              IStack_9c0.low = auVar105._8_4_;
              IStack_9c0.high = auVar105._12_4_;
              lVar90 = 1;
              auVar247 = ZEXT464((uint)local_9c8._0_4_);
              auVar185 = ZEXT464((uint)local_9c8._0_4_);
              do {
                auVar105 = vmaxss_avx(ZEXT416(*(uint *)(local_9c8 + lVar90 * 4)),auVar185._0_16_);
                auVar185 = ZEXT1664(auVar105);
                lVar90 = lVar90 + 1;
              } while (lVar90 != 4);
              if ((auVar105._0_4_ < local_ad0->rrThreshold) && (1 < local_afc)) {
                lVar90 = 1;
                do {
                  auVar105 = vmaxss_avx(ZEXT416(*(uint *)(local_9c8 + lVar90 * 4)),auVar247._0_16_);
                  auVar247 = ZEXT1664(auVar105);
                  lVar90 = lVar90 + 1;
                } while (lVar90 != 4);
                local_b18._0_4_ = auVar105._0_4_;
                TVar12 = *(Tuple2<pbrt::Point2,_float> *)sampler;
                local_a48 = (undefined1  [4])TVar12.x;
                fStack_a44 = TVar12.y;
                in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                FVar129 = detail::DispatchSplit<8>::operator()
                                    ((DispatchSplit<8> *)&local_7a8,local_a48,(ulong)TVar12 >> 0x30)
                ;
                auVar105 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_b18._0_4_)),ZEXT416(0));
                uVar97 = 3;
                if (FVar129 < auVar105._0_4_) goto LAB_00417ef6;
                fVar197 = 1.0 - auVar105._0_4_;
                local_aa8.values.values[0] = fVar197 * local_aa8.values.values[0];
                local_aa8.values.values[1] = fVar197 * local_aa8.values.values[1];
                local_aa8.values.values[2] = fVar197 * local_aa8.values.values[2];
                local_aa8.values.values[3] = fVar197 * local_aa8.values.values[3];
                local_878.values.values[0] = fVar197 * local_878.values.values[0];
                local_878.values.values[1] = fVar197 * local_878.values.values[1];
                local_878.values.values[2] = fVar197 * local_878.values.values[2];
                local_878.values.values[3] = fVar197 * local_878.values.values[3];
              }
              uVar97 = 0;
            }
          }
        }
      }
    }
LAB_00417ef6:
    if ((byte)local_328 == '\x01') {
      local_328 = local_328 & 0xffffffffffffff00;
    }
    if ((uVar97 & 1) != 0) {
      return (array<float,_4>)(array<float,_4>)stack0xfffffffffffff5a8;
    }
  } while( true );
}

Assistant:

SampledSpectrum VolPathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                      SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                      VisibleSurface *visibleSurface) const {
    // Declare state variables for volumetric path
    // NOTE: beta means something different here...
    SampledSpectrum L(0.f), beta(1.f), pdfUni(1.f), pdfNEE(1.f);
    bool specularBounce = false, anyNonSpecularBounces = false;
    Float etaScale = 1;
    pstd::optional<SurfaceInteraction> prevSurfaceIntr;
    pstd::optional<MediumInteraction> prevMediumIntr;
    int depth = 0;

    while (true) {
        // Sample segment of volumetric scattering path
        PBRT_DBG("%s\n", StringPrintf("Path tracer depth %d, current L = %s, beta = %s\n",
                                      depth, L, beta)
                             .c_str());
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        bool scattered = false, terminated = false;
        if (ray.medium) {
            // Sample the participating medium
            Float tMax = si ? si->tHit : Infinity;
            RNG rng(Hash(sampler.Get1D()), Hash(sampler.Get1D()));
            ray.medium.SampleTmaj(
                ray, tMax, rng, lambda, [&](const MediumSample &mediumSample) {
                    // Handle medium scattering event for ray
                    if (!beta) {
                        terminated = true;
                        return false;
                    }
                    rescale(beta, pdfUni, pdfNEE);
                    if (!mediumSample.intr) {
                        // Update _beta_ and _pdfUni_ for ray that escaped the medium
                        // FIXME: review this, esp the pdf...
                        beta *= mediumSample.Tmaj;
                        pdfUni *= mediumSample.Tmaj;
                        return false;
                    }
                    ++volumeInteractions;
                    const MediumInteraction &intr = *mediumSample.intr;
                    const SampledSpectrum &sigma_a = intr.sigma_a,
                                          &sigma_s = intr.sigma_s;
                    const SampledSpectrum &Tmaj = mediumSample.Tmaj;
                    // Add emission from medium scattering event
                    if (depth < maxDepth)
                        L += SafeDiv(
                            beta * intr.Le * sigma_a,
                            (intr.sigma_maj[0] * pdfUni.Average()) * lambda.PDF());

                    // Compute medium event probabilities for interaction
                    Float pAbsorb = sigma_a[0] / intr.sigma_maj[0];
                    Float pScatter = sigma_s[0] / intr.sigma_maj[0];
                    Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                    CHECK_GE(1 - pAbsorb - pScatter, -1e-6);
                    // Sample medium scattering event type and update path
                    Float um = rng.Uniform<Float>();
                    int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, um);
                    if (mode == 0) {
                        // Handle absorption along ray path
                        // beta *= Tmaj * sigma_a;
                        // pdfUni *= Tmaj * sigma_a;
                        terminated = true;
                        return false;

                    } else if (mode == 1) {
                        // Handle scattering along ray path
                        if (depth++ >= maxDepth) {
                            terminated = true;
                            return false;
                        }
                        beta *= Tmaj * sigma_s;
                        pdfUni *= Tmaj * sigma_s;
                        // Sample direct lighting at volume scattering event
                        L += SafeDiv(
                            SampleLd(intr, nullptr, lambda, sampler, beta, pdfUni),
                            lambda.PDF());

                        // Sample indirect lighting at volume scattering event
                        PhaseFunctionSample ps =
                            intr.phase.Sample_p(-ray.d, sampler.Get2D());
                        if (!ps) {
                            terminated = true;
                            return false;
                        }
                        // Update ray path state for indirect volume scattering
                        beta *= ps.p;
                        pdfNEE = pdfUni;
                        pdfUni *= ps.pdf;
                        prevMediumIntr = intr;
                        prevSurfaceIntr.reset();
                        scattered = true;
                        ray = intr.SpawnRay(ps.wi);
                        specularBounce = false;
                        anyNonSpecularBounces = true;

                        return false;

                    } else {
                        // Handle null scattering along ray path
                        SampledSpectrum sigma_n = intr.sigma_n();
                        beta *= Tmaj * sigma_n;
                        pdfUni *= Tmaj * sigma_n;
                        pdfNEE *= Tmaj * intr.sigma_maj;
                        rescale(beta, pdfUni, pdfNEE);
                        return true;
                    }
                });
        }
        if (terminated)
            return L;
        if (scattered)
            continue;
        // Handle scattering at point on surface for volumetric path tracer
        ++surfaceInteractions;
        if (depth > 0)
            CHECK(prevSurfaceIntr.has_value() ^ prevMediumIntr.has_value());
        // Add emitted light at volume path vertex or from the environment
        if (!si) {
            // Accumulate contributions from infinite light sources
            for (const auto &light : infiniteLights) {
                SampledSpectrum Le = light.Le(ray, lambda);
                if (Le) {
                    if (depth == 0 || specularBounce)
                        L += SafeDiv(beta * Le, pdfUni.Average() * lambda.PDF());
                    else {
                        // Add infinite light contribution using both PDFs with MIS
                        LightSampleContext prevIntrContext;
                        if (prevSurfaceIntr)
                            prevIntrContext = LightSampleContext(*prevSurfaceIntr);
                        else
                            prevIntrContext = LightSampleContext(*prevMediumIntr);
                        Float lightPDF = lightSampler.PDF(prevIntrContext, light) *
                                         light.PDF_Li(prevIntrContext, ray.d,
                                                      LightSamplingMode::WithMIS);
                        pdfNEE *= lightPDF;
                        L += SafeDiv(beta * Le,
                                     (pdfUni + pdfNEE).Average() * lambda.PDF());
                    }
                }
            }

            break;
        }
        SurfaceInteraction &isect = si->intr;
        SampledSpectrum Le = isect.Le(-ray.d, lambda);
        if (Le) {
            // Add contribution of emission from intersected surface
            if (depth == 0 || specularBounce)
                L += SafeDiv(beta * Le, pdfUni.Average() * lambda.PDF());
            else {
                // Add surface light contribution using both PDFs with MIS
                LightHandle areaLight(isect.areaLight);
                LightSampleContext prevIntrContext;
                if (prevSurfaceIntr)
                    prevIntrContext = LightSampleContext(*prevSurfaceIntr);
                else
                    prevIntrContext = LightSampleContext(*prevMediumIntr);
                Float lightPDF =
                    lightSampler.PDF(prevIntrContext, areaLight) *
                    areaLight.PDF_Li(prevIntrContext, ray.d, LightSamplingMode::WithMIS);
                pdfNEE *= lightPDF;
                L += SafeDiv(beta * Le, (pdfUni + pdfNEE).Average() * lambda.PDF());
            }
        }

        // Compute scattering functions and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        prevSurfaceIntr = isect;
        prevMediumIntr.reset();
        // Terminate path if maximum depth reached
        if (depth++ >= maxDepth)
            return L;

        // Possibly regularize BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }
        ++totalBSDFs;

        // Sample illumination from lights to find attenuated path contribution
        if (bsdf.IsNonSpecular()) {
            L += SafeDiv(SampleLd(isect, &bsdf, lambda, sampler, beta, pdfUni),
                         lambda.PDF());
            DCHECK(IsInf(L.y(lambda)) == false);
        }

        // Sample BSDF to get new volumetric path direction
        Vector3f wo = -ray.d;
        Float u = sampler.Get1D();
        BSDFSample bs = bsdf.Sample_f(wo, u, sampler.Get2D());
        if (!bs)
            break;
        // Update _beta_ and PDFs for BSDF scattering
        beta *= bs.f * AbsDot(bs.wi, isect.shading.n);
        pdfNEE = pdfUni;
        if (bsdf.SampledPDFIsProportional()) {
            Float pdf = bsdf.PDF(wo, bs.wi);
            beta *= pdf / bs.pdf;
            pdfUni *= pdf;
        } else
            pdfUni *= bs.pdf;
        rescale(beta, pdfUni, pdfNEE);

        PBRT_DBG("%s\n", StringPrintf("Sampled BSDF, f = %s, pdf = %f -> beta = %s", bs.f,
                                      bs.pdf, beta)
                             .c_str());
        DCHECK(IsInf(beta.y(lambda)) == false);
        specularBounce = bs.IsSpecular();
        anyNonSpecularBounces |= !bs.IsSpecular();
        if (bs.IsTransmission())
            etaScale *= Sqr(bsdf.eta);
        ray = isect.SpawnRay(ray, bsdf, bs.wi, bs.flags);

        // Account for attenuated subsurface scattering, if applicable
        BSSRDFHandle bssrdf = isect.GetBSSRDF(ray, lambda, camera, scratchBuffer);
        if (bssrdf && bs.IsTransmission()) {
            // Sample BSSRDF probe segment to find exit point
            BSSRDFProbeSegment probeSeg = bssrdf.Sample(sampler.Get1D(), sampler.Get2D());
            if (!probeSeg)
                break;

            // Sample random intersection along BSSRDF probe segment
            uint64_t seed = MixBits(FloatToBits(sampler.Get1D()));
            WeightedReservoirSampler<SubsurfaceInteraction> interactionSampler(seed);
            // Intersect BSSRDF sampling ray against the scene geometry
            Interaction base(probeSeg.p0, probeSeg.time, (MediumHandle) nullptr);
            while (true) {
                Ray r = base.SpawnRayTo(probeSeg.p1);
                if (r.d == Vector3f(0, 0, 0))
                    break;
                pstd::optional<ShapeIntersection> si = Intersect(r, 1);
                if (!si)
                    break;
                base = si->intr;
                if (si->intr.material == isect.material)
                    interactionSampler.Add(SubsurfaceInteraction(si->intr), 1.f);
            }

            if (!interactionSampler.HasSample())
                break;

            // Convert probe intersection to _BSSRDFSample_ and update _beta_
            SubsurfaceInteraction ssi = interactionSampler.GetSample();
            BSSRDFSample bssrdfSample =
                bssrdf.ProbeIntersectionToSample(ssi, scratchBuffer);
            if (!bssrdfSample.S || bssrdfSample.pdf == 0)
                break;
            // Can ignore path pdf here as well since bssrdfSample.pdf
            // is non-spectral.
            beta *= bssrdfSample.S * interactionSampler.WeightSum() / bssrdfSample.pdf;
            SurfaceInteraction pi = ssi;
            BSDF &bsdf = bssrdfSample.bsdf;
            pi.wo = bssrdfSample.wo;

            // Possibly regularize subsurface BSDF and update _prevSurfaceIntr_
            anyNonSpecularBounces = true;
            if (regularize) {
                ++regularizedBSDFs;
                bsdf.Regularize();
            } else
                ++totalBSDFs;
            prevSurfaceIntr = pi;
            CHECK(!prevMediumIntr.has_value());

            // Account for attenuated direct subsurface scattering
            L +=
                SafeDiv(SampleLd(pi, &bsdf, lambda, sampler, beta, pdfUni), lambda.PDF());

            // Sample ray for indirect subsurface scattering
            Float u = sampler.Get1D();
            BSDFSample bs = bsdf.Sample_f(pi.wo, u, sampler.Get2D());
            if (!bs)
                break;
            beta *= bs.f * AbsDot(bs.wi, pi.shading.n);
            pdfNEE = pdfUni;
            pdfUni *= bs.pdf;
            // don't increment depth this time...
            DCHECK(!IsInf(beta.y(lambda)));
            specularBounce = bs.IsSpecular();
            ray = RayDifferential(pi.SpawnRay(bs.wi));
        }

        // Possibly terminate volumetric path with Russian roulette
        if (!beta)
            break;
        SampledSpectrum rrBeta = beta * etaScale / pdfUni.Average();
        PBRT_DBG("%s\n",
                 StringPrintf("etaScale %f -> rrBeta %s", etaScale, rrBeta).c_str());
        if (rrBeta.MaxComponentValue() < rrThreshold && depth > 1) {
            Float q = std::max<Float>(0, 1 - rrBeta.MaxComponentValue());
            if (sampler.Get1D() < q)
                break;
            pdfUni *= 1 - q;
            pdfNEE *= 1 - q;
        }
    }
    return L;
}